

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O1

void anon_unknown.dwarf_142ef2::testDct(void)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined8 uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  __m128 *srcVec;
  int i_1;
  int iVar105;
  undefined1 (*pauVar106) [16];
  long lVar107;
  undefined8 *puVar108;
  float *pfVar109;
  int iter;
  int iVar110;
  int i;
  long lVar111;
  ulong uVar112;
  int iter_18;
  bool bVar113;
  byte bVar114;
  float fVar115;
  double dVar116;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 extraout_var [56];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar183 [48];
  undefined1 extraout_var_07 [56];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 extraout_var_09 [56];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 extraout_var_11 [56];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 extraout_var_13 [56];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 extraout_var_15 [56];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 extraout_var_17 [56];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 extraout_var_19 [56];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 extraout_var_21 [56];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 extraout_var_23 [56];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 extraout_var_25 [56];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 extraout_var_27 [56];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 extraout_var_29 [56];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 extraout_var_31 [56];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 extraout_var_33 [56];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 extraout_var_35 [56];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 extraout_var_37 [56];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 extraout_var_39 [56];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  float fVar184;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar250;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar267;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar280;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar305;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar331;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar345 [36];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  float fVar346;
  float fVar347;
  float fVar378;
  float fVar380;
  float fVar382;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  float fVar379;
  float fVar381;
  float fVar383;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  float fVar384;
  float fVar395;
  float fVar396;
  float fVar397;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar398 [16];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [16];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  float fVar412;
  float fVar424;
  float fVar425;
  float fVar426;
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  float fVar427;
  float fVar434;
  float fVar435;
  float fVar436;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  float fVar437;
  float fVar452;
  float fVar453;
  float fVar454;
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  float fVar455;
  float fVar467;
  float fVar468;
  float fVar469;
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  SimdAlignedBuffer64f test;
  SimdAlignedBuffer64f orig;
  Rand48 rand48;
  __m128 in [8];
  CpuId cpuid;
  SimdAlignedBuffer64<float> local_150;
  SimdAlignedBuffer64<float> local_140;
  ushort local_126 [3];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  CpuId local_87 [5];
  char local_82;
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_30 [56];
  undefined1 extraout_var_32 [56];
  undefined1 extraout_var_34 [56];
  undefined1 extraout_var_36 [56];
  undefined1 extraout_var_38 [56];
  undefined1 extraout_var_40 [56];
  
  bVar114 = 0;
  local_126[0] = 0x5a5a;
  local_126[1] = 0x5a5a;
  local_126[2] = 0x5a5a;
  local_140._buffer = (float *)0x0;
  local_140._handle = (char *)0x0;
  Imf_3_2::SimdAlignedBuffer64<float>::alloc(&local_140);
  local_150._buffer = (float *)0x0;
  local_150._handle = (char *)0x0;
  Imf_3_2::SimdAlignedBuffer64<float>::alloc(&local_150);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"   DCT Round Trip ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar110 = 0;
  do {
    lVar111 = 0;
    do {
      dVar116 = (double)Imath_3_2::erand48(local_126);
      *(float *)((undefined1 *)local_150._buffer + lVar111 * 4) = (float)dVar116;
      local_140._buffer[lVar111] = (float)dVar116;
      lVar111 = lVar111 + 1;
    } while (lVar111 != 0x40);
    iVar105 = 0;
    do {
      lVar111 = 0;
      fVar427 = (float)DAT_001c2580;
      fVar434 = DAT_001c2580._4_4_;
      fVar435 = DAT_001c2580._8_4_;
      fVar436 = DAT_001c2580._12_4_;
      fVar437 = (float)DAT_001c2590;
      fVar452 = DAT_001c2590._4_4_;
      fVar453 = DAT_001c2590._8_4_;
      fVar454 = DAT_001c2590._12_4_;
      fVar455 = (float)DAT_001c25b0;
      fVar467 = DAT_001c25b0._4_4_;
      fVar468 = DAT_001c25b0._8_4_;
      fVar469 = DAT_001c25b0._12_4_;
      fVar412 = (float)DAT_001c25c0;
      fVar424 = DAT_001c25c0._4_4_;
      fVar425 = DAT_001c25c0._8_4_;
      fVar426 = DAT_001c25c0._12_4_;
      do {
        pfVar5 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111);
        pfVar109 = (float *)((undefined1 *)local_150._buffer + lVar111);
        pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111);
        pfVar3 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111);
        pfVar4 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111);
        fVar280 = *pfVar109 + *pfVar5;
        fVar302 = pfVar109[1] + pfVar5[1];
        fVar303 = pfVar109[2] + pfVar5[2];
        fVar304 = pfVar109[3] + pfVar5[3];
        fVar115 = *pfVar2 + *pfVar3;
        fVar180 = pfVar2[1] + pfVar3[1];
        fVar181 = pfVar2[2] + pfVar3[2];
        fVar182 = pfVar2[3] + pfVar3[3];
        pfVar6 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111);
        fVar331 = *pfVar4 + *pfVar6;
        fVar342 = pfVar4[1] + pfVar6[1];
        fVar343 = pfVar4[2] + pfVar6[2];
        fVar344 = pfVar4[3] + pfVar6[3];
        pfVar7 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111);
        pfVar8 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111);
        fVar213 = *pfVar109 - *pfVar5;
        fVar247 = pfVar109[1] - pfVar5[1];
        fVar248 = pfVar109[2] - pfVar5[2];
        fVar249 = pfVar109[3] - pfVar5[3];
        fVar305 = *pfVar7 + *pfVar8;
        fVar328 = pfVar7[1] + pfVar8[1];
        fVar329 = pfVar7[2] + pfVar8[2];
        fVar330 = pfVar7[3] + pfVar8[3];
        fVar267 = *pfVar2 - *pfVar3;
        fVar277 = pfVar2[1] - pfVar3[1];
        fVar278 = pfVar2[2] - pfVar3[2];
        fVar279 = pfVar2[3] - pfVar3[3];
        fVar250 = *pfVar4 - *pfVar6;
        fVar264 = pfVar4[1] - pfVar6[1];
        fVar265 = pfVar4[2] - pfVar6[2];
        fVar266 = pfVar4[3] - pfVar6[3];
        fVar184 = *pfVar7 - *pfVar8;
        fVar210 = pfVar7[1] - pfVar8[1];
        fVar211 = pfVar7[2] - pfVar8[2];
        fVar212 = pfVar7[3] - pfVar8[3];
        fVar346 = (fVar280 + fVar331) * 0.70710677;
        fVar378 = (fVar302 + fVar342) * 0.70710677;
        fVar380 = (fVar303 + fVar343) * 0.70710677;
        fVar382 = (fVar304 + fVar344) * 0.70710677;
        fVar384 = (fVar115 + fVar305) * 0.70710677;
        fVar395 = (fVar180 + fVar328) * 0.70710677;
        fVar396 = (fVar181 + fVar329) * 0.70710677;
        fVar397 = (fVar182 + fVar330) * 0.70710677;
        auVar398._0_4_ = (fVar346 + fVar384) * 0.5;
        auVar398._4_4_ = (fVar378 + fVar395) * 0.5;
        auVar398._8_4_ = (fVar380 + fVar396) * 0.5;
        auVar398._12_4_ = (fVar382 + fVar397) * 0.5;
        *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar111) = auVar398;
        pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111);
        *pfVar109 = (fVar346 - fVar384) * 0.5;
        pfVar109[1] = (fVar378 - fVar395) * 0.5;
        pfVar109[2] = (fVar380 - fVar396) * 0.5;
        pfVar109[3] = (fVar382 - fVar397) * 0.5;
        fVar346 = fVar267 - fVar184;
        fVar378 = fVar277 - fVar210;
        fVar380 = fVar278 - fVar211;
        fVar382 = fVar279 - fVar212;
        fVar280 = fVar280 - fVar331;
        fVar302 = fVar302 - fVar342;
        fVar303 = fVar303 - fVar343;
        fVar304 = fVar304 - fVar344;
        auVar385._0_4_ = fVar280 * fVar437 + fVar346 * fVar427;
        auVar385._4_4_ = fVar302 * fVar452 + fVar378 * fVar434;
        auVar385._8_4_ = fVar303 * fVar453 + fVar380 * fVar435;
        auVar385._12_4_ = fVar304 * fVar454 + fVar382 * fVar436;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111) =
             auVar385;
        pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111);
        *pfVar109 = fVar280 * fVar427 - fVar346 * fVar437;
        pfVar109[1] = fVar302 * fVar434 - fVar378 * fVar452;
        pfVar109[2] = fVar303 * fVar435 - fVar380 * fVar453;
        pfVar109[3] = fVar304 * fVar436 - fVar382 * fVar454;
        fVar115 = (fVar115 - fVar305) * 0.70710677;
        fVar180 = (fVar180 - fVar328) * 0.70710677;
        fVar181 = (fVar181 - fVar329) * 0.70710677;
        fVar182 = (fVar182 - fVar330) * 0.70710677;
        fVar184 = (fVar184 + fVar267) * -0.70710677;
        fVar210 = (fVar210 + fVar277) * -0.70710677;
        fVar211 = (fVar211 + fVar278) * -0.70710677;
        fVar212 = (fVar212 + fVar279) * -0.70710677;
        fVar267 = fVar213 - fVar115;
        fVar277 = fVar247 - fVar180;
        fVar278 = fVar248 - fVar181;
        fVar279 = fVar249 - fVar182;
        fVar280 = fVar250 + fVar184;
        fVar302 = fVar264 + fVar210;
        fVar303 = fVar265 + fVar211;
        fVar304 = fVar266 + fVar212;
        auVar306._0_4_ = fVar267 * fVar455 - fVar280 * fVar412;
        auVar306._4_4_ = fVar277 * fVar467 - fVar302 * fVar424;
        auVar306._8_4_ = fVar278 * fVar468 - fVar303 * fVar425;
        auVar306._12_4_ = fVar279 * fVar469 - fVar304 * fVar426;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111) =
             auVar306;
        pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111);
        *pfVar109 = fVar280 * fVar455 + fVar267 * fVar412;
        pfVar109[1] = fVar302 * fVar467 + fVar277 * fVar424;
        pfVar109[2] = fVar303 * fVar468 + fVar278 * fVar425;
        pfVar109[3] = fVar304 * fVar469 + fVar279 * fVar426;
        fVar115 = fVar115 + fVar213;
        fVar180 = fVar180 + fVar247;
        fVar181 = fVar181 + fVar248;
        fVar182 = fVar182 + fVar249;
        fVar184 = fVar184 - fVar250;
        fVar210 = fVar210 - fVar264;
        fVar211 = fVar211 - fVar265;
        fVar212 = fVar212 - fVar266;
        fVar213 = (float)DAT_001c25d0;
        fVar247 = DAT_001c25d0._4_4_;
        fVar248 = DAT_001c25d0._8_4_;
        fVar249 = DAT_001c25d0._12_4_;
        fVar250 = (float)DAT_001c25e0;
        fVar264 = DAT_001c25e0._4_4_;
        fVar265 = DAT_001c25e0._8_4_;
        fVar266 = DAT_001c25e0._12_4_;
        auVar214._0_4_ = fVar115 * fVar213 - fVar184 * fVar250;
        auVar214._4_4_ = fVar180 * fVar247 - fVar210 * fVar264;
        auVar214._8_4_ = fVar181 * fVar248 - fVar211 * fVar265;
        auVar214._12_4_ = fVar182 * fVar249 - fVar212 * fVar266;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111) =
             auVar214;
        auVar185._0_4_ = fVar184 * fVar213 + fVar115 * fVar250;
        auVar185._4_4_ = fVar210 * fVar247 + fVar180 * fVar264;
        auVar185._8_4_ = fVar211 * fVar248 + fVar181 * fVar265;
        auVar185._12_4_ = fVar212 * fVar249 + fVar182 * fVar266;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111) =
             auVar185;
        lVar111 = lVar111 + 0x10;
      } while (lVar111 == 0x10);
      uVar60 = *(undefined4 *)((undefined1 *)local_150._buffer + 4);
      uVar61 = *(undefined4 *)((undefined1 *)local_150._buffer + 8);
      uVar62 = *(undefined4 *)((undefined1 *)local_150._buffer + 0xc);
      uVar63 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      uVar64 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      uVar65 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      uVar66 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      uVar68 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      uVar70 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      uVar71 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      uVar72 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      uVar73 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      uVar74 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      uVar76 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      uVar77 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      uVar78 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      uVar79 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      uVar80 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      uVar81 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      uVar82 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      uVar83 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      uVar84 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      uVar85 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      uVar86 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      uVar87 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      uVar88 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      uVar89 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      auVar185 = *(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      auVar214 = *(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      *(undefined4 *)(undefined1 *)local_150._buffer =
           *(undefined4 *)(undefined1 *)local_150._buffer;
      *(undefined4 *)((undefined1 *)local_150._buffer + 4) =
           *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      *(undefined4 *)((undefined1 *)local_150._buffer + 8) = uVar74;
      *(undefined4 *)((undefined1 *)local_150._buffer + 0xc) = uVar78;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = uVar61;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = uVar68;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = uVar76;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = uVar80;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = uVar60;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = uVar67;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = uVar75;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = uVar79;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = uVar62;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = uVar69;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = uVar77;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = uVar81;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = uVar82;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = uVar86;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = auVar185._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = auVar214._0_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = uVar84;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = uVar88;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = auVar185._8_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = auVar214._8_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = uVar83;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = uVar87;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = auVar185._4_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = auVar214._4_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) = uVar85;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4) = uVar89;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8) = auVar185._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc) = auVar214._12_4_;
      auVar185 = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar214 = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      uVar60 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      uVar61 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      uVar62 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      uVar67 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      uVar68 = *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      uVar69 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      uVar74 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      uVar75 = *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      auVar306 = *(undefined1 (*) [16])((long)local_150._buffer + 0xc0);
      auVar385 = *(undefined1 (*) [16])((long)local_150._buffer + 0xe0);
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = uVar63;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = uVar70;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = auVar185._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = auVar214._0_4_;
      auVar268._4_4_ = uVar72;
      auVar268._0_4_ = uVar65;
      auVar268._8_4_ = auVar185._8_4_;
      auVar268._12_4_ = auVar214._8_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = auVar268;
      auVar215._4_4_ = uVar71;
      auVar215._0_4_ = uVar64;
      auVar215._8_4_ = auVar185._4_4_;
      auVar215._12_4_ = auVar214._4_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = auVar215;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) = uVar66;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 4) = uVar73;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 8) = auVar185._12_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 0xc) = auVar214._12_4_;
      *(undefined4 *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = uVar60;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = uVar68;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = auVar306._0_4_;
      *(int *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = auVar385._0_4_;
      auVar117._4_4_ = uVar74;
      auVar117._0_4_ = uVar62;
      auVar117._8_4_ = auVar306._8_4_;
      auVar117._12_4_ = auVar385._8_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x50) = auVar117;
      auVar307._4_4_ = uVar69;
      auVar307._0_4_ = uVar61;
      auVar307._8_4_ = auVar306._4_4_;
      auVar307._12_4_ = auVar385._4_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x30) = auVar307;
      auVar186._4_4_ = uVar75;
      auVar186._0_4_ = uVar67;
      auVar186._8_4_ = auVar306._12_4_;
      auVar186._12_4_ = auVar385._12_4_;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x70) = auVar186;
      bVar113 = iVar105 == 0;
      iVar105 = iVar105 + 1;
    } while (bVar113);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_150._buffer);
    compareBufferRelative(&local_140,&local_150,0.02,0.001);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Inverse, DC Only",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar110 = 0;
  do {
    dVar116 = (double)Imath_3_2::erand48(local_126);
    *(float *)(undefined1 *)local_150._buffer = (float)dVar116;
    *local_140._buffer = (float)dVar116;
    lVar111 = 1;
    do {
      *(undefined4 *)((undefined1 *)local_150._buffer + lVar111 * 4) = 0;
      local_140._buffer[lVar111] = 0.0;
      lVar111 = lVar111 + 1;
    } while (lVar111 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    fVar412 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 * 0.3535536;
    lVar111 = 0;
    do {
      pfVar109 = (float *)((undefined1 *)local_150._buffer + lVar111);
      *pfVar109 = fVar412;
      pfVar109[1] = fVar412;
      pfVar109[2] = fVar412;
      pfVar109[3] = fVar412;
      lVar111 = lVar111 + 0x10;
    } while (lVar111 != 0x100);
    compareBufferRelative(&local_140,&local_150,0.01,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Inverse, Scalar: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"8x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  iVar110 = 0;
  do {
    lVar111 = 0;
    do {
      dVar116 = (double)Imath_3_2::erand48(local_126);
      *(float *)((undefined1 *)local_150._buffer + lVar111 * 4) = (float)dVar116;
      local_140._buffer[lVar111] = (float)dVar116;
      lVar111 = lVar111 + 1;
    } while (lVar111 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_150._buffer);
    compareBufferRelative(&local_140,&local_150,0.01,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"7x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar139._0_8_ = std::ostream::flush();
  auVar139._8_56_ = extraout_var;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 0x38) {
        auVar138._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar138._8_56_ = extraout_var_00;
        auVar139._4_60_ = auVar138._4_60_;
        auVar139._0_4_ = (float)auVar138._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar139._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar139._0_16_ = ZEXT816(0);
      }
      local_140._buffer[uVar112] = auVar139._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    lVar111 = 0;
    fVar412 = (float)DAT_001c25f0;
    fVar424 = DAT_001c25f0._4_4_;
    fVar425 = (float)DAT_001c2620;
    fVar426 = DAT_001c2620._4_4_;
    fVar427 = DAT_001c2620._8_4_;
    fVar434 = DAT_001c2620._12_4_;
    fVar435 = (float)DAT_001c2630;
    fVar436 = DAT_001c2630._4_4_;
    fVar437 = DAT_001c2630._8_4_;
    fVar452 = DAT_001c2630._12_4_;
    fVar453 = (float)DAT_001c2640;
    fVar454 = DAT_001c2640._4_4_;
    fVar455 = DAT_001c2640._8_4_;
    fVar467 = DAT_001c2640._12_4_;
    fVar468 = (float)DAT_001c2650;
    fVar469 = DAT_001c2650._4_4_;
    fVar115 = DAT_001c2650._8_4_;
    fVar180 = DAT_001c2650._12_4_;
    do {
      fVar211 = (*(float *)((undefined1 *)local_150._buffer + lVar111) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar412;
      fVar212 = (*(float *)((undefined1 *)local_150._buffer + lVar111) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar424;
      fVar247 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar181 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 0xc);
      fVar182 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 4);
      fVar184 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 4);
      fVar210 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 0xc);
      fVar248 = fVar210 * fVar468 + fVar184 * fVar453 + fVar182 * fVar435 + fVar181 * fVar425;
      fVar249 = fVar210 * fVar469 + fVar184 * fVar454 + fVar182 * fVar436 + fVar181 * fVar426;
      fVar250 = fVar210 * fVar115 + fVar184 * fVar455 + fVar182 * fVar437 + fVar181 * fVar427;
      fVar184 = fVar210 * fVar180 + fVar184 * fVar467 + fVar182 * fVar452 + fVar181 * fVar434;
      fVar181 = fVar247 + fVar212;
      fVar182 = fVar213 + fVar211;
      fVar211 = fVar211 - fVar213;
      fVar212 = fVar212 - fVar247;
      auVar118._0_4_ = fVar248 + fVar182;
      auVar118._4_4_ = fVar249 + fVar181;
      auVar118._8_4_ = fVar250 + fVar212;
      auVar118._12_4_ = fVar184 + fVar211;
      auVar139._0_16_ = auVar118;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar111) = auVar118;
      auVar216._4_4_ = fVar212 - fVar250;
      auVar216._0_4_ = fVar211 - fVar184;
      auVar216._8_4_ = fVar181 - fVar249;
      auVar216._12_4_ = fVar182 - fVar248;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111) =
           auVar216;
      lVar111 = lVar111 + 0x20;
    } while (lVar111 != 0xe0);
    lVar111 = -8;
    fVar437 = (float)DAT_001c2680;
    fVar452 = DAT_001c2680._4_4_;
    fVar453 = DAT_001c2680._8_4_;
    fVar454 = DAT_001c2680._12_4_;
    fVar455 = (float)DAT_001c26b0;
    fVar467 = DAT_001c26b0._4_4_;
    fVar468 = DAT_001c26b0._8_4_;
    fVar469 = DAT_001c26b0._12_4_;
    fVar412 = (float)DAT_001c26d0;
    fVar424 = DAT_001c26d0._4_4_;
    fVar425 = DAT_001c26d0._8_4_;
    fVar426 = DAT_001c26d0._12_4_;
    fVar427 = (float)DAT_001c26e0;
    fVar434 = DAT_001c26e0._4_4_;
    fVar435 = DAT_001c26e0._8_4_;
    fVar436 = DAT_001c26e0._12_4_;
    fVar115 = (float)DAT_001c26f0;
    fVar180 = DAT_001c26f0._4_4_;
    fVar181 = DAT_001c26f0._8_4_;
    fVar182 = DAT_001c26f0._12_4_;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar184 = *pfVar109;
      fVar210 = pfVar109[1];
      fVar211 = pfVar109[2];
      fVar212 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar213 = *pfVar2;
      fVar247 = pfVar2[1];
      fVar248 = pfVar2[2];
      fVar249 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar280 = *pfVar109 * 0.19134216 - *pfVar2 * 0.46193984;
      fVar302 = pfVar109[1] * 0.19134216 - pfVar2[1] * 0.46193984;
      fVar303 = pfVar109[2] * 0.19134216 - pfVar2[2] * 0.46193984;
      fVar304 = pfVar109[3] * 0.19134216 - pfVar2[3] * 0.46193984;
      fVar305 = *pfVar2 * 0.19134216 + *pfVar109 * 0.46193984;
      fVar328 = pfVar2[1] * 0.19134216 + pfVar109[1] * 0.46193984;
      fVar329 = pfVar2[2] * 0.19134216 + pfVar109[2] * 0.46193984;
      fVar330 = pfVar2[3] * 0.19134216 + pfVar109[3] * 0.46193984;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar250 = *pfVar109;
      fVar264 = pfVar109[1];
      fVar265 = pfVar109[2];
      fVar266 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar267 = *pfVar109;
      fVar277 = pfVar109[1];
      fVar278 = pfVar109[2];
      fVar279 = pfVar109[3];
      auVar139._0_4_ =
           fVar267 * fVar455 + fVar250 * 0.27778545 + fVar184 * 0.49039266 + fVar213 * fVar437;
      auVar139._4_4_ =
           fVar277 * fVar467 + fVar264 * 0.27778545 + fVar210 * 0.49039266 + fVar247 * fVar452;
      auVar139._8_4_ =
           fVar278 * fVar468 + fVar265 * 0.27778545 + fVar211 * 0.49039266 + fVar248 * fVar453;
      auVar139._12_4_ =
           fVar279 * fVar469 + fVar266 * 0.27778545 + fVar212 * 0.49039266 + fVar249 * fVar454;
      fVar331 = fVar267 * fVar427 + fVar250 * fVar412 + fVar184 * fVar437 + fVar213 * -0.097545706;
      fVar342 = fVar277 * fVar434 + fVar264 * fVar424 + fVar210 * fVar452 + fVar247 * -0.097545706;
      fVar343 = fVar278 * fVar435 + fVar265 * fVar425 + fVar211 * fVar453 + fVar248 * -0.097545706;
      fVar344 = fVar279 * fVar436 + fVar266 * fVar426 + fVar212 * fVar454 + fVar249 * -0.097545706;
      fVar346 = fVar267 * fVar437 + fVar250 * fVar455 + fVar184 * 0.27778545 + fVar213 * fVar412;
      fVar378 = fVar277 * fVar452 + fVar264 * fVar467 + fVar210 * 0.27778545 + fVar247 * fVar424;
      fVar380 = fVar278 * fVar453 + fVar265 * fVar468 + fVar211 * 0.27778545 + fVar248 * fVar425;
      fVar382 = fVar279 * fVar454 + fVar266 * fVar469 + fVar212 * 0.27778545 + fVar249 * fVar426;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar213 = fVar267 * fVar412 + fVar250 * fVar437 + fVar184 * fVar455 + fVar213 * fVar427;
      fVar247 = fVar277 * fVar424 + fVar264 * fVar452 + fVar210 * fVar467 + fVar247 * fVar434;
      fVar248 = fVar278 * fVar425 + fVar265 * fVar453 + fVar211 * fVar468 + fVar248 * fVar435;
      fVar249 = fVar279 * fVar426 + fVar266 * fVar454 + fVar212 * fVar469 + fVar249 * fVar436;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar384 = (*pfVar109 + *pfVar2) * fVar115;
      fVar395 = (pfVar109[1] + pfVar2[1]) * fVar180;
      fVar396 = (pfVar109[2] + pfVar2[2]) * fVar181;
      fVar397 = (pfVar109[3] + pfVar2[3]) * fVar182;
      fVar267 = (*pfVar109 - *pfVar2) * fVar115;
      fVar277 = (pfVar109[1] - pfVar2[1]) * fVar180;
      fVar278 = (pfVar109[2] - pfVar2[2]) * fVar181;
      fVar279 = (pfVar109[3] - pfVar2[3]) * fVar182;
      fVar250 = fVar280 + fVar267;
      fVar264 = fVar302 + fVar277;
      fVar265 = fVar303 + fVar278;
      fVar266 = fVar304 + fVar279;
      fVar267 = fVar267 - fVar280;
      fVar277 = fVar277 - fVar302;
      fVar278 = fVar278 - fVar303;
      fVar279 = fVar279 - fVar304;
      fVar184 = fVar305 + fVar384;
      fVar210 = fVar328 + fVar395;
      fVar211 = fVar329 + fVar396;
      fVar212 = fVar330 + fVar397;
      fVar384 = fVar384 - fVar305;
      fVar395 = fVar395 - fVar328;
      fVar396 = fVar396 - fVar329;
      fVar397 = fVar397 - fVar330;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = auVar139._0_4_ + fVar184;
      pfVar109[1] = auVar139._4_4_ + fVar210;
      pfVar109[2] = auVar139._8_4_ + fVar211;
      pfVar109[3] = auVar139._12_4_ + fVar212;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar331 + fVar250;
      pfVar109[1] = fVar342 + fVar264;
      pfVar109[2] = fVar343 + fVar265;
      pfVar109[3] = fVar344 + fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar346 + fVar267;
      pfVar109[1] = fVar378 + fVar277;
      pfVar109[2] = fVar380 + fVar278;
      pfVar109[3] = fVar382 + fVar279;
      auVar217._0_4_ = fVar213 + fVar384;
      auVar217._4_4_ = fVar247 + fVar395;
      auVar217._8_4_ = fVar248 + fVar396;
      auVar217._12_4_ = fVar249 + fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar217;
      auVar348._0_4_ = fVar384 - fVar213;
      auVar348._4_4_ = fVar395 - fVar247;
      auVar348._8_4_ = fVar396 - fVar248;
      auVar348._12_4_ = fVar397 - fVar249;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar348;
      auVar308._0_4_ = fVar267 - fVar346;
      auVar308._4_4_ = fVar277 - fVar378;
      auVar308._8_4_ = fVar278 - fVar380;
      auVar308._12_4_ = fVar279 - fVar382;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar308;
      auVar281._0_4_ = fVar250 - fVar331;
      auVar281._4_4_ = fVar264 - fVar342;
      auVar281._8_4_ = fVar265 - fVar343;
      auVar281._12_4_ = fVar266 - fVar344;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar281;
      auVar187._0_4_ = fVar184 - auVar139._0_4_;
      auVar187._4_4_ = fVar210 - auVar139._4_4_;
      auVar187._8_4_ = fVar211 - auVar139._8_4_;
      auVar187._12_4_ = fVar212 - auVar139._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4)
           = auVar187;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar139._0_12_ = ZEXT812(0x3c23d70a);
    auVar139._12_4_ = 0.0;
    compareBufferRelative(&local_140,&local_150,auVar139._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"6x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar141._0_8_ = std::ostream::flush();
  auVar141._8_56_ = extraout_var_01;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 0x30) {
        auVar140._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar140._8_56_ = extraout_var_02;
        auVar141._4_60_ = auVar140._4_60_;
        auVar141._0_4_ = (float)auVar140._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar141._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar141._0_16_ = ZEXT816(0);
      }
      local_140._buffer[uVar112] = auVar141._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    lVar111 = 0;
    fVar412 = (float)DAT_001c25f0;
    fVar424 = DAT_001c25f0._4_4_;
    fVar425 = (float)DAT_001c2620;
    fVar426 = DAT_001c2620._4_4_;
    fVar427 = DAT_001c2620._8_4_;
    fVar434 = DAT_001c2620._12_4_;
    fVar435 = (float)DAT_001c2630;
    fVar436 = DAT_001c2630._4_4_;
    fVar437 = DAT_001c2630._8_4_;
    fVar452 = DAT_001c2630._12_4_;
    fVar453 = (float)DAT_001c2640;
    fVar454 = DAT_001c2640._4_4_;
    fVar455 = DAT_001c2640._8_4_;
    fVar467 = DAT_001c2640._12_4_;
    fVar468 = (float)DAT_001c2650;
    fVar469 = DAT_001c2650._4_4_;
    fVar115 = DAT_001c2650._8_4_;
    fVar180 = DAT_001c2650._12_4_;
    do {
      fVar211 = (*(float *)((undefined1 *)local_150._buffer + lVar111) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar412;
      fVar212 = (*(float *)((undefined1 *)local_150._buffer + lVar111) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar424;
      fVar247 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar181 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 0xc);
      fVar182 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 4);
      fVar184 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 4);
      fVar210 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 0xc);
      fVar248 = fVar210 * fVar468 + fVar184 * fVar453 + fVar182 * fVar435 + fVar181 * fVar425;
      fVar249 = fVar210 * fVar469 + fVar184 * fVar454 + fVar182 * fVar436 + fVar181 * fVar426;
      fVar250 = fVar210 * fVar115 + fVar184 * fVar455 + fVar182 * fVar437 + fVar181 * fVar427;
      fVar184 = fVar210 * fVar180 + fVar184 * fVar467 + fVar182 * fVar452 + fVar181 * fVar434;
      fVar181 = fVar247 + fVar212;
      fVar182 = fVar213 + fVar211;
      fVar211 = fVar211 - fVar213;
      fVar212 = fVar212 - fVar247;
      auVar119._0_4_ = fVar248 + fVar182;
      auVar119._4_4_ = fVar249 + fVar181;
      auVar119._8_4_ = fVar250 + fVar212;
      auVar119._12_4_ = fVar184 + fVar211;
      auVar141._0_16_ = auVar119;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar111) = auVar119;
      auVar218._4_4_ = fVar212 - fVar250;
      auVar218._0_4_ = fVar211 - fVar184;
      auVar218._8_4_ = fVar181 - fVar249;
      auVar218._12_4_ = fVar182 - fVar248;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111) =
           auVar218;
      lVar111 = lVar111 + 0x20;
    } while (lVar111 != 0xc0);
    lVar111 = -8;
    fVar437 = (float)DAT_001c2680;
    fVar452 = DAT_001c2680._4_4_;
    fVar453 = DAT_001c2680._8_4_;
    fVar454 = DAT_001c2680._12_4_;
    fVar455 = (float)DAT_001c26b0;
    fVar467 = DAT_001c26b0._4_4_;
    fVar468 = DAT_001c26b0._8_4_;
    fVar469 = DAT_001c26b0._12_4_;
    fVar412 = (float)DAT_001c26d0;
    fVar424 = DAT_001c26d0._4_4_;
    fVar425 = DAT_001c26d0._8_4_;
    fVar426 = DAT_001c26d0._12_4_;
    fVar427 = (float)DAT_001c26e0;
    fVar434 = DAT_001c26e0._4_4_;
    fVar435 = DAT_001c26e0._8_4_;
    fVar436 = DAT_001c26e0._12_4_;
    fVar115 = (float)DAT_001c26f0;
    fVar180 = DAT_001c26f0._4_4_;
    fVar181 = DAT_001c26f0._8_4_;
    fVar182 = DAT_001c26f0._12_4_;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar184 = *pfVar109;
      fVar210 = pfVar109[1];
      fVar211 = pfVar109[2];
      fVar212 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar213 = *pfVar2;
      fVar247 = pfVar2[1];
      fVar248 = pfVar2[2];
      fVar249 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar280 = *pfVar109 * 0.19134216 - *pfVar2 * 0.46193984;
      fVar302 = pfVar109[1] * 0.19134216 - pfVar2[1] * 0.46193984;
      fVar303 = pfVar109[2] * 0.19134216 - pfVar2[2] * 0.46193984;
      fVar304 = pfVar109[3] * 0.19134216 - pfVar2[3] * 0.46193984;
      fVar305 = *pfVar2 * 0.19134216 + *pfVar109 * 0.46193984;
      fVar328 = pfVar2[1] * 0.19134216 + pfVar109[1] * 0.46193984;
      fVar329 = pfVar2[2] * 0.19134216 + pfVar109[2] * 0.46193984;
      fVar330 = pfVar2[3] * 0.19134216 + pfVar109[3] * 0.46193984;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar250 = *pfVar109;
      fVar264 = pfVar109[1];
      fVar265 = pfVar109[2];
      fVar266 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar267 = *pfVar109;
      fVar277 = pfVar109[1];
      fVar278 = pfVar109[2];
      fVar279 = pfVar109[3];
      auVar141._0_4_ =
           fVar267 * fVar455 + fVar250 * 0.27778545 + fVar184 * 0.49039266 + fVar213 * fVar437;
      auVar141._4_4_ =
           fVar277 * fVar467 + fVar264 * 0.27778545 + fVar210 * 0.49039266 + fVar247 * fVar452;
      auVar141._8_4_ =
           fVar278 * fVar468 + fVar265 * 0.27778545 + fVar211 * 0.49039266 + fVar248 * fVar453;
      auVar141._12_4_ =
           fVar279 * fVar469 + fVar266 * 0.27778545 + fVar212 * 0.49039266 + fVar249 * fVar454;
      fVar331 = fVar267 * fVar427 + fVar250 * fVar412 + fVar184 * fVar437 + fVar213 * -0.097545706;
      fVar342 = fVar277 * fVar434 + fVar264 * fVar424 + fVar210 * fVar452 + fVar247 * -0.097545706;
      fVar343 = fVar278 * fVar435 + fVar265 * fVar425 + fVar211 * fVar453 + fVar248 * -0.097545706;
      fVar344 = fVar279 * fVar436 + fVar266 * fVar426 + fVar212 * fVar454 + fVar249 * -0.097545706;
      fVar346 = fVar267 * fVar437 + fVar250 * fVar455 + fVar184 * 0.27778545 + fVar213 * fVar412;
      fVar378 = fVar277 * fVar452 + fVar264 * fVar467 + fVar210 * 0.27778545 + fVar247 * fVar424;
      fVar380 = fVar278 * fVar453 + fVar265 * fVar468 + fVar211 * 0.27778545 + fVar248 * fVar425;
      fVar382 = fVar279 * fVar454 + fVar266 * fVar469 + fVar212 * 0.27778545 + fVar249 * fVar426;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar213 = fVar267 * fVar412 + fVar250 * fVar437 + fVar184 * fVar455 + fVar213 * fVar427;
      fVar247 = fVar277 * fVar424 + fVar264 * fVar452 + fVar210 * fVar467 + fVar247 * fVar434;
      fVar248 = fVar278 * fVar425 + fVar265 * fVar453 + fVar211 * fVar468 + fVar248 * fVar435;
      fVar249 = fVar279 * fVar426 + fVar266 * fVar454 + fVar212 * fVar469 + fVar249 * fVar436;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar384 = (*pfVar109 + *pfVar2) * fVar115;
      fVar395 = (pfVar109[1] + pfVar2[1]) * fVar180;
      fVar396 = (pfVar109[2] + pfVar2[2]) * fVar181;
      fVar397 = (pfVar109[3] + pfVar2[3]) * fVar182;
      fVar267 = (*pfVar109 - *pfVar2) * fVar115;
      fVar277 = (pfVar109[1] - pfVar2[1]) * fVar180;
      fVar278 = (pfVar109[2] - pfVar2[2]) * fVar181;
      fVar279 = (pfVar109[3] - pfVar2[3]) * fVar182;
      fVar250 = fVar280 + fVar267;
      fVar264 = fVar302 + fVar277;
      fVar265 = fVar303 + fVar278;
      fVar266 = fVar304 + fVar279;
      fVar267 = fVar267 - fVar280;
      fVar277 = fVar277 - fVar302;
      fVar278 = fVar278 - fVar303;
      fVar279 = fVar279 - fVar304;
      fVar184 = fVar305 + fVar384;
      fVar210 = fVar328 + fVar395;
      fVar211 = fVar329 + fVar396;
      fVar212 = fVar330 + fVar397;
      fVar384 = fVar384 - fVar305;
      fVar395 = fVar395 - fVar328;
      fVar396 = fVar396 - fVar329;
      fVar397 = fVar397 - fVar330;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = auVar141._0_4_ + fVar184;
      pfVar109[1] = auVar141._4_4_ + fVar210;
      pfVar109[2] = auVar141._8_4_ + fVar211;
      pfVar109[3] = auVar141._12_4_ + fVar212;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar331 + fVar250;
      pfVar109[1] = fVar342 + fVar264;
      pfVar109[2] = fVar343 + fVar265;
      pfVar109[3] = fVar344 + fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar346 + fVar267;
      pfVar109[1] = fVar378 + fVar277;
      pfVar109[2] = fVar380 + fVar278;
      pfVar109[3] = fVar382 + fVar279;
      auVar219._0_4_ = fVar213 + fVar384;
      auVar219._4_4_ = fVar247 + fVar395;
      auVar219._8_4_ = fVar248 + fVar396;
      auVar219._12_4_ = fVar249 + fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar219;
      auVar349._0_4_ = fVar384 - fVar213;
      auVar349._4_4_ = fVar395 - fVar247;
      auVar349._8_4_ = fVar396 - fVar248;
      auVar349._12_4_ = fVar397 - fVar249;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar349;
      auVar309._0_4_ = fVar267 - fVar346;
      auVar309._4_4_ = fVar277 - fVar378;
      auVar309._8_4_ = fVar278 - fVar380;
      auVar309._12_4_ = fVar279 - fVar382;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar309;
      auVar282._0_4_ = fVar250 - fVar331;
      auVar282._4_4_ = fVar264 - fVar342;
      auVar282._8_4_ = fVar265 - fVar343;
      auVar282._12_4_ = fVar266 - fVar344;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar282;
      auVar188._0_4_ = fVar184 - auVar141._0_4_;
      auVar188._4_4_ = fVar210 - auVar141._4_4_;
      auVar188._8_4_ = fVar211 - auVar141._8_4_;
      auVar188._12_4_ = fVar212 - auVar141._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4)
           = auVar188;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar141._0_12_ = ZEXT812(0x3c23d70a);
    auVar141._12_4_ = 0.0;
    compareBufferRelative(&local_140,&local_150,auVar141._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"5x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar143._0_8_ = std::ostream::flush();
  auVar143._8_56_ = extraout_var_03;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 0x28) {
        auVar142._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar142._8_56_ = extraout_var_04;
        auVar143._4_60_ = auVar142._4_60_;
        auVar143._0_4_ = (float)auVar142._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar143._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar143._0_16_ = ZEXT816(0);
      }
      local_140._buffer[uVar112] = auVar143._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    lVar111 = 0;
    fVar412 = (float)DAT_001c25f0;
    fVar424 = DAT_001c25f0._4_4_;
    fVar425 = (float)DAT_001c2620;
    fVar426 = DAT_001c2620._4_4_;
    fVar427 = DAT_001c2620._8_4_;
    fVar434 = DAT_001c2620._12_4_;
    fVar435 = (float)DAT_001c2630;
    fVar436 = DAT_001c2630._4_4_;
    fVar437 = DAT_001c2630._8_4_;
    fVar452 = DAT_001c2630._12_4_;
    fVar453 = (float)DAT_001c2640;
    fVar454 = DAT_001c2640._4_4_;
    fVar455 = DAT_001c2640._8_4_;
    fVar467 = DAT_001c2640._12_4_;
    fVar468 = (float)DAT_001c2650;
    fVar469 = DAT_001c2650._4_4_;
    fVar115 = DAT_001c2650._8_4_;
    fVar180 = DAT_001c2650._12_4_;
    do {
      fVar211 = (*(float *)((undefined1 *)local_150._buffer + lVar111) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar412;
      fVar212 = (*(float *)((undefined1 *)local_150._buffer + lVar111) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar424;
      fVar247 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar181 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 0xc);
      fVar182 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 4);
      fVar184 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 4);
      fVar210 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 0xc);
      fVar248 = fVar210 * fVar468 + fVar184 * fVar453 + fVar182 * fVar435 + fVar181 * fVar425;
      fVar249 = fVar210 * fVar469 + fVar184 * fVar454 + fVar182 * fVar436 + fVar181 * fVar426;
      fVar250 = fVar210 * fVar115 + fVar184 * fVar455 + fVar182 * fVar437 + fVar181 * fVar427;
      fVar184 = fVar210 * fVar180 + fVar184 * fVar467 + fVar182 * fVar452 + fVar181 * fVar434;
      fVar181 = fVar247 + fVar212;
      fVar182 = fVar213 + fVar211;
      fVar211 = fVar211 - fVar213;
      fVar212 = fVar212 - fVar247;
      auVar120._0_4_ = fVar248 + fVar182;
      auVar120._4_4_ = fVar249 + fVar181;
      auVar120._8_4_ = fVar250 + fVar212;
      auVar120._12_4_ = fVar184 + fVar211;
      auVar143._0_16_ = auVar120;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar111) = auVar120;
      auVar220._4_4_ = fVar212 - fVar250;
      auVar220._0_4_ = fVar211 - fVar184;
      auVar220._8_4_ = fVar181 - fVar249;
      auVar220._12_4_ = fVar182 - fVar248;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111) =
           auVar220;
      lVar111 = lVar111 + 0x20;
    } while (lVar111 != 0xa0);
    lVar111 = -8;
    fVar437 = (float)DAT_001c2680;
    fVar452 = DAT_001c2680._4_4_;
    fVar453 = DAT_001c2680._8_4_;
    fVar454 = DAT_001c2680._12_4_;
    fVar455 = (float)DAT_001c26b0;
    fVar467 = DAT_001c26b0._4_4_;
    fVar468 = DAT_001c26b0._8_4_;
    fVar469 = DAT_001c26b0._12_4_;
    fVar412 = (float)DAT_001c26d0;
    fVar424 = DAT_001c26d0._4_4_;
    fVar425 = DAT_001c26d0._8_4_;
    fVar426 = DAT_001c26d0._12_4_;
    fVar427 = (float)DAT_001c26e0;
    fVar434 = DAT_001c26e0._4_4_;
    fVar435 = DAT_001c26e0._8_4_;
    fVar436 = DAT_001c26e0._12_4_;
    fVar115 = (float)DAT_001c26f0;
    fVar180 = DAT_001c26f0._4_4_;
    fVar181 = DAT_001c26f0._8_4_;
    fVar182 = DAT_001c26f0._12_4_;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar184 = *pfVar109;
      fVar210 = pfVar109[1];
      fVar211 = pfVar109[2];
      fVar212 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar213 = *pfVar2;
      fVar247 = pfVar2[1];
      fVar248 = pfVar2[2];
      fVar249 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar280 = *pfVar109 * 0.19134216 - *pfVar2 * 0.46193984;
      fVar302 = pfVar109[1] * 0.19134216 - pfVar2[1] * 0.46193984;
      fVar303 = pfVar109[2] * 0.19134216 - pfVar2[2] * 0.46193984;
      fVar304 = pfVar109[3] * 0.19134216 - pfVar2[3] * 0.46193984;
      fVar305 = *pfVar2 * 0.19134216 + *pfVar109 * 0.46193984;
      fVar328 = pfVar2[1] * 0.19134216 + pfVar109[1] * 0.46193984;
      fVar329 = pfVar2[2] * 0.19134216 + pfVar109[2] * 0.46193984;
      fVar330 = pfVar2[3] * 0.19134216 + pfVar109[3] * 0.46193984;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar250 = *pfVar109;
      fVar264 = pfVar109[1];
      fVar265 = pfVar109[2];
      fVar266 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar267 = *pfVar109;
      fVar277 = pfVar109[1];
      fVar278 = pfVar109[2];
      fVar279 = pfVar109[3];
      auVar143._0_4_ =
           fVar267 * fVar455 + fVar250 * 0.27778545 + fVar184 * 0.49039266 + fVar213 * fVar437;
      auVar143._4_4_ =
           fVar277 * fVar467 + fVar264 * 0.27778545 + fVar210 * 0.49039266 + fVar247 * fVar452;
      auVar143._8_4_ =
           fVar278 * fVar468 + fVar265 * 0.27778545 + fVar211 * 0.49039266 + fVar248 * fVar453;
      auVar143._12_4_ =
           fVar279 * fVar469 + fVar266 * 0.27778545 + fVar212 * 0.49039266 + fVar249 * fVar454;
      fVar331 = fVar267 * fVar427 + fVar250 * fVar412 + fVar184 * fVar437 + fVar213 * -0.097545706;
      fVar342 = fVar277 * fVar434 + fVar264 * fVar424 + fVar210 * fVar452 + fVar247 * -0.097545706;
      fVar343 = fVar278 * fVar435 + fVar265 * fVar425 + fVar211 * fVar453 + fVar248 * -0.097545706;
      fVar344 = fVar279 * fVar436 + fVar266 * fVar426 + fVar212 * fVar454 + fVar249 * -0.097545706;
      fVar346 = fVar267 * fVar437 + fVar250 * fVar455 + fVar184 * 0.27778545 + fVar213 * fVar412;
      fVar378 = fVar277 * fVar452 + fVar264 * fVar467 + fVar210 * 0.27778545 + fVar247 * fVar424;
      fVar380 = fVar278 * fVar453 + fVar265 * fVar468 + fVar211 * 0.27778545 + fVar248 * fVar425;
      fVar382 = fVar279 * fVar454 + fVar266 * fVar469 + fVar212 * 0.27778545 + fVar249 * fVar426;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar213 = fVar267 * fVar412 + fVar250 * fVar437 + fVar184 * fVar455 + fVar213 * fVar427;
      fVar247 = fVar277 * fVar424 + fVar264 * fVar452 + fVar210 * fVar467 + fVar247 * fVar434;
      fVar248 = fVar278 * fVar425 + fVar265 * fVar453 + fVar211 * fVar468 + fVar248 * fVar435;
      fVar249 = fVar279 * fVar426 + fVar266 * fVar454 + fVar212 * fVar469 + fVar249 * fVar436;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar384 = (*pfVar109 + *pfVar2) * fVar115;
      fVar395 = (pfVar109[1] + pfVar2[1]) * fVar180;
      fVar396 = (pfVar109[2] + pfVar2[2]) * fVar181;
      fVar397 = (pfVar109[3] + pfVar2[3]) * fVar182;
      fVar267 = (*pfVar109 - *pfVar2) * fVar115;
      fVar277 = (pfVar109[1] - pfVar2[1]) * fVar180;
      fVar278 = (pfVar109[2] - pfVar2[2]) * fVar181;
      fVar279 = (pfVar109[3] - pfVar2[3]) * fVar182;
      fVar250 = fVar280 + fVar267;
      fVar264 = fVar302 + fVar277;
      fVar265 = fVar303 + fVar278;
      fVar266 = fVar304 + fVar279;
      fVar267 = fVar267 - fVar280;
      fVar277 = fVar277 - fVar302;
      fVar278 = fVar278 - fVar303;
      fVar279 = fVar279 - fVar304;
      fVar184 = fVar305 + fVar384;
      fVar210 = fVar328 + fVar395;
      fVar211 = fVar329 + fVar396;
      fVar212 = fVar330 + fVar397;
      fVar384 = fVar384 - fVar305;
      fVar395 = fVar395 - fVar328;
      fVar396 = fVar396 - fVar329;
      fVar397 = fVar397 - fVar330;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = auVar143._0_4_ + fVar184;
      pfVar109[1] = auVar143._4_4_ + fVar210;
      pfVar109[2] = auVar143._8_4_ + fVar211;
      pfVar109[3] = auVar143._12_4_ + fVar212;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar331 + fVar250;
      pfVar109[1] = fVar342 + fVar264;
      pfVar109[2] = fVar343 + fVar265;
      pfVar109[3] = fVar344 + fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar346 + fVar267;
      pfVar109[1] = fVar378 + fVar277;
      pfVar109[2] = fVar380 + fVar278;
      pfVar109[3] = fVar382 + fVar279;
      auVar221._0_4_ = fVar213 + fVar384;
      auVar221._4_4_ = fVar247 + fVar395;
      auVar221._8_4_ = fVar248 + fVar396;
      auVar221._12_4_ = fVar249 + fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar221;
      auVar350._0_4_ = fVar384 - fVar213;
      auVar350._4_4_ = fVar395 - fVar247;
      auVar350._8_4_ = fVar396 - fVar248;
      auVar350._12_4_ = fVar397 - fVar249;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar350;
      auVar310._0_4_ = fVar267 - fVar346;
      auVar310._4_4_ = fVar277 - fVar378;
      auVar310._8_4_ = fVar278 - fVar380;
      auVar310._12_4_ = fVar279 - fVar382;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar310;
      auVar283._0_4_ = fVar250 - fVar331;
      auVar283._4_4_ = fVar264 - fVar342;
      auVar283._8_4_ = fVar265 - fVar343;
      auVar283._12_4_ = fVar266 - fVar344;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar283;
      auVar189._0_4_ = fVar184 - auVar143._0_4_;
      auVar189._4_4_ = fVar210 - auVar143._4_4_;
      auVar189._8_4_ = fVar211 - auVar143._8_4_;
      auVar189._12_4_ = fVar212 - auVar143._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4)
           = auVar189;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar143._0_12_ = ZEXT812(0x3c23d70a);
    auVar143._12_4_ = 0.0;
    compareBufferRelative(&local_140,&local_150,auVar143._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar145._0_8_ = std::ostream::flush();
  auVar145._8_56_ = extraout_var_05;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 0x20) {
        auVar144._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar144._8_56_ = extraout_var_06;
        auVar145._4_60_ = auVar144._4_60_;
        auVar145._0_4_ = (float)auVar144._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar145._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar145._0_16_ = ZEXT816(0);
      }
      auVar183 = auVar145._16_48_;
      local_140._buffer[uVar112] = auVar145._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
    fVar424 = *(float *)((undefined1 *)local_150._buffer + 0xc);
    fVar115 = *(float *)((undefined1 *)local_150._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.46193984;
    fVar180 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) * 0.46193984;
    fVar181 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) * 0.46193984;
    fVar182 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) * 0.46193984;
    fVar184 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_150._buffer + 8) * 0.46193984;
    fVar210 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) * 0.46193984;
    fVar211 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) * 0.46193984;
    fVar212 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) * 0.46193984;
    fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
    fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
    fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
    fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
    fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
    fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
    fVar346 = (float)DAT_001c2680;
    fVar378 = DAT_001c2680._4_4_;
    fVar380 = DAT_001c2680._8_4_;
    fVar382 = DAT_001c2680._12_4_;
    fVar437 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
    fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
    fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
    fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
    fVar455 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
    fVar467 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
    fVar468 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
    fVar469 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
    fVar280 = (float)DAT_001c26b0;
    fVar302 = DAT_001c26b0._4_4_;
    fVar303 = DAT_001c26b0._8_4_;
    fVar304 = DAT_001c26b0._12_4_;
    fVar331 = fVar469 * fVar280 + fVar454 * 0.27778545 + fVar412 * 0.49039266 + fVar424 * fVar346;
    fVar342 = fVar468 * fVar302 + fVar453 * 0.27778545 + fVar427 * 0.49039266 + fVar436 * fVar378;
    fVar343 = fVar467 * fVar303 + fVar452 * 0.27778545 + fVar426 * 0.49039266 + fVar435 * fVar380;
    fVar344 = fVar455 * fVar304 + fVar437 * 0.27778545 + fVar425 * 0.49039266 + fVar434 * fVar382;
    fVar305 = (float)DAT_001c26d0;
    fVar328 = DAT_001c26d0._4_4_;
    fVar329 = DAT_001c26d0._8_4_;
    fVar330 = DAT_001c26d0._12_4_;
    fVar213 = fVar469 * -0.27778545 + fVar454 * fVar305 + fVar412 * fVar346 + fVar424 * -0.097545706
    ;
    fVar247 = fVar468 * -0.27778545 + fVar453 * fVar328 + fVar427 * fVar378 + fVar436 * -0.097545706
    ;
    fVar248 = fVar467 * -0.27778545 + fVar452 * fVar329 + fVar426 * fVar380 + fVar435 * -0.097545706
    ;
    fVar249 = fVar455 * -0.27778545 + fVar437 * fVar330 + fVar425 * fVar382 + fVar434 * -0.097545706
    ;
    fVar250 = fVar469 * fVar346 + fVar454 * fVar280 + fVar412 * 0.27778545 + fVar424 * fVar305;
    fVar264 = fVar468 * fVar378 + fVar453 * fVar302 + fVar427 * 0.27778545 + fVar436 * fVar328;
    fVar265 = fVar467 * fVar380 + fVar452 * fVar303 + fVar426 * 0.27778545 + fVar435 * fVar329;
    fVar266 = fVar455 * fVar382 + fVar437 * fVar304 + fVar425 * 0.27778545 + fVar434 * fVar330;
    fVar454 = fVar469 * fVar305 + fVar454 * fVar346 + fVar412 * fVar280 + fVar424 * -0.27778545;
    fVar453 = fVar468 * fVar328 + fVar453 * fVar378 + fVar427 * fVar302 + fVar436 * -0.27778545;
    fVar452 = fVar467 * fVar329 + fVar452 * fVar380 + fVar426 * fVar303 + fVar435 * -0.27778545;
    fVar437 = fVar455 * fVar330 + fVar437 * fVar382 + fVar425 * fVar304 + fVar434 * -0.27778545;
    fVar412 = (*(float *)(undefined1 *)local_150._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar424 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30)) * 0.35355362;
    fVar425 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50)) * 0.35355362;
    fVar426 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70)) * 0.35355362;
    fVar267 = (*(float *)(undefined1 *)local_150._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar277 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30)) * 0.35355362;
    fVar278 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50)) * 0.35355362;
    fVar279 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70)) * 0.35355362;
    fVar455 = fVar184 + fVar412;
    fVar467 = fVar210 + fVar424;
    fVar468 = fVar211 + fVar425;
    fVar469 = fVar212 + fVar426;
    fVar427 = fVar115 + fVar267;
    fVar434 = fVar180 + fVar277;
    fVar435 = fVar181 + fVar278;
    fVar436 = fVar182 + fVar279;
    fVar267 = fVar267 - fVar115;
    fVar277 = fVar277 - fVar180;
    fVar278 = fVar278 - fVar181;
    fVar279 = fVar279 - fVar182;
    fVar412 = fVar412 - fVar184;
    fVar424 = fVar424 - fVar210;
    fVar425 = fVar425 - fVar211;
    fVar426 = fVar426 - fVar212;
    local_70 = fVar331 + fVar455;
    fStack_6c = fVar342 + fVar467;
    fStack_68 = fVar343 + fVar468;
    fStack_64 = fVar344 + fVar469;
    local_80 = CONCAT44(fVar213 + fVar427,local_70);
    uStack_78._0_4_ = fVar250 + fVar267;
    uStack_78._4_4_ = fVar454 + fVar412;
    auVar311._4_4_ = fVar267 - fVar250;
    auVar311._0_4_ = fVar412 - fVar454;
    auVar311._8_4_ = fVar427 - fVar213;
    auVar311._12_4_ = fVar455 - fVar331;
    auVar332._4_4_ = fVar247 + fVar434;
    auVar332._0_4_ = fStack_6c;
    auVar332._8_4_ = fVar264 + fVar277;
    auVar332._12_4_ = fVar453 + fVar424;
    auVar222._4_4_ = fVar248 + fVar435;
    auVar222._0_4_ = fStack_68;
    auVar222._8_4_ = fVar265 + fVar278;
    auVar222._12_4_ = fVar452 + fVar425;
    auVar403._4_4_ = fVar279 - fVar266;
    auVar403._0_4_ = fVar426 - fVar437;
    auVar403._8_4_ = fVar436 - fVar249;
    auVar403._12_4_ = fVar469 - fVar344;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x70) = auVar403;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fStack_6c;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar249 + fVar436;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar266 + fVar279;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar437 + fVar426;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar425 - fVar452;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar278 - fVar265;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar435 - fVar248;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar468 - fVar343;
    fVar412 = (float)DAT_001c2660;
    fVar425 = DAT_001c2660._4_4_;
    fVar426 = DAT_001c2660._8_4_;
    fVar427 = DAT_001c2660._12_4_;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x40) = auVar222;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar424 - fVar453;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar277 - fVar264;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar434 - fVar247;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar467 - fVar342;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x20) = auVar332;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar311;
    *(undefined8 *)(undefined1 *)local_150._buffer = local_80;
    *(undefined8 *)((undefined1 *)local_150._buffer + 8) = uStack_78;
    lVar111 = -8;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar424 = *pfVar109;
      fVar434 = pfVar109[1];
      fVar435 = pfVar109[2];
      fVar436 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar437 = *pfVar2;
      fVar452 = pfVar2[1];
      fVar453 = pfVar2[2];
      fVar454 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar213 = *pfVar109 * 0.19134216 - *pfVar2 * fVar412;
      fVar247 = pfVar109[1] * 0.19134216 - pfVar2[1] * fVar425;
      fVar248 = pfVar109[2] * 0.19134216 - pfVar2[2] * fVar426;
      fVar249 = pfVar109[3] * 0.19134216 - pfVar2[3] * fVar427;
      fVar250 = *pfVar2 * 0.19134216 + *pfVar109 * fVar412;
      fVar264 = pfVar2[1] * 0.19134216 + pfVar109[1] * fVar425;
      fVar265 = pfVar2[2] * 0.19134216 + pfVar109[2] * fVar426;
      fVar266 = pfVar2[3] * 0.19134216 + pfVar109[3] * fVar427;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar455 = *pfVar109;
      fVar467 = pfVar109[1];
      fVar468 = pfVar109[2];
      fVar469 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar115 = *pfVar109;
      fVar180 = pfVar109[1];
      fVar181 = pfVar109[2];
      fVar182 = pfVar109[3];
      fVar184 = fVar115 * fVar280 + fVar455 * 0.27778545 + fVar424 * 0.49039266 + fVar437 * fVar346;
      fVar210 = fVar180 * fVar302 + fVar467 * 0.27778545 + fVar434 * 0.49039266 + fVar452 * fVar378;
      fVar211 = fVar181 * fVar303 + fVar468 * 0.27778545 + fVar435 * 0.49039266 + fVar453 * fVar380;
      fVar212 = fVar182 * fVar304 + fVar469 * 0.27778545 + fVar436 * 0.49039266 + fVar454 * fVar382;
      fVar267 = fVar115 * (float)DAT_001c26e0 +
                fVar455 * fVar305 + fVar424 * fVar346 + fVar437 * -0.097545706;
      fVar277 = fVar180 * DAT_001c26e0._4_4_ +
                fVar467 * fVar328 + fVar434 * fVar378 + fVar452 * -0.097545706;
      fVar278 = fVar181 * DAT_001c26e0._8_4_ +
                fVar468 * fVar329 + fVar435 * fVar380 + fVar453 * -0.097545706;
      fVar279 = fVar182 * DAT_001c26e0._12_4_ +
                fVar469 * fVar330 + fVar436 * fVar382 + fVar454 * -0.097545706;
      fVar331 = fVar115 * fVar346 + fVar455 * fVar280 + fVar424 * 0.27778545 + fVar437 * fVar305;
      fVar342 = fVar180 * fVar378 + fVar467 * fVar302 + fVar434 * 0.27778545 + fVar452 * fVar328;
      fVar343 = fVar181 * fVar380 + fVar468 * fVar303 + fVar435 * 0.27778545 + fVar453 * fVar329;
      fVar344 = fVar182 * fVar382 + fVar469 * fVar304 + fVar436 * 0.27778545 + fVar454 * fVar330;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar437 = fVar115 * fVar305 +
                fVar455 * fVar346 + fVar424 * fVar280 + fVar437 * (float)DAT_001c26e0;
      fVar452 = fVar180 * fVar328 +
                fVar467 * fVar378 + fVar434 * fVar302 + fVar452 * DAT_001c26e0._4_4_;
      fVar453 = fVar181 * fVar329 +
                fVar468 * fVar380 + fVar435 * fVar303 + fVar453 * DAT_001c26e0._8_4_;
      fVar454 = fVar182 * fVar330 +
                fVar469 * fVar382 + fVar436 * fVar304 + fVar454 * DAT_001c26e0._12_4_;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar384 = (*pfVar109 + *pfVar2) * (float)DAT_001c26f0;
      fVar395 = (pfVar109[1] + pfVar2[1]) * DAT_001c26f0._4_4_;
      fVar396 = (pfVar109[2] + pfVar2[2]) * DAT_001c26f0._8_4_;
      fVar397 = (pfVar109[3] + pfVar2[3]) * DAT_001c26f0._12_4_;
      fVar115 = (*pfVar109 - *pfVar2) * (float)DAT_001c26f0;
      fVar180 = (pfVar109[1] - pfVar2[1]) * DAT_001c26f0._4_4_;
      fVar181 = (pfVar109[2] - pfVar2[2]) * DAT_001c26f0._8_4_;
      fVar182 = (pfVar109[3] - pfVar2[3]) * DAT_001c26f0._12_4_;
      fVar455 = fVar213 + fVar115;
      fVar467 = fVar247 + fVar180;
      fVar468 = fVar248 + fVar181;
      fVar469 = fVar249 + fVar182;
      fVar115 = fVar115 - fVar213;
      fVar180 = fVar180 - fVar247;
      fVar181 = fVar181 - fVar248;
      fVar182 = fVar182 - fVar249;
      fVar424 = fVar250 + fVar384;
      fVar434 = fVar264 + fVar395;
      fVar435 = fVar265 + fVar396;
      fVar436 = fVar266 + fVar397;
      fVar384 = fVar384 - fVar250;
      fVar395 = fVar395 - fVar264;
      fVar396 = fVar396 - fVar265;
      fVar397 = fVar397 - fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = fVar184 + fVar424;
      pfVar109[1] = fVar210 + fVar434;
      pfVar109[2] = fVar211 + fVar435;
      pfVar109[3] = fVar212 + fVar436;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar267 + fVar455;
      pfVar109[1] = fVar277 + fVar467;
      pfVar109[2] = fVar278 + fVar468;
      pfVar109[3] = fVar279 + fVar469;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar331 + fVar115;
      pfVar109[1] = fVar342 + fVar180;
      pfVar109[2] = fVar343 + fVar181;
      pfVar109[3] = fVar344 + fVar182;
      auVar223._0_4_ = fVar437 + fVar384;
      auVar223._4_4_ = fVar452 + fVar395;
      auVar223._8_4_ = fVar453 + fVar396;
      auVar223._12_4_ = fVar454 + fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar223;
      auVar351._0_4_ = fVar384 - fVar437;
      auVar351._4_4_ = fVar395 - fVar452;
      auVar351._8_4_ = fVar396 - fVar453;
      auVar351._12_4_ = fVar397 - fVar454;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar351;
      auVar312._0_4_ = fVar115 - fVar331;
      auVar312._4_4_ = fVar180 - fVar342;
      auVar312._8_4_ = fVar181 - fVar343;
      auVar312._12_4_ = fVar182 - fVar344;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar312;
      auVar284._0_4_ = fVar455 - fVar267;
      auVar284._4_4_ = fVar467 - fVar277;
      auVar284._8_4_ = fVar468 - fVar278;
      auVar284._12_4_ = fVar469 - fVar279;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar284;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      *pfVar109 = fVar424 - fVar184;
      pfVar109[1] = fVar434 - fVar210;
      pfVar109[2] = fVar435 - fVar211;
      pfVar109[3] = fVar436 - fVar212;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar145._0_12_ = ZEXT812(0x3c23d70a);
    auVar145._12_4_ = 0;
    auVar145._16_48_ = auVar183;
    compareBufferRelative(&local_140,&local_150,auVar145._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar147._0_8_ = std::ostream::flush();
  auVar147._8_56_ = extraout_var_07;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 0x18) {
        auVar146._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar146._8_56_ = extraout_var_08;
        auVar147._4_60_ = auVar146._4_60_;
        auVar147._0_4_ = (float)auVar146._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar147._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar147._0_16_ = ZEXT816(0);
      }
      local_140._buffer[uVar112] = auVar147._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    lVar111 = 0;
    fVar412 = (float)DAT_001c25f0;
    fVar424 = DAT_001c25f0._4_4_;
    fVar425 = (float)DAT_001c2620;
    fVar426 = DAT_001c2620._4_4_;
    fVar427 = DAT_001c2620._8_4_;
    fVar434 = DAT_001c2620._12_4_;
    fVar435 = (float)DAT_001c2630;
    fVar436 = DAT_001c2630._4_4_;
    fVar437 = DAT_001c2630._8_4_;
    fVar452 = DAT_001c2630._12_4_;
    fVar453 = (float)DAT_001c2640;
    fVar454 = DAT_001c2640._4_4_;
    fVar455 = DAT_001c2640._8_4_;
    fVar467 = DAT_001c2640._12_4_;
    fVar468 = (float)DAT_001c2650;
    fVar469 = DAT_001c2650._4_4_;
    fVar115 = DAT_001c2650._8_4_;
    fVar180 = DAT_001c2650._12_4_;
    do {
      fVar211 = (*(float *)((undefined1 *)local_150._buffer + lVar111) +
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar412;
      fVar212 = (*(float *)((undefined1 *)local_150._buffer + lVar111) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111)) *
                fVar424;
      fVar247 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),0) -
                *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),0);
      fVar213 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 8) *
                SUB164(ZEXT816(0x3e43ef333eec8361),4) +
                *(float *)((undefined1 *)local_150._buffer + lVar111 + 8) *
                SUB164(ZEXT816(0x3eec83613e43ef33),4);
      fVar181 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 0xc);
      fVar182 = *(float *)((undefined1 *)local_150._buffer + lVar111 + 4);
      fVar184 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 4);
      fVar210 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111 + 0xc);
      fVar248 = fVar210 * fVar468 + fVar184 * fVar453 + fVar182 * fVar435 + fVar181 * fVar425;
      fVar249 = fVar210 * fVar469 + fVar184 * fVar454 + fVar182 * fVar436 + fVar181 * fVar426;
      fVar250 = fVar210 * fVar115 + fVar184 * fVar455 + fVar182 * fVar437 + fVar181 * fVar427;
      fVar184 = fVar210 * fVar180 + fVar184 * fVar467 + fVar182 * fVar452 + fVar181 * fVar434;
      fVar181 = fVar247 + fVar212;
      fVar182 = fVar213 + fVar211;
      fVar211 = fVar211 - fVar213;
      fVar212 = fVar212 - fVar247;
      auVar121._0_4_ = fVar248 + fVar182;
      auVar121._4_4_ = fVar249 + fVar181;
      auVar121._8_4_ = fVar250 + fVar212;
      auVar121._12_4_ = fVar184 + fVar211;
      auVar147._0_16_ = auVar121;
      *(undefined1 (*) [16])((undefined1 *)local_150._buffer + lVar111) = auVar121;
      auVar224._4_4_ = fVar212 - fVar250;
      auVar224._0_4_ = fVar211 - fVar184;
      auVar224._8_4_ = fVar181 - fVar249;
      auVar224._12_4_ = fVar182 - fVar248;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + lVar111) =
           auVar224;
      lVar111 = lVar111 + 0x20;
    } while (lVar111 != 0x60);
    lVar111 = -8;
    fVar437 = (float)DAT_001c2680;
    fVar452 = DAT_001c2680._4_4_;
    fVar453 = DAT_001c2680._8_4_;
    fVar454 = DAT_001c2680._12_4_;
    fVar455 = (float)DAT_001c26b0;
    fVar467 = DAT_001c26b0._4_4_;
    fVar468 = DAT_001c26b0._8_4_;
    fVar469 = DAT_001c26b0._12_4_;
    fVar412 = (float)DAT_001c26d0;
    fVar424 = DAT_001c26d0._4_4_;
    fVar425 = DAT_001c26d0._8_4_;
    fVar426 = DAT_001c26d0._12_4_;
    fVar427 = (float)DAT_001c26e0;
    fVar434 = DAT_001c26e0._4_4_;
    fVar435 = DAT_001c26e0._8_4_;
    fVar436 = DAT_001c26e0._12_4_;
    fVar115 = (float)DAT_001c26f0;
    fVar180 = DAT_001c26f0._4_4_;
    fVar181 = DAT_001c26f0._8_4_;
    fVar182 = DAT_001c26f0._12_4_;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar184 = *pfVar109;
      fVar210 = pfVar109[1];
      fVar211 = pfVar109[2];
      fVar212 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar213 = *pfVar2;
      fVar247 = pfVar2[1];
      fVar248 = pfVar2[2];
      fVar249 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar280 = *pfVar109 * 0.19134216 - *pfVar2 * 0.46193984;
      fVar302 = pfVar109[1] * 0.19134216 - pfVar2[1] * 0.46193984;
      fVar303 = pfVar109[2] * 0.19134216 - pfVar2[2] * 0.46193984;
      fVar304 = pfVar109[3] * 0.19134216 - pfVar2[3] * 0.46193984;
      fVar305 = *pfVar2 * 0.19134216 + *pfVar109 * 0.46193984;
      fVar328 = pfVar2[1] * 0.19134216 + pfVar109[1] * 0.46193984;
      fVar329 = pfVar2[2] * 0.19134216 + pfVar109[2] * 0.46193984;
      fVar330 = pfVar2[3] * 0.19134216 + pfVar109[3] * 0.46193984;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar250 = *pfVar109;
      fVar264 = pfVar109[1];
      fVar265 = pfVar109[2];
      fVar266 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar267 = *pfVar109;
      fVar277 = pfVar109[1];
      fVar278 = pfVar109[2];
      fVar279 = pfVar109[3];
      auVar147._0_4_ =
           fVar267 * fVar455 + fVar250 * 0.27778545 + fVar184 * 0.49039266 + fVar213 * fVar437;
      auVar147._4_4_ =
           fVar277 * fVar467 + fVar264 * 0.27778545 + fVar210 * 0.49039266 + fVar247 * fVar452;
      auVar147._8_4_ =
           fVar278 * fVar468 + fVar265 * 0.27778545 + fVar211 * 0.49039266 + fVar248 * fVar453;
      auVar147._12_4_ =
           fVar279 * fVar469 + fVar266 * 0.27778545 + fVar212 * 0.49039266 + fVar249 * fVar454;
      fVar331 = fVar267 * fVar427 + fVar250 * fVar412 + fVar184 * fVar437 + fVar213 * -0.097545706;
      fVar342 = fVar277 * fVar434 + fVar264 * fVar424 + fVar210 * fVar452 + fVar247 * -0.097545706;
      fVar343 = fVar278 * fVar435 + fVar265 * fVar425 + fVar211 * fVar453 + fVar248 * -0.097545706;
      fVar344 = fVar279 * fVar436 + fVar266 * fVar426 + fVar212 * fVar454 + fVar249 * -0.097545706;
      fVar346 = fVar267 * fVar437 + fVar250 * fVar455 + fVar184 * 0.27778545 + fVar213 * fVar412;
      fVar378 = fVar277 * fVar452 + fVar264 * fVar467 + fVar210 * 0.27778545 + fVar247 * fVar424;
      fVar380 = fVar278 * fVar453 + fVar265 * fVar468 + fVar211 * 0.27778545 + fVar248 * fVar425;
      fVar382 = fVar279 * fVar454 + fVar266 * fVar469 + fVar212 * 0.27778545 + fVar249 * fVar426;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar213 = fVar267 * fVar412 + fVar250 * fVar437 + fVar184 * fVar455 + fVar213 * fVar427;
      fVar247 = fVar277 * fVar424 + fVar264 * fVar452 + fVar210 * fVar467 + fVar247 * fVar434;
      fVar248 = fVar278 * fVar425 + fVar265 * fVar453 + fVar211 * fVar468 + fVar248 * fVar435;
      fVar249 = fVar279 * fVar426 + fVar266 * fVar454 + fVar212 * fVar469 + fVar249 * fVar436;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar384 = (*pfVar109 + *pfVar2) * fVar115;
      fVar395 = (pfVar109[1] + pfVar2[1]) * fVar180;
      fVar396 = (pfVar109[2] + pfVar2[2]) * fVar181;
      fVar397 = (pfVar109[3] + pfVar2[3]) * fVar182;
      fVar267 = (*pfVar109 - *pfVar2) * fVar115;
      fVar277 = (pfVar109[1] - pfVar2[1]) * fVar180;
      fVar278 = (pfVar109[2] - pfVar2[2]) * fVar181;
      fVar279 = (pfVar109[3] - pfVar2[3]) * fVar182;
      fVar250 = fVar280 + fVar267;
      fVar264 = fVar302 + fVar277;
      fVar265 = fVar303 + fVar278;
      fVar266 = fVar304 + fVar279;
      fVar267 = fVar267 - fVar280;
      fVar277 = fVar277 - fVar302;
      fVar278 = fVar278 - fVar303;
      fVar279 = fVar279 - fVar304;
      fVar184 = fVar305 + fVar384;
      fVar210 = fVar328 + fVar395;
      fVar211 = fVar329 + fVar396;
      fVar212 = fVar330 + fVar397;
      fVar384 = fVar384 - fVar305;
      fVar395 = fVar395 - fVar328;
      fVar396 = fVar396 - fVar329;
      fVar397 = fVar397 - fVar330;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = auVar147._0_4_ + fVar184;
      pfVar109[1] = auVar147._4_4_ + fVar210;
      pfVar109[2] = auVar147._8_4_ + fVar211;
      pfVar109[3] = auVar147._12_4_ + fVar212;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar331 + fVar250;
      pfVar109[1] = fVar342 + fVar264;
      pfVar109[2] = fVar343 + fVar265;
      pfVar109[3] = fVar344 + fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar346 + fVar267;
      pfVar109[1] = fVar378 + fVar277;
      pfVar109[2] = fVar380 + fVar278;
      pfVar109[3] = fVar382 + fVar279;
      auVar225._0_4_ = fVar213 + fVar384;
      auVar225._4_4_ = fVar247 + fVar395;
      auVar225._8_4_ = fVar248 + fVar396;
      auVar225._12_4_ = fVar249 + fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar225;
      auVar352._0_4_ = fVar384 - fVar213;
      auVar352._4_4_ = fVar395 - fVar247;
      auVar352._8_4_ = fVar396 - fVar248;
      auVar352._12_4_ = fVar397 - fVar249;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar352;
      auVar313._0_4_ = fVar267 - fVar346;
      auVar313._4_4_ = fVar277 - fVar378;
      auVar313._8_4_ = fVar278 - fVar380;
      auVar313._12_4_ = fVar279 - fVar382;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar313;
      auVar285._0_4_ = fVar250 - fVar331;
      auVar285._4_4_ = fVar264 - fVar342;
      auVar285._8_4_ = fVar265 - fVar343;
      auVar285._12_4_ = fVar266 - fVar344;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar285;
      auVar190._0_4_ = fVar184 - auVar147._0_4_;
      auVar190._4_4_ = fVar210 - auVar147._4_4_;
      auVar190._8_4_ = fVar211 - auVar147._8_4_;
      auVar190._12_4_ = fVar212 - auVar147._12_4_;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4)
           = auVar190;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar147._0_12_ = ZEXT812(0x3c23d70a);
    auVar147._12_4_ = 0.0;
    compareBufferRelative(&local_140,&local_150,auVar147._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar149._0_8_ = std::ostream::flush();
  auVar149._8_56_ = extraout_var_09;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 0x10) {
        auVar148._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar148._8_56_ = extraout_var_10;
        auVar149._4_60_ = auVar148._4_60_;
        auVar149._0_4_ = (float)auVar148._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar149._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar149._0_16_ = ZEXT816(0);
      }
      auVar183 = auVar149._16_48_;
      local_140._buffer[uVar112] = auVar149._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
    fVar424 = *(float *)((undefined1 *)local_150._buffer + 0xc);
    fVar437 = *(float *)((undefined1 *)local_150._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.46193984;
    fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) * 0.46193984;
    fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_150._buffer + 8) * 0.46193984;
    fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) * 0.19134216 +
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) * 0.46193984;
    fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
    fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
    fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
    fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
    fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
    fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
    fVar455 = fVar436 * 0.097545706 +
              fVar434 * 0.27778545 + fVar412 * 0.49039266 + fVar424 * 0.41573495;
    fVar467 = fVar435 * 0.097545706 +
              fVar427 * 0.27778545 + fVar425 * 0.49039266 + fVar426 * 0.41573495;
    fVar468 = fVar436 * -0.27778545 +
              fVar434 * -0.49039266 + fVar412 * 0.41573495 + fVar424 * -0.097545706;
    fVar469 = fVar435 * -0.27778545 +
              fVar427 * -0.49039266 + fVar425 * 0.41573495 + fVar426 * -0.097545706;
    fVar181 = fVar436 * 0.41573495 +
              fVar434 * 0.097545706 + fVar412 * 0.27778545 + fVar424 * -0.49039266;
    fVar182 = fVar435 * 0.41573495 +
              fVar427 * 0.097545706 + fVar425 * 0.27778545 + fVar426 * -0.49039266;
    fVar434 = fVar436 * -0.49039266 +
              fVar434 * 0.41573495 + fVar412 * 0.097545706 + fVar424 * -0.27778545;
    fVar427 = fVar435 * -0.49039266 +
              fVar427 * 0.41573495 + fVar425 * 0.097545706 + fVar426 * -0.27778545;
    fVar425 = (*(float *)(undefined1 *)local_150._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar426 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30)) * 0.35355362;
    fVar412 = (*(float *)(undefined1 *)local_150._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar424 = (*(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30)) * 0.35355362;
    fVar115 = fVar453 + fVar425;
    fVar180 = fVar454 + fVar426;
    fVar435 = fVar437 + fVar412;
    fVar436 = fVar452 + fVar424;
    fVar412 = fVar412 - fVar437;
    fVar424 = fVar424 - fVar452;
    fVar425 = fVar425 - fVar453;
    fVar426 = fVar426 - fVar454;
    auVar333._4_4_ = fVar468 + fVar435;
    auVar333._0_4_ = fVar455 + fVar115;
    auVar333._8_4_ = fVar181 + fVar412;
    auVar333._12_4_ = fVar434 + fVar425;
    auVar386._4_4_ = fVar412 - fVar181;
    auVar386._0_4_ = fVar425 - fVar434;
    auVar386._8_4_ = fVar435 - fVar468;
    auVar386._12_4_ = fVar115 - fVar455;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar426 - fVar427;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar424 - fVar182;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar436 - fVar469;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar180 - fVar467;
    *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar467 + fVar180;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar469 + fVar436;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar182 + fVar424;
    *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar427 + fVar426;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar386;
    *(undefined1 (*) [16])local_150._buffer = auVar333;
    lVar111 = -8;
    fVar437 = (float)DAT_001c2680;
    fVar452 = DAT_001c2680._4_4_;
    fVar453 = DAT_001c2680._8_4_;
    fVar454 = DAT_001c2680._12_4_;
    fVar455 = (float)DAT_001c26b0;
    fVar467 = DAT_001c26b0._4_4_;
    fVar468 = DAT_001c26b0._8_4_;
    fVar469 = DAT_001c26b0._12_4_;
    fVar412 = (float)DAT_001c26d0;
    fVar424 = DAT_001c26d0._4_4_;
    fVar425 = DAT_001c26d0._8_4_;
    fVar426 = DAT_001c26d0._12_4_;
    fVar427 = (float)DAT_001c26e0;
    fVar434 = DAT_001c26e0._4_4_;
    fVar435 = DAT_001c26e0._8_4_;
    fVar436 = DAT_001c26e0._12_4_;
    fVar115 = (float)DAT_001c26f0;
    fVar180 = DAT_001c26f0._4_4_;
    fVar181 = DAT_001c26f0._8_4_;
    fVar182 = DAT_001c26f0._12_4_;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar184 = *pfVar109;
      fVar210 = pfVar109[1];
      fVar211 = pfVar109[2];
      fVar212 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar213 = *pfVar2;
      fVar247 = pfVar2[1];
      fVar248 = pfVar2[2];
      fVar249 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar305 = *pfVar109 * 0.19134216 - *pfVar2 * 0.46193984;
      fVar328 = pfVar109[1] * 0.19134216 - pfVar2[1] * 0.46193984;
      fVar329 = pfVar109[2] * 0.19134216 - pfVar2[2] * 0.46193984;
      fVar330 = pfVar109[3] * 0.19134216 - pfVar2[3] * 0.46193984;
      fVar331 = *pfVar2 * 0.19134216 + *pfVar109 * 0.46193984;
      fVar342 = pfVar2[1] * 0.19134216 + pfVar109[1] * 0.46193984;
      fVar343 = pfVar2[2] * 0.19134216 + pfVar109[2] * 0.46193984;
      fVar344 = pfVar2[3] * 0.19134216 + pfVar109[3] * 0.46193984;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar250 = *pfVar109;
      fVar264 = pfVar109[1];
      fVar265 = pfVar109[2];
      fVar266 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar267 = *pfVar109;
      fVar277 = pfVar109[1];
      fVar278 = pfVar109[2];
      fVar279 = pfVar109[3];
      fVar280 = fVar267 * fVar455 + fVar250 * 0.27778545 + fVar184 * 0.49039266 + fVar213 * fVar437;
      fVar302 = fVar277 * fVar467 + fVar264 * 0.27778545 + fVar210 * 0.49039266 + fVar247 * fVar452;
      fVar303 = fVar278 * fVar468 + fVar265 * 0.27778545 + fVar211 * 0.49039266 + fVar248 * fVar453;
      fVar304 = fVar279 * fVar469 + fVar266 * 0.27778545 + fVar212 * 0.49039266 + fVar249 * fVar454;
      fVar346 = fVar267 * fVar427 + fVar250 * fVar412 + fVar184 * fVar437 + fVar213 * -0.097545706;
      fVar378 = fVar277 * fVar434 + fVar264 * fVar424 + fVar210 * fVar452 + fVar247 * -0.097545706;
      fVar380 = fVar278 * fVar435 + fVar265 * fVar425 + fVar211 * fVar453 + fVar248 * -0.097545706;
      fVar382 = fVar279 * fVar436 + fVar266 * fVar426 + fVar212 * fVar454 + fVar249 * -0.097545706;
      fVar384 = fVar267 * fVar437 + fVar250 * fVar455 + fVar184 * 0.27778545 + fVar213 * fVar412;
      fVar395 = fVar277 * fVar452 + fVar264 * fVar467 + fVar210 * 0.27778545 + fVar247 * fVar424;
      fVar396 = fVar278 * fVar453 + fVar265 * fVar468 + fVar211 * 0.27778545 + fVar248 * fVar425;
      fVar397 = fVar279 * fVar454 + fVar266 * fVar469 + fVar212 * 0.27778545 + fVar249 * fVar426;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar213 = fVar267 * fVar412 + fVar250 * fVar437 + fVar184 * fVar455 + fVar213 * fVar427;
      fVar247 = fVar277 * fVar424 + fVar264 * fVar452 + fVar210 * fVar467 + fVar247 * fVar434;
      fVar248 = fVar278 * fVar425 + fVar265 * fVar453 + fVar211 * fVar468 + fVar248 * fVar435;
      fVar249 = fVar279 * fVar426 + fVar266 * fVar454 + fVar212 * fVar469 + fVar249 * fVar436;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar347 = (*pfVar109 + *pfVar2) * fVar115;
      fVar379 = (pfVar109[1] + pfVar2[1]) * fVar180;
      fVar381 = (pfVar109[2] + pfVar2[2]) * fVar181;
      fVar383 = (pfVar109[3] + pfVar2[3]) * fVar182;
      fVar267 = (*pfVar109 - *pfVar2) * fVar115;
      fVar277 = (pfVar109[1] - pfVar2[1]) * fVar180;
      fVar278 = (pfVar109[2] - pfVar2[2]) * fVar181;
      fVar279 = (pfVar109[3] - pfVar2[3]) * fVar182;
      fVar250 = fVar305 + fVar267;
      fVar264 = fVar328 + fVar277;
      fVar265 = fVar329 + fVar278;
      fVar266 = fVar330 + fVar279;
      fVar267 = fVar267 - fVar305;
      fVar277 = fVar277 - fVar328;
      fVar278 = fVar278 - fVar329;
      fVar279 = fVar279 - fVar330;
      fVar184 = fVar331 + fVar347;
      fVar210 = fVar342 + fVar379;
      fVar211 = fVar343 + fVar381;
      fVar212 = fVar344 + fVar383;
      fVar347 = fVar347 - fVar331;
      fVar379 = fVar379 - fVar342;
      fVar381 = fVar381 - fVar343;
      fVar383 = fVar383 - fVar344;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = fVar280 + fVar184;
      pfVar109[1] = fVar302 + fVar210;
      pfVar109[2] = fVar303 + fVar211;
      pfVar109[3] = fVar304 + fVar212;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar346 + fVar250;
      pfVar109[1] = fVar378 + fVar264;
      pfVar109[2] = fVar380 + fVar265;
      pfVar109[3] = fVar382 + fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar384 + fVar267;
      pfVar109[1] = fVar395 + fVar277;
      pfVar109[2] = fVar396 + fVar278;
      pfVar109[3] = fVar397 + fVar279;
      auVar226._0_4_ = fVar213 + fVar347;
      auVar226._4_4_ = fVar247 + fVar379;
      auVar226._8_4_ = fVar248 + fVar381;
      auVar226._12_4_ = fVar249 + fVar383;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar226;
      auVar353._0_4_ = fVar347 - fVar213;
      auVar353._4_4_ = fVar379 - fVar247;
      auVar353._8_4_ = fVar381 - fVar248;
      auVar353._12_4_ = fVar383 - fVar249;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar353;
      auVar314._0_4_ = fVar267 - fVar384;
      auVar314._4_4_ = fVar277 - fVar395;
      auVar314._8_4_ = fVar278 - fVar396;
      auVar314._12_4_ = fVar279 - fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar314;
      auVar286._0_4_ = fVar250 - fVar346;
      auVar286._4_4_ = fVar264 - fVar378;
      auVar286._8_4_ = fVar265 - fVar380;
      auVar286._12_4_ = fVar266 - fVar382;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar286;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      *pfVar109 = fVar184 - fVar280;
      pfVar109[1] = fVar210 - fVar302;
      pfVar109[2] = fVar211 - fVar303;
      pfVar109[3] = fVar212 - fVar304;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar149._0_12_ = ZEXT812(0x3c23d70a);
    auVar149._12_4_ = 0;
    auVar149._16_48_ = auVar183;
    compareBufferRelative(&local_140,&local_150,auVar149._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1x8",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  auVar151._0_8_ = std::ostream::flush();
  auVar151._8_56_ = extraout_var_11;
  iVar110 = 0;
  do {
    uVar112 = 0;
    do {
      if (uVar112 < 8) {
        auVar150._0_8_ = (double)Imath_3_2::erand48(local_126);
        auVar150._8_56_ = extraout_var_12;
        auVar151._4_60_ = auVar150._4_60_;
        auVar151._0_4_ = (float)auVar150._0_8_;
        *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar151._0_4_;
      }
      else {
        *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
        auVar151._0_16_ = ZEXT816(0);
      }
      auVar183 = auVar151._16_48_;
      local_140._buffer[uVar112] = auVar151._0_4_;
      uVar112 = uVar112 + 1;
    } while (uVar112 != 0x40);
    Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
    fVar427 = (*(float *)(undefined1 *)local_150._buffer +
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar434 = (*(float *)(undefined1 *)local_150._buffer -
              *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10)) * 0.35355362;
    fVar436 = *(float *)((undefined1 *)local_150._buffer + 8) * 0.19134216 -
              *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.46193984;
    fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) * 0.19134216 +
              *(float *)((undefined1 *)local_150._buffer + 8) * 0.46193984;
    fVar412 = *(float *)((undefined1 *)local_150._buffer + 0xc);
    fVar424 = *(float *)((undefined1 *)local_150._buffer + 4);
    fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
    fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
    fVar437 = fVar426 * 0.097545706 +
              fVar425 * 0.27778545 + fVar424 * 0.49039266 + fVar412 * 0.41573495;
    fVar452 = fVar426 * -0.27778545 +
              fVar425 * -0.49039266 + fVar424 * 0.41573495 + fVar412 * -0.097545706;
    fVar453 = fVar426 * 0.41573495 +
              fVar425 * 0.097545706 + fVar424 * 0.27778545 + fVar412 * -0.49039266;
    fVar425 = fVar426 * -0.49039266 +
              fVar425 * 0.41573495 + fVar424 * 0.097545706 + fVar412 * -0.27778545;
    fVar412 = fVar436 + fVar434;
    fVar424 = fVar435 + fVar427;
    fVar427 = fVar427 - fVar435;
    fVar434 = fVar434 - fVar436;
    *(float *)(undefined1 *)local_150._buffer = fVar437 + fVar424;
    *(float *)((undefined1 *)local_150._buffer + 4) = fVar452 + fVar412;
    *(float *)((undefined1 *)local_150._buffer + 8) = fVar453 + fVar434;
    *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar425 + fVar427;
    auVar227._4_4_ = fVar434 - fVar453;
    auVar227._0_4_ = fVar427 - fVar425;
    auVar227._8_4_ = fVar412 - fVar452;
    auVar227._12_4_ = fVar424 - fVar437;
    *(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar227;
    lVar111 = -8;
    fVar437 = (float)DAT_001c2680;
    fVar452 = DAT_001c2680._4_4_;
    fVar453 = DAT_001c2680._8_4_;
    fVar454 = DAT_001c2680._12_4_;
    fVar455 = (float)DAT_001c26b0;
    fVar467 = DAT_001c26b0._4_4_;
    fVar468 = DAT_001c26b0._8_4_;
    fVar469 = DAT_001c26b0._12_4_;
    fVar412 = (float)DAT_001c26d0;
    fVar424 = DAT_001c26d0._4_4_;
    fVar425 = DAT_001c26d0._8_4_;
    fVar426 = DAT_001c26d0._12_4_;
    fVar427 = (float)DAT_001c26e0;
    fVar434 = DAT_001c26e0._4_4_;
    fVar435 = DAT_001c26e0._8_4_;
    fVar436 = DAT_001c26e0._12_4_;
    fVar115 = (float)DAT_001c26f0;
    fVar180 = DAT_001c26f0._4_4_;
    fVar181 = DAT_001c26f0._8_4_;
    fVar182 = DAT_001c26f0._12_4_;
    do {
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      fVar184 = *pfVar109;
      fVar210 = pfVar109[1];
      fVar211 = pfVar109[2];
      fVar212 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4);
      fVar213 = *pfVar2;
      fVar247 = pfVar2[1];
      fVar248 = pfVar2[2];
      fVar249 = pfVar2[3];
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4);
      fVar305 = *pfVar109 * 0.19134216 - *pfVar2 * 0.46193984;
      fVar328 = pfVar109[1] * 0.19134216 - pfVar2[1] * 0.46193984;
      fVar329 = pfVar109[2] * 0.19134216 - pfVar2[2] * 0.46193984;
      fVar330 = pfVar109[3] * 0.19134216 - pfVar2[3] * 0.46193984;
      fVar331 = *pfVar2 * 0.19134216 + *pfVar109 * 0.46193984;
      fVar342 = pfVar2[1] * 0.19134216 + pfVar109[1] * 0.46193984;
      fVar343 = pfVar2[2] * 0.19134216 + pfVar109[2] * 0.46193984;
      fVar344 = pfVar2[3] * 0.19134216 + pfVar109[3] * 0.46193984;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4);
      fVar250 = *pfVar109;
      fVar264 = pfVar109[1];
      fVar265 = pfVar109[2];
      fVar266 = pfVar109[3];
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      fVar267 = *pfVar109;
      fVar277 = pfVar109[1];
      fVar278 = pfVar109[2];
      fVar279 = pfVar109[3];
      fVar280 = fVar267 * fVar455 + fVar250 * 0.27778545 + fVar184 * 0.49039266 + fVar213 * fVar437;
      fVar302 = fVar277 * fVar467 + fVar264 * 0.27778545 + fVar210 * 0.49039266 + fVar247 * fVar452;
      fVar303 = fVar278 * fVar468 + fVar265 * 0.27778545 + fVar211 * 0.49039266 + fVar248 * fVar453;
      fVar304 = fVar279 * fVar469 + fVar266 * 0.27778545 + fVar212 * 0.49039266 + fVar249 * fVar454;
      fVar346 = fVar267 * fVar427 + fVar250 * fVar412 + fVar184 * fVar437 + fVar213 * -0.097545706;
      fVar378 = fVar277 * fVar434 + fVar264 * fVar424 + fVar210 * fVar452 + fVar247 * -0.097545706;
      fVar380 = fVar278 * fVar435 + fVar265 * fVar425 + fVar211 * fVar453 + fVar248 * -0.097545706;
      fVar382 = fVar279 * fVar436 + fVar266 * fVar426 + fVar212 * fVar454 + fVar249 * -0.097545706;
      fVar384 = fVar267 * fVar437 + fVar250 * fVar455 + fVar184 * 0.27778545 + fVar213 * fVar412;
      fVar395 = fVar277 * fVar452 + fVar264 * fVar467 + fVar210 * 0.27778545 + fVar247 * fVar424;
      fVar396 = fVar278 * fVar453 + fVar265 * fVar468 + fVar211 * 0.27778545 + fVar248 * fVar425;
      fVar397 = fVar279 * fVar454 + fVar266 * fVar469 + fVar212 * 0.27778545 + fVar249 * fVar426;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      fVar213 = fVar267 * fVar412 + fVar250 * fVar437 + fVar184 * fVar455 + fVar213 * fVar427;
      fVar247 = fVar277 * fVar424 + fVar264 * fVar452 + fVar210 * fVar467 + fVar247 * fVar434;
      fVar248 = fVar278 * fVar425 + fVar265 * fVar453 + fVar211 * fVar468 + fVar248 * fVar435;
      fVar249 = fVar279 * fVar426 + fVar266 * fVar454 + fVar212 * fVar469 + fVar249 * fVar436;
      pfVar2 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4);
      fVar347 = (*pfVar109 + *pfVar2) * fVar115;
      fVar379 = (pfVar109[1] + pfVar2[1]) * fVar180;
      fVar381 = (pfVar109[2] + pfVar2[2]) * fVar181;
      fVar383 = (pfVar109[3] + pfVar2[3]) * fVar182;
      fVar267 = (*pfVar109 - *pfVar2) * fVar115;
      fVar277 = (pfVar109[1] - pfVar2[1]) * fVar180;
      fVar278 = (pfVar109[2] - pfVar2[2]) * fVar181;
      fVar279 = (pfVar109[3] - pfVar2[3]) * fVar182;
      fVar250 = fVar305 + fVar267;
      fVar264 = fVar328 + fVar277;
      fVar265 = fVar329 + fVar278;
      fVar266 = fVar330 + fVar279;
      fVar267 = fVar267 - fVar305;
      fVar277 = fVar277 - fVar328;
      fVar278 = fVar278 - fVar329;
      fVar279 = fVar279 - fVar330;
      fVar184 = fVar331 + fVar347;
      fVar210 = fVar342 + fVar379;
      fVar211 = fVar343 + fVar381;
      fVar212 = fVar344 + fVar383;
      fVar347 = fVar347 - fVar331;
      fVar379 = fVar379 - fVar342;
      fVar381 = fVar381 - fVar343;
      fVar383 = fVar383 - fVar344;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + lVar111 * 4);
      *pfVar109 = fVar280 + fVar184;
      pfVar109[1] = fVar302 + fVar210;
      pfVar109[2] = fVar303 + fVar211;
      pfVar109[3] = fVar304 + fVar212;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + lVar111 * 4);
      *pfVar109 = fVar346 + fVar250;
      pfVar109[1] = fVar378 + fVar264;
      pfVar109[2] = fVar380 + fVar265;
      pfVar109[3] = fVar382 + fVar266;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + lVar111 * 4);
      *pfVar109 = fVar384 + fVar267;
      pfVar109[1] = fVar395 + fVar277;
      pfVar109[2] = fVar396 + fVar278;
      pfVar109[3] = fVar397 + fVar279;
      auVar228._0_4_ = fVar213 + fVar347;
      auVar228._4_4_ = fVar247 + fVar379;
      auVar228._8_4_ = fVar248 + fVar381;
      auVar228._12_4_ = fVar249 + fVar383;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + lVar111 * 4) =
           auVar228;
      auVar354._0_4_ = fVar347 - fVar213;
      auVar354._4_4_ = fVar379 - fVar247;
      auVar354._8_4_ = fVar381 - fVar248;
      auVar354._12_4_ = fVar383 - fVar249;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + lVar111 * 4) =
           auVar354;
      auVar315._0_4_ = fVar267 - fVar384;
      auVar315._4_4_ = fVar277 - fVar395;
      auVar315._8_4_ = fVar278 - fVar396;
      auVar315._12_4_ = fVar279 - fVar397;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + lVar111 * 4) =
           auVar315;
      auVar287._0_4_ = fVar250 - fVar346;
      auVar287._4_4_ = fVar264 - fVar378;
      auVar287._8_4_ = fVar265 - fVar380;
      auVar287._12_4_ = fVar266 - fVar382;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + lVar111 * 4) =
           auVar287;
      pfVar109 = (float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x100) + lVar111 * 4);
      *pfVar109 = fVar184 - fVar280;
      pfVar109[1] = fVar210 - fVar302;
      pfVar109[2] = fVar211 - fVar303;
      pfVar109[3] = fVar212 - fVar304;
      lVar111 = lVar111 + 4;
    } while (lVar111 != 0);
    auVar151._0_12_ = ZEXT812(0x3c23d70a);
    auVar151._12_4_ = 0;
    auVar151._16_48_ = auVar183;
    compareBufferRelative(&local_140,&local_150,auVar151._0_4_,1e-06);
    iVar110 = iVar110 + 1;
  } while (iVar110 != 1000000);
  Imf_3_2::CpuId::CpuId(local_87);
  if (local_87[0] == (CpuId)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Inverse, SSE2: ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"8x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    iVar110 = 0;
    do {
      lVar111 = 0;
      do {
        dVar116 = (double)Imath_3_2::erand48(local_126);
        *(float *)((undefined1 *)local_150._buffer + lVar111 * 4) = (float)dVar116;
        local_140._buffer[lVar111] = (float)dVar116;
        lVar111 = lVar111 + 1;
      } while (lVar111 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar424 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar425 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar412 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      auVar229._0_4_ = fVar437 + fVar426;
      auVar229._4_4_ = fVar452 + fVar434;
      auVar229._8_4_ = fVar453 + fVar436;
      auVar229._12_4_ = fVar424 + fVar412;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xe0) = auVar229;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc) = fVar437 - fVar426;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar251._0_4_ = fVar437 + fVar184;
        auVar251._4_4_ = fVar452 + fVar210;
        auVar251._8_4_ = fVar453 + fVar211;
        auVar251._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar251;
        auVar288._0_4_ = fVar184 - fVar437;
        auVar288._4_4_ = fVar210 - fVar452;
        auVar288._8_4_ = fVar211 - fVar453;
        auVar288._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar288;
        auVar316._0_4_ = fVar213 - fVar250;
        auVar316._4_4_ = fVar247 - fVar264;
        auVar316._8_4_ = fVar248 - fVar265;
        auVar316._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar316;
        auVar355._0_4_ = fVar267 - fVar115;
        auVar355._4_4_ = fVar277 - fVar180;
        auVar355._8_4_ = fVar278 - fVar181;
        auVar355._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar355;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      compareBufferRelative(&local_140,&local_150,0.01,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"7x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar153._0_8_ = std::ostream::flush();
    auVar153._8_56_ = extraout_var_13;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x38) {
          auVar152._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar152._8_56_ = extraout_var_14;
          auVar153._4_60_ = auVar152._4_60_;
          auVar153._0_4_ = (float)auVar152._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar153._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar153._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar153._16_48_;
        local_140._buffer[uVar112] = auVar153._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar424 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar425 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar412 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      auVar230._0_4_ = fVar437 + fVar426;
      auVar230._4_4_ = fVar452 + fVar434;
      auVar230._8_4_ = fVar453 + fVar436;
      auVar230._12_4_ = fVar424 + fVar412;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = auVar230;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = fVar437 - fVar426;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar252._0_4_ = fVar437 + fVar184;
        auVar252._4_4_ = fVar452 + fVar210;
        auVar252._8_4_ = fVar453 + fVar211;
        auVar252._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar252;
        auVar289._0_4_ = fVar184 - fVar437;
        auVar289._4_4_ = fVar210 - fVar452;
        auVar289._8_4_ = fVar211 - fVar453;
        auVar289._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar289;
        auVar317._0_4_ = fVar213 - fVar250;
        auVar317._4_4_ = fVar247 - fVar264;
        auVar317._8_4_ = fVar248 - fVar265;
        auVar317._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar317;
        auVar356._0_4_ = fVar267 - fVar115;
        auVar356._4_4_ = fVar277 - fVar180;
        auVar356._8_4_ = fVar278 - fVar181;
        auVar356._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar356;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar153._0_12_ = ZEXT812(0x3c23d70a);
      auVar153._12_4_ = 0;
      auVar153._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar153._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"6x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar155._0_8_ = std::ostream::flush();
    auVar155._8_56_ = extraout_var_15;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x30) {
          auVar154._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar154._8_56_ = extraout_var_16;
          auVar155._4_60_ = auVar154._4_60_;
          auVar155._0_4_ = (float)auVar154._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar155._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar155._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar155._16_48_;
        local_140._buffer[uVar112] = auVar155._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar424 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar425 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar412 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      auVar231._0_4_ = fVar437 + fVar426;
      auVar231._4_4_ = fVar452 + fVar434;
      auVar231._8_4_ = fVar453 + fVar436;
      auVar231._12_4_ = fVar424 + fVar412;
      *(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = auVar231;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = fVar437 - fVar426;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar253._0_4_ = fVar437 + fVar184;
        auVar253._4_4_ = fVar452 + fVar210;
        auVar253._8_4_ = fVar453 + fVar211;
        auVar253._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar253;
        auVar290._0_4_ = fVar184 - fVar437;
        auVar290._4_4_ = fVar210 - fVar452;
        auVar290._8_4_ = fVar211 - fVar453;
        auVar290._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar290;
        auVar318._0_4_ = fVar213 - fVar250;
        auVar318._4_4_ = fVar247 - fVar264;
        auVar318._8_4_ = fVar248 - fVar265;
        auVar318._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar318;
        auVar357._0_4_ = fVar267 - fVar115;
        auVar357._4_4_ = fVar277 - fVar180;
        auVar357._8_4_ = fVar278 - fVar181;
        auVar357._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar357;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar155._0_12_ = ZEXT812(0x3c23d70a);
      auVar155._12_4_ = 0;
      auVar155._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar155._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"5x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar157._0_8_ = std::ostream::flush();
    auVar157._8_56_ = extraout_var_17;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x28) {
          auVar156._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar156._8_56_ = extraout_var_18;
          auVar157._4_60_ = auVar156._4_60_;
          auVar157._0_4_ = (float)auVar156._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar157._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar157._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar157._16_48_;
        local_140._buffer[uVar112] = auVar157._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar424 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar425 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar412 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      auVar232._0_4_ = fVar437 + fVar426;
      auVar232._4_4_ = fVar452 + fVar434;
      auVar232._8_4_ = fVar453 + fVar436;
      auVar232._12_4_ = fVar424 + fVar412;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x80) = auVar232;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = fVar437 - fVar426;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar254._0_4_ = fVar437 + fVar184;
        auVar254._4_4_ = fVar452 + fVar210;
        auVar254._8_4_ = fVar453 + fVar211;
        auVar254._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar254;
        auVar291._0_4_ = fVar184 - fVar437;
        auVar291._4_4_ = fVar210 - fVar452;
        auVar291._8_4_ = fVar211 - fVar453;
        auVar291._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar291;
        auVar319._0_4_ = fVar213 - fVar250;
        auVar319._4_4_ = fVar247 - fVar264;
        auVar319._8_4_ = fVar248 - fVar265;
        auVar319._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar319;
        auVar358._0_4_ = fVar267 - fVar115;
        auVar358._4_4_ = fVar277 - fVar180;
        auVar358._8_4_ = fVar278 - fVar181;
        auVar358._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar358;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar157._0_12_ = ZEXT812(0x3c23d70a);
      auVar157._12_4_ = 0;
      auVar157._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar157._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar159._0_8_ = std::ostream::flush();
    auVar159._8_56_ = extraout_var_19;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x20) {
          auVar158._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar158._8_56_ = extraout_var_20;
          auVar159._4_60_ = auVar158._4_60_;
          auVar159._0_4_ = (float)auVar158._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar159._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar159._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar159._16_48_;
        local_140._buffer[uVar112] = auVar159._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar424 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar425 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar412 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar437 + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar452 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar453 + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar424 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar437 - fVar426;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      auVar233._0_4_ = fVar437 + fVar426;
      auVar233._4_4_ = fVar452 + fVar434;
      auVar233._8_4_ = fVar453 + fVar436;
      auVar233._12_4_ = fVar424 + fVar412;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x60) = auVar233;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar437 - fVar426;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar255._0_4_ = fVar437 + fVar184;
        auVar255._4_4_ = fVar452 + fVar210;
        auVar255._8_4_ = fVar453 + fVar211;
        auVar255._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar255;
        auVar292._0_4_ = fVar184 - fVar437;
        auVar292._4_4_ = fVar210 - fVar452;
        auVar292._8_4_ = fVar211 - fVar453;
        auVar292._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar292;
        auVar320._0_4_ = fVar213 - fVar250;
        auVar320._4_4_ = fVar247 - fVar264;
        auVar320._8_4_ = fVar248 - fVar265;
        auVar320._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar320;
        auVar359._0_4_ = fVar267 - fVar115;
        auVar359._4_4_ = fVar277 - fVar180;
        auVar359._8_4_ = fVar278 - fVar181;
        auVar359._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar359;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar159._0_12_ = ZEXT812(0x3c23d70a);
      auVar159._12_4_ = 0;
      auVar159._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar159._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar161._0_8_ = std::ostream::flush();
    auVar161._8_56_ = extraout_var_21;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x18) {
          auVar160._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar160._8_56_ = extraout_var_22;
          auVar161._4_60_ = auVar160._4_60_;
          auVar161._0_4_ = (float)auVar160._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar161._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar161._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar161._16_48_;
        local_140._buffer[uVar112] = auVar161._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar424 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar425 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar427 + fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar412 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      fVar412 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4);
      fVar424 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8);
      fVar425 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc);
      fVar436 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) * 0.3535536 + 0.0;
      fVar437 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar452 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar453 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar424 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar426 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar434 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar436 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      auVar234._0_4_ = fVar437 + fVar426;
      auVar234._4_4_ = fVar452 + fVar434;
      auVar234._8_4_ = fVar453 + fVar436;
      auVar234._12_4_ = fVar424 + fVar412;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x40) = auVar234;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar424 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar453 - fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar452 - fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = fVar437 - fVar426;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar256._0_4_ = fVar437 + fVar184;
        auVar256._4_4_ = fVar452 + fVar210;
        auVar256._8_4_ = fVar453 + fVar211;
        auVar256._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar256;
        auVar293._0_4_ = fVar184 - fVar437;
        auVar293._4_4_ = fVar210 - fVar452;
        auVar293._8_4_ = fVar211 - fVar453;
        auVar293._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar293;
        auVar321._0_4_ = fVar213 - fVar250;
        auVar321._4_4_ = fVar247 - fVar264;
        auVar321._8_4_ = fVar248 - fVar265;
        auVar321._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar321;
        auVar360._0_4_ = fVar267 - fVar115;
        auVar360._4_4_ = fVar277 - fVar180;
        auVar360._8_4_ = fVar278 - fVar181;
        auVar360._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar360;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar161._0_12_ = ZEXT812(0x3c23d70a);
      auVar161._12_4_ = 0;
      auVar161._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar161._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar163._0_8_ = std::ostream::flush();
    auVar163._8_56_ = extraout_var_23;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x10) {
          auVar162._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar162._8_56_ = extraout_var_24;
          auVar163._4_60_ = auVar162._4_60_;
          auVar163._0_4_ = (float)auVar162._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar163._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar163._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar163._16_48_;
        local_140._buffer[uVar112] = auVar163._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar182 = (float)DAT_001c2790;
      fVar184 = DAT_001c2790._4_4_;
      fVar210 = DAT_001c2790._8_4_;
      fVar211 = DAT_001c2790._12_4_;
      fVar436 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar212 = (float)DAT_001c27a0;
      fVar213 = DAT_001c27a0._4_4_;
      fVar247 = DAT_001c27a0._8_4_;
      fVar248 = DAT_001c27a0._12_4_;
      fVar249 = (float)DAT_001c27b0;
      fVar250 = DAT_001c27b0._4_4_;
      fVar264 = DAT_001c27b0._8_4_;
      fVar265 = DAT_001c27b0._12_4_;
      fVar455 = fVar436 + fVar424 * fVar182 + fVar426 * fVar212 + fVar434 * fVar249;
      fVar467 = fVar436 + fVar424 * fVar184 + fVar426 * fVar213 + fVar434 * fVar250;
      fVar468 = fVar436 + fVar424 * fVar210 + fVar426 * fVar247 + fVar434 * fVar264;
      fVar469 = fVar436 + fVar424 * fVar211 + fVar426 * fVar248 + fVar434 * fVar265;
      fVar424 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      fVar426 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8);
      fVar436 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc);
      fVar266 = (float)DAT_001c27c0;
      fVar267 = DAT_001c27c0._4_4_;
      fVar277 = DAT_001c27c0._8_4_;
      fVar278 = DAT_001c27c0._12_4_;
      fVar279 = (float)DAT_001c27d0;
      fVar280 = DAT_001c27d0._4_4_;
      fVar302 = DAT_001c27d0._8_4_;
      fVar303 = DAT_001c27d0._12_4_;
      fVar304 = (float)DAT_001c27e0;
      fVar305 = DAT_001c27e0._4_4_;
      fVar328 = DAT_001c27e0._8_4_;
      fVar329 = DAT_001c27e0._12_4_;
      fVar437 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      fVar452 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4);
      fVar453 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8);
      fVar454 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc);
      fVar330 = (float)DAT_001c27f0;
      fVar331 = DAT_001c27f0._4_4_;
      fVar342 = DAT_001c27f0._8_4_;
      fVar343 = DAT_001c27f0._12_4_;
      fVar115 = fVar412 * fVar266 + 0.0 + fVar425 * fVar279 + fVar427 * fVar304 + fVar435 * fVar330;
      fVar180 = fVar412 * fVar267 + 0.0 + fVar425 * fVar280 + fVar427 * fVar305 + fVar435 * fVar331;
      fVar181 = fVar412 * fVar277 + 0.0 + fVar425 * fVar302 + fVar427 * fVar328 + fVar435 * fVar342;
      fVar412 = fVar412 * fVar278 + 0.0 + fVar425 * fVar303 + fVar427 * fVar329 + fVar435 * fVar343;
      *(float *)(undefined1 *)local_150._buffer = fVar455 + fVar115;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar467 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar468 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar469 + fVar412;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar469 - fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar468 - fVar181;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar467 - fVar180;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar455 - fVar115;
      fVar412 = fVar424 * 0.3535536 + 0.0;
      fVar424 = fVar412 + fVar434 * fVar182 + fVar437 * fVar212 + fVar453 * fVar249;
      fVar425 = fVar412 + fVar434 * fVar184 + fVar437 * fVar213 + fVar453 * fVar250;
      fVar427 = fVar412 + fVar434 * fVar210 + fVar437 * fVar247 + fVar453 * fVar264;
      fVar412 = fVar412 + fVar434 * fVar211 + fVar437 * fVar248 + fVar453 * fVar265;
      fVar434 = fVar426 * fVar266 + 0.0 + fVar436 * fVar279 + fVar452 * fVar304 + fVar454 * fVar330;
      fVar435 = fVar426 * fVar267 + 0.0 + fVar436 * fVar280 + fVar452 * fVar305 + fVar454 * fVar331;
      fVar437 = fVar426 * fVar277 + 0.0 + fVar436 * fVar302 + fVar452 * fVar328 + fVar454 * fVar342;
      fVar426 = fVar426 * fVar278 + 0.0 + fVar436 * fVar303 + fVar452 * fVar329 + fVar454 * fVar343;
      auVar235._0_4_ = fVar424 + fVar434;
      auVar235._4_4_ = fVar425 + fVar435;
      auVar235._8_4_ = fVar427 + fVar437;
      auVar235._12_4_ = fVar412 + fVar426;
      *(undefined1 (*) [16])((long)local_150._buffer + 0x20) = auVar235;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar412 - fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar425 - fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar424 - fVar434;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar257._0_4_ = fVar437 + fVar184;
        auVar257._4_4_ = fVar452 + fVar210;
        auVar257._8_4_ = fVar453 + fVar211;
        auVar257._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar257;
        auVar294._0_4_ = fVar184 - fVar437;
        auVar294._4_4_ = fVar210 - fVar452;
        auVar294._8_4_ = fVar211 - fVar453;
        auVar294._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar294;
        auVar322._0_4_ = fVar213 - fVar250;
        auVar322._4_4_ = fVar247 - fVar264;
        auVar322._8_4_ = fVar248 - fVar265;
        auVar322._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar322;
        auVar361._0_4_ = fVar267 - fVar115;
        auVar361._4_4_ = fVar277 - fVar180;
        auVar361._8_4_ = fVar278 - fVar181;
        auVar361._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar361;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar163._0_12_ = ZEXT812(0x3c23d70a);
      auVar163._12_4_ = 0;
      auVar163._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar163._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar165._0_8_ = std::ostream::flush();
    auVar165._8_56_ = extraout_var_25;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 8) {
          auVar164._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar164._8_56_ = extraout_var_26;
          auVar165._4_60_ = auVar164._4_60_;
          auVar165._0_4_ = (float)auVar164._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar165._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar165._0_16_ = ZEXT816(0);
        }
        auVar183 = auVar165._16_48_;
        local_140._buffer[uVar112] = auVar165._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      fVar412 = *(float *)((undefined1 *)local_150._buffer + 4);
      fVar424 = *(float *)((undefined1 *)local_150._buffer + 8);
      fVar425 = *(float *)((undefined1 *)local_150._buffer + 0xc);
      fVar426 = *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      fVar427 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4);
      fVar434 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8);
      fVar435 = *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc);
      fVar436 = fVar435 * 0.09754573 +
                fVar427 * 0.2777855 + fVar425 * 0.4157349 + fVar412 * 0.4903927 + 0.0;
      fVar437 = fVar435 * -0.2777855 +
                fVar427 * -0.4903927 + fVar425 * -0.09754573 + fVar412 * 0.4157349 + 0.0;
      fVar452 = fVar435 * 0.4157349 +
                fVar427 * 0.09754573 + fVar425 * -0.4903927 + fVar412 * 0.2777855 + 0.0;
      fVar453 = fVar435 * -0.4903927 +
                fVar427 * 0.4157349 + fVar425 * -0.2777855 + fVar412 * 0.09754573 + 0.0;
      fVar412 = *(float *)(undefined1 *)local_150._buffer * 0.3535536 + 0.0;
      fVar425 = fVar412 + fVar424 * 0.4619398 + fVar426 * 0.3535536 + fVar434 * 0.1913422;
      fVar427 = fVar412 + fVar424 * 0.1913422 + fVar426 * -0.3535536 + fVar434 * -0.4619398;
      fVar435 = fVar412 + fVar424 * -0.1913422 + fVar426 * -0.3535536 + fVar434 * 0.4619398;
      fVar412 = fVar412 + fVar424 * -0.4619398 + fVar426 * 0.3535536 + fVar434 * -0.1913422;
      auVar236._0_4_ = fVar425 + fVar436;
      auVar236._4_4_ = fVar427 + fVar437;
      auVar236._8_4_ = fVar435 + fVar452;
      auVar236._12_4_ = fVar412 + fVar453;
      *(undefined1 (*) [16])local_150._buffer = auVar236;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar412 - fVar453;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar435 - fVar452;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar427 - fVar437;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = fVar425 - fVar436;
      pauVar106 = (undefined1 (*) [16])local_150._buffer;
      lVar111 = 0;
      do {
        lVar107 = 0;
        do {
          uVar90 = *(undefined8 *)((long)(*pauVar106 + lVar107 * 2) + 8);
          *(undefined8 *)((long)&local_120 + lVar107) = *(undefined8 *)(*pauVar106 + lVar107 * 2);
          *(undefined8 *)((long)&fStack_118 + lVar107) = uVar90;
          lVar107 = lVar107 + 0x10;
        } while (lVar107 != 0x80);
        fVar427 = local_100 * 0.1913422 - local_c0 * 0.4619398;
        fVar434 = fStack_fc * 0.1913422 - fStack_bc * 0.4619398;
        fVar435 = fStack_f8 * 0.1913422 - fStack_b8 * 0.4619398;
        fVar436 = fStack_f4 * 0.1913422 - fStack_b4 * 0.4619398;
        fVar455 = local_c0 * 0.1913422 + local_100 * 0.4619398;
        fVar467 = fStack_bc * 0.1913422 + fStack_fc * 0.4619398;
        fVar468 = fStack_b8 * 0.1913422 + fStack_f8 * 0.4619398;
        fVar469 = fStack_b4 * 0.1913422 + fStack_f4 * 0.4619398;
        fVar437 = (float)DAT_001c2820;
        fVar452 = DAT_001c2820._4_4_;
        fVar453 = DAT_001c2820._8_4_;
        fVar454 = DAT_001c2820._12_4_;
        fVar184 = (float)DAT_001c2830;
        fVar210 = DAT_001c2830._4_4_;
        fVar211 = DAT_001c2830._8_4_;
        fVar212 = DAT_001c2830._12_4_;
        fVar213 = (float)DAT_001c2840;
        fVar247 = DAT_001c2840._4_4_;
        fVar248 = DAT_001c2840._8_4_;
        fVar249 = DAT_001c2840._12_4_;
        fVar267 = (float)DAT_001c2850;
        fVar277 = DAT_001c2850._4_4_;
        fVar278 = DAT_001c2850._8_4_;
        fVar279 = DAT_001c2850._12_4_;
        fVar412 = local_b0 * fVar267 + local_d0 * fVar213 + local_f0 * fVar184 + local_110 * fVar437
        ;
        fVar424 = fStack_ac * fVar277 + fStack_cc * fVar247 +
                  fStack_ec * fVar210 + fStack_10c * fVar452;
        fVar425 = fStack_a8 * fVar278 + fStack_c8 * fVar248 +
                  fStack_e8 * fVar211 + fStack_108 * fVar453;
        fVar426 = fStack_a4 * fVar279 + fStack_c4 * fVar249 +
                  fStack_e4 * fVar212 + fStack_104 * fVar454;
        fVar115 = (local_110 * fVar184 - local_f0 * fVar267) -
                  (local_b0 * fVar213 + local_d0 * fVar437);
        fVar180 = (fStack_10c * fVar210 - fStack_ec * fVar277) -
                  (fStack_ac * fVar247 + fStack_cc * fVar452);
        fVar181 = (fStack_108 * fVar211 - fStack_e8 * fVar278) -
                  (fStack_a8 * fVar248 + fStack_c8 * fVar453);
        fVar182 = (fStack_104 * fVar212 - fStack_e4 * fVar279) -
                  (fStack_a4 * fVar249 + fStack_c4 * fVar454);
        fVar250 = local_b0 * fVar184 + local_d0 * fVar267 +
                  (local_110 * fVar213 - local_f0 * fVar437);
        fVar264 = fStack_ac * fVar210 + fStack_cc * fVar277 +
                  (fStack_10c * fVar247 - fStack_ec * fVar452);
        fVar265 = fStack_a8 * fVar211 + fStack_c8 * fVar278 +
                  (fStack_108 * fVar248 - fStack_e8 * fVar453);
        fVar266 = fStack_a4 * fVar212 + fStack_c4 * fVar279 +
                  (fStack_104 * fVar249 - fStack_e4 * fVar454);
        fVar437 = (local_d0 * fVar184 - local_b0 * fVar437) +
                  (local_110 * fVar267 - local_f0 * fVar213);
        fVar452 = (fStack_cc * fVar210 - fStack_ac * fVar452) +
                  (fStack_10c * fVar277 - fStack_ec * fVar247);
        fVar453 = (fStack_c8 * fVar211 - fStack_a8 * fVar453) +
                  (fStack_108 * fVar278 - fStack_e8 * fVar248);
        fVar454 = (fStack_c4 * fVar212 - fStack_a4 * fVar454) +
                  (fStack_104 * fVar279 - fStack_e4 * fVar249);
        fVar184 = (local_120 + local_e0) * (float)DAT_001c2860;
        fVar210 = (fStack_11c + fStack_dc) * DAT_001c2860._4_4_;
        fVar211 = (fStack_118 + fStack_d8) * DAT_001c2860._8_4_;
        fVar212 = (fStack_114 + fStack_d4) * DAT_001c2860._12_4_;
        fVar213 = (local_120 - local_e0) * (float)DAT_001c2860;
        fVar247 = (fStack_11c - fStack_dc) * DAT_001c2860._4_4_;
        fVar248 = (fStack_118 - fStack_d8) * DAT_001c2860._8_4_;
        fVar249 = (fStack_114 - fStack_d4) * DAT_001c2860._12_4_;
        fVar267 = fVar427 + fVar213;
        fVar277 = fVar434 + fVar247;
        fVar278 = fVar435 + fVar248;
        fVar279 = fVar436 + fVar249;
        fVar213 = fVar213 - fVar427;
        fVar247 = fVar247 - fVar434;
        fVar248 = fVar248 - fVar435;
        fVar249 = fVar249 - fVar436;
        fVar427 = fVar455 + fVar184;
        fVar434 = fVar467 + fVar210;
        fVar435 = fVar468 + fVar211;
        fVar436 = fVar469 + fVar212;
        fVar184 = fVar184 - fVar455;
        fVar210 = fVar210 - fVar467;
        fVar211 = fVar211 - fVar468;
        fVar212 = fVar212 - fVar469;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + lVar111 * 0x10);
        *(float *)*pauVar1 = fVar412 + fVar427;
        *(float *)(*pauVar1 + 4) = fVar424 + fVar434;
        *(float *)(*pauVar1 + 8) = fVar425 + fVar435;
        *(float *)(*pauVar1 + 0xc) = fVar426 + fVar436;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 2) * 0x10);
        *(float *)*pauVar1 = fVar115 + fVar267;
        *(float *)(*pauVar1 + 4) = fVar180 + fVar277;
        *(float *)(*pauVar1 + 8) = fVar181 + fVar278;
        *(float *)(*pauVar1 + 0xc) = fVar182 + fVar279;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 4) * 0x10);
        *(float *)*pauVar1 = fVar250 + fVar213;
        *(float *)(*pauVar1 + 4) = fVar264 + fVar247;
        *(float *)(*pauVar1 + 8) = fVar265 + fVar248;
        *(float *)(*pauVar1 + 0xc) = fVar266 + fVar249;
        auVar258._0_4_ = fVar437 + fVar184;
        auVar258._4_4_ = fVar452 + fVar210;
        auVar258._8_4_ = fVar453 + fVar211;
        auVar258._12_4_ = fVar454 + fVar212;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 6) * 0x10) = auVar258;
        auVar295._0_4_ = fVar184 - fVar437;
        auVar295._4_4_ = fVar210 - fVar452;
        auVar295._8_4_ = fVar211 - fVar453;
        auVar295._12_4_ = fVar212 - fVar454;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 8) * 0x10) = auVar295;
        auVar323._0_4_ = fVar213 - fVar250;
        auVar323._4_4_ = fVar247 - fVar264;
        auVar323._8_4_ = fVar248 - fVar265;
        auVar323._12_4_ = fVar249 - fVar266;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 10) * 0x10) = auVar323;
        auVar362._0_4_ = fVar267 - fVar115;
        auVar362._4_4_ = fVar277 - fVar180;
        auVar362._8_4_ = fVar278 - fVar181;
        auVar362._12_4_ = fVar279 - fVar182;
        *(undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xc) * 0x10) = auVar362;
        pauVar1 = (undefined1 (*) [16])((long)local_150._buffer + (lVar111 + 0xe) * 0x10);
        *(float *)*pauVar1 = fVar427 - fVar412;
        *(float *)(*pauVar1 + 4) = fVar434 - fVar424;
        *(float *)(*pauVar1 + 8) = fVar435 - fVar425;
        *(float *)(*pauVar1 + 0xc) = fVar436 - fVar426;
        pauVar106 = pauVar106 + 1;
        bVar113 = lVar111 == 0;
        lVar111 = lVar111 + 1;
      } while (bVar113);
      auVar165._0_12_ = ZEXT812(0x3c23d70a);
      auVar165._12_4_ = 0;
      auVar165._16_48_ = auVar183;
      compareBufferRelative(&local_140,&local_150,auVar165._0_4_,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
  }
  if (local_82 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"      Inverse, AVX: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"8x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    iVar110 = 0;
    do {
      lVar111 = 0;
      do {
        dVar116 = (double)Imath_3_2::erand48(local_126);
        *(float *)((undefined1 *)local_150._buffer + lVar111 * 4) = (float)dVar116;
        local_140._buffer[lVar111] = (float)dVar116;
        lVar111 = lVar111 + 1;
      } while (lVar111 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar438._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar438._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar456._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar456._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar438,auVar456);
      auVar9 = vunpckhpd_avx(auVar438,auVar456);
      auVar193 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar260 = vunpcklpd_avx(auVar193,auVar9);
      auVar9 = vunpckhpd_avx(auVar193,auVar9);
      auVar413._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar413._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar428._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar428._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar193 = vunpcklpd_avx(auVar413,auVar428);
      auVar10 = vunpckhpd_avx(auVar413,auVar428);
      auVar363 = vunpcklps_avx(auVar193,auVar10);
      auVar10 = vunpckhps_avx(auVar193,auVar10);
      auVar11 = vunpcklpd_avx(auVar363,auVar10);
      auVar10 = vunpckhpd_avx(auVar363,auVar10);
      auVar399._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar399._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar404._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar404._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar363 = vunpcklpd_avx(auVar399,auVar404);
      auVar193 = vunpckhpd_avx(auVar399,auVar404);
      auVar192 = vunpcklps_avx(auVar363,auVar193);
      auVar193 = vunpckhps_avx(auVar363,auVar193);
      auVar12 = vunpcklpd_avx(auVar192,auVar193);
      auVar193 = vunpckhpd_avx(auVar192,auVar193);
      auVar363._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xe0);
      auVar363._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xc0);
      auVar387._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      auVar387._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      auVar192 = vunpcklpd_avx(auVar363,auVar387);
      auVar363 = vunpckhpd_avx(auVar363,auVar387);
      auVar13 = vunpcklps_avx(auVar192,auVar363);
      auVar363 = vunpckhps_avx(auVar192,auVar363);
      auVar192 = vunpcklpd_avx(auVar13,auVar363);
      auVar363 = vunpckhpd_avx(auVar13,auVar363);
      auVar13 = vpermilps_avx(auVar260,0);
      auVar14 = vpermilps_avx(auVar260,0x55);
      auVar15 = vpermilps_avx(auVar260,0xaa);
      auVar260 = vpermilps_avx(auVar260,0xff);
      auVar122._0_4_ =
           local_120 * auVar13._0_4_ + local_110 * auVar14._0_4_ +
           local_100 * auVar15._0_4_ + local_f0 * auVar260._0_4_;
      auVar122._4_4_ =
           fStack_11c * auVar13._4_4_ + fStack_10c * auVar14._4_4_ +
           fStack_fc * auVar15._4_4_ + fStack_ec * auVar260._4_4_;
      auVar122._8_4_ =
           fStack_118 * auVar13._8_4_ + fStack_108 * auVar14._8_4_ +
           fStack_f8 * auVar15._8_4_ + fStack_e8 * auVar260._8_4_;
      auVar122._12_4_ =
           fStack_114 * auVar13._12_4_ + fStack_104 * auVar14._12_4_ +
           fStack_f4 * auVar15._12_4_ + fStack_e4 * auVar260._12_4_;
      auVar122._16_4_ =
           local_120 * auVar13._16_4_ + local_110 * auVar14._16_4_ +
           local_100 * auVar15._16_4_ + local_f0 * auVar260._16_4_;
      auVar122._20_4_ =
           fStack_11c * auVar13._20_4_ + fStack_10c * auVar14._20_4_ +
           fStack_fc * auVar15._20_4_ + fStack_ec * auVar260._20_4_;
      auVar122._24_4_ =
           fStack_118 * auVar13._24_4_ + fStack_108 * auVar14._24_4_ +
           fStack_f8 * auVar15._24_4_ + fStack_e8 * auVar260._24_4_;
      auVar122._28_4_ = auVar13._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar260._28_4_;
      auVar260 = vpermilps_avx(auVar11,0);
      auVar13 = vpermilps_avx(auVar11,0x55);
      auVar14 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar191._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar13._0_4_ +
           local_100 * auVar14._0_4_ + local_f0 * auVar11._0_4_;
      auVar191._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar13._4_4_ +
           fStack_fc * auVar14._4_4_ + fStack_ec * auVar11._4_4_;
      auVar191._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar13._8_4_ +
           fStack_f8 * auVar14._8_4_ + fStack_e8 * auVar11._8_4_;
      auVar191._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar13._12_4_ +
           fStack_f4 * auVar14._12_4_ + fStack_e4 * auVar11._12_4_;
      auVar191._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar13._16_4_ +
           local_100 * auVar14._16_4_ + local_f0 * auVar11._16_4_;
      auVar191._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar13._20_4_ +
           fStack_fc * auVar14._20_4_ + fStack_ec * auVar11._20_4_;
      auVar191._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar13._24_4_ +
           fStack_f8 * auVar14._24_4_ + fStack_e8 * auVar11._24_4_;
      auVar191._28_4_ = auVar260._28_4_ + auVar13._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar260 = vpermilps_avx(auVar12,0);
      auVar11 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar237._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar11._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar12._0_4_;
      auVar237._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar11._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar12._4_4_;
      auVar237._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar11._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar12._8_4_;
      auVar237._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar11._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar12._12_4_;
      auVar237._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar11._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar12._16_4_;
      auVar237._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar11._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar12._20_4_;
      auVar237._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar11._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar12._24_4_;
      auVar237._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar260 = vpermilps_avx(auVar192,0);
      auVar11 = vpermilps_avx(auVar192,0x55);
      auVar12 = vpermilps_avx(auVar192,0xaa);
      auVar192 = vpermilps_avx(auVar192,0xff);
      auVar259._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar11._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar192._0_4_;
      auVar259._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar11._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar192._4_4_;
      auVar259._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar11._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar192._8_4_;
      auVar259._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar11._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar192._12_4_;
      auVar259._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar11._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar192._16_4_;
      auVar259._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar11._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar192._20_4_;
      auVar259._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar11._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar192._24_4_;
      auVar259._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar192._28_4_;
      auVar98._4_4_ = fStack_dc;
      auVar98._0_4_ = local_e0;
      auVar98._8_4_ = fStack_d8;
      auVar98._12_4_ = fStack_d4;
      auVar364._16_16_ = auVar98;
      auVar364._0_16_ = auVar98;
      auVar260 = vpermilps_avx(auVar9,0);
      auVar11 = vpermilps_avx(auVar9,0x55);
      auVar12 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar269._0_4_ =
           local_e0 * auVar260._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar9._0_4_;
      auVar269._4_4_ =
           fStack_dc * auVar260._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar9._4_4_;
      auVar269._8_4_ =
           fStack_d8 * auVar260._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar269._12_4_ =
           fStack_d4 * auVar260._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar269._16_4_ =
           local_e0 * auVar260._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar9._16_4_;
      auVar269._20_4_ =
           fStack_dc * auVar260._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar9._20_4_;
      auVar269._24_4_ =
           fStack_d8 * auVar260._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar269._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar260 = vpermilps_avx(auVar10,0x55);
      auVar11 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar296._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar260._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar10._0_4_;
      auVar296._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar260._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar10._4_4_;
      auVar296._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar260._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar296._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar260._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar296._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar260._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar10._16_4_;
      auVar296._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar260._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar10._20_4_;
      auVar296._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar260._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar296._28_4_ = auVar9._28_4_ + auVar260._28_4_ + auVar11._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar193,0);
      auVar10 = vpermilps_avx(auVar193,0x55);
      auVar260 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0xff);
      auVar324._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar10._0_4_ +
           local_c0 * auVar260._0_4_ + local_b0 * auVar193._0_4_;
      auVar324._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar10._4_4_ +
           fStack_bc * auVar260._4_4_ + fStack_ac * auVar193._4_4_;
      auVar324._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar10._8_4_ +
           fStack_b8 * auVar260._8_4_ + fStack_a8 * auVar193._8_4_;
      auVar324._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar10._12_4_ +
           fStack_b4 * auVar260._12_4_ + fStack_a4 * auVar193._12_4_;
      auVar324._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar10._16_4_ +
           local_c0 * auVar260._16_4_ + local_b0 * auVar193._16_4_;
      auVar324._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar10._20_4_ +
           fStack_bc * auVar260._20_4_ + fStack_ac * auVar193._20_4_;
      auVar324._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar10._24_4_ +
           fStack_b8 * auVar260._24_4_ + fStack_a8 * auVar193._24_4_;
      auVar324._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar260._28_4_ + auVar193._28_4_;
      auVar9 = vpermilps_avx(auVar363,0);
      auVar10 = vpermilps_avx(auVar363,0x55);
      auVar193 = vpermilps_avx(auVar363,0xaa);
      auVar363 = vpermilps_avx(auVar363,0xff);
      auVar334._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar10._0_4_ +
           local_c0 * auVar193._0_4_ + local_b0 * auVar363._0_4_;
      auVar334._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar10._4_4_ +
           fStack_bc * auVar193._4_4_ + fStack_ac * auVar363._4_4_;
      auVar334._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar10._8_4_ +
           fStack_b8 * auVar193._8_4_ + fStack_a8 * auVar363._8_4_;
      auVar334._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar10._12_4_ +
           fStack_b4 * auVar193._12_4_ + fStack_a4 * auVar363._12_4_;
      auVar334._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar10._16_4_ +
           local_c0 * auVar193._16_4_ + local_b0 * auVar363._16_4_;
      auVar334._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar10._20_4_ +
           fStack_bc * auVar193._20_4_ + fStack_ac * auVar363._20_4_;
      auVar334._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar10._24_4_ +
           fStack_b8 * auVar193._24_4_ + fStack_a8 * auVar363._24_4_;
      auVar334._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar193._28_4_ + auVar363._28_4_;
      auVar9 = vsubps_avx(auVar122,auVar269);
      auVar123._0_4_ = auVar122._0_4_ + auVar269._0_4_;
      auVar123._4_4_ = auVar122._4_4_ + auVar269._4_4_;
      auVar123._8_4_ = auVar122._8_4_ + auVar269._8_4_;
      auVar123._12_4_ = auVar122._12_4_ + auVar269._12_4_;
      auVar123._16_4_ = auVar122._16_4_ + auVar269._16_4_;
      auVar123._20_4_ = auVar122._20_4_ + auVar269._20_4_;
      auVar123._24_4_ = auVar122._24_4_ + auVar269._24_4_;
      auVar123._28_4_ = auVar122._28_4_ + auVar269._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar191,auVar296);
      auVar192._0_4_ = auVar191._0_4_ + auVar296._0_4_;
      auVar192._4_4_ = auVar191._4_4_ + auVar296._4_4_;
      auVar192._8_4_ = auVar191._8_4_ + auVar296._8_4_;
      auVar192._12_4_ = auVar191._12_4_ + auVar296._12_4_;
      auVar192._16_4_ = auVar191._16_4_ + auVar296._16_4_;
      auVar192._20_4_ = auVar191._20_4_ + auVar296._20_4_;
      auVar192._24_4_ = auVar191._24_4_ + auVar296._24_4_;
      auVar192._28_4_ = auVar191._28_4_ + auVar296._28_4_;
      auVar14 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar237,auVar324);
      auVar238._0_4_ = auVar237._0_4_ + auVar324._0_4_;
      auVar238._4_4_ = auVar237._4_4_ + auVar324._4_4_;
      auVar238._8_4_ = auVar237._8_4_ + auVar324._8_4_;
      auVar238._12_4_ = auVar237._12_4_ + auVar324._12_4_;
      auVar238._16_4_ = auVar237._16_4_ + auVar324._16_4_;
      auVar238._20_4_ = auVar237._20_4_ + auVar324._20_4_;
      auVar238._24_4_ = auVar237._24_4_ + auVar324._24_4_;
      auVar238._28_4_ = auVar237._28_4_ + auVar324._28_4_;
      auVar15 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar259,auVar334);
      auVar260._0_4_ = auVar259._0_4_ + auVar334._0_4_;
      auVar260._4_4_ = auVar259._4_4_ + auVar334._4_4_;
      auVar260._8_4_ = auVar259._8_4_ + auVar334._8_4_;
      auVar260._12_4_ = auVar259._12_4_ + auVar334._12_4_;
      auVar260._16_4_ = auVar259._16_4_ + auVar334._16_4_;
      auVar260._20_4_ = auVar259._20_4_ + auVar334._20_4_;
      auVar260._24_4_ = auVar259._24_4_ + auVar334._24_4_;
      auVar260._28_4_ = auVar259._28_4_ + auVar334._28_4_;
      auVar16 = vpermilps_avx(auVar9,0x1b);
      auVar363 = vperm2f128_avx(auVar16,auVar260,0x13);
      auVar260 = vperm2f128_avx(auVar16,auVar260,2);
      auVar193 = vperm2f128_avx(auVar15,auVar238,0x13);
      auVar11 = vperm2f128_avx(auVar15,auVar238,2);
      auVar12 = vperm2f128_avx(auVar14,auVar192,0x13);
      auVar192 = vperm2f128_avx(auVar14,auVar192,2);
      auVar9 = vperm2f128_avx(auVar10,auVar123,0x13);
      auVar13 = vperm2f128_avx(auVar10,auVar123,2);
      auVar122 = vpermilps_avx(auVar364,0xff);
      auVar123 = vpermilps_avx(auVar364,0xaa);
      auVar191 = vpermilps_avx(auVar364,0x55);
      auVar237 = vpermilps_avx(auVar364,0);
      fVar412 = auVar9._0_4_;
      fVar264 = auVar237._0_4_;
      fVar427 = auVar9._4_4_;
      fVar265 = auVar237._4_4_;
      fVar437 = auVar9._8_4_;
      fVar266 = auVar237._8_4_;
      fVar455 = auVar9._12_4_;
      fVar267 = auVar237._12_4_;
      fVar115 = auVar9._16_4_;
      fVar277 = auVar237._16_4_;
      fVar184 = auVar9._20_4_;
      fVar278 = auVar237._20_4_;
      fVar213 = auVar9._24_4_;
      fVar279 = auVar237._24_4_;
      fVar424 = auVar12._0_4_;
      fVar280 = auVar191._0_4_;
      fVar434 = auVar12._4_4_;
      fVar302 = auVar191._4_4_;
      fVar452 = auVar12._8_4_;
      fVar303 = auVar191._8_4_;
      fVar467 = auVar12._12_4_;
      fVar304 = auVar191._12_4_;
      fVar180 = auVar12._16_4_;
      fVar305 = auVar191._16_4_;
      fVar210 = auVar12._20_4_;
      fVar328 = auVar191._20_4_;
      fVar247 = auVar12._24_4_;
      fVar329 = auVar191._24_4_;
      fVar425 = auVar193._0_4_;
      fVar330 = auVar123._0_4_;
      fVar435 = auVar193._4_4_;
      fVar331 = auVar123._4_4_;
      fVar453 = auVar193._8_4_;
      fVar342 = auVar123._8_4_;
      fVar468 = auVar193._12_4_;
      fVar343 = auVar123._12_4_;
      fVar181 = auVar193._16_4_;
      fVar344 = auVar123._16_4_;
      fVar211 = auVar193._20_4_;
      fVar346 = auVar123._20_4_;
      fVar248 = auVar193._24_4_;
      fVar378 = auVar123._24_4_;
      fVar426 = auVar363._0_4_;
      fVar380 = auVar122._0_4_;
      fVar436 = auVar363._4_4_;
      fVar382 = auVar122._4_4_;
      fVar454 = auVar363._8_4_;
      fVar384 = auVar122._8_4_;
      fVar469 = auVar363._12_4_;
      fVar395 = auVar122._12_4_;
      fVar182 = auVar363._16_4_;
      fVar396 = auVar122._16_4_;
      fVar212 = auVar363._20_4_;
      fVar397 = auVar122._20_4_;
      fVar249 = auVar363._24_4_;
      fVar347 = auVar122._24_4_;
      fVar250 = auVar16._28_4_;
      fVar379 = fVar250 + auVar15._28_4_;
      auVar414._0_4_ = fVar380 * fVar426 + fVar330 * fVar425 + fVar280 * fVar424 + fVar264 * fVar412
      ;
      auVar414._4_4_ = fVar382 * fVar436 + fVar331 * fVar435 + fVar302 * fVar434 + fVar265 * fVar427
      ;
      auVar414._8_4_ = fVar384 * fVar454 + fVar342 * fVar453 + fVar303 * fVar452 + fVar266 * fVar437
      ;
      auVar414._12_4_ =
           fVar395 * fVar469 + fVar343 * fVar468 + fVar304 * fVar467 + fVar267 * fVar455;
      auVar414._16_4_ =
           fVar396 * fVar182 + fVar344 * fVar181 + fVar305 * fVar180 + fVar277 * fVar115;
      auVar414._20_4_ =
           fVar397 * fVar212 + fVar346 * fVar211 + fVar328 * fVar210 + fVar278 * fVar184;
      auVar414._24_4_ =
           fVar347 * fVar249 + fVar378 * fVar248 + fVar329 * fVar247 + fVar279 * fVar213;
      auVar414._28_4_ = fVar379 + auVar14._28_4_ + auVar10._28_4_;
      auVar9._4_4_ = fVar302 * fVar427;
      auVar9._0_4_ = fVar280 * fVar412;
      auVar9._8_4_ = fVar303 * fVar437;
      auVar9._12_4_ = fVar304 * fVar455;
      auVar9._16_4_ = fVar305 * fVar115;
      auVar9._20_4_ = fVar328 * fVar184;
      auVar9._24_4_ = fVar329 * fVar213;
      auVar9._28_4_ = auVar14._28_4_;
      auVar439._0_4_ = fVar264 * fVar425 + fVar380 * fVar424;
      auVar439._4_4_ = fVar265 * fVar435 + fVar382 * fVar434;
      auVar439._8_4_ = fVar266 * fVar453 + fVar384 * fVar452;
      auVar439._12_4_ = fVar267 * fVar468 + fVar395 * fVar467;
      auVar439._16_4_ = fVar277 * fVar181 + fVar396 * fVar180;
      auVar439._20_4_ = fVar278 * fVar211 + fVar397 * fVar210;
      auVar439._24_4_ = fVar279 * fVar248 + fVar347 * fVar247;
      auVar439._28_4_ = fVar250 + fVar379;
      auVar9 = vsubps_avx(auVar9,auVar439);
      auVar10._4_4_ = fVar331 * fVar436;
      auVar10._0_4_ = fVar330 * fVar426;
      auVar10._8_4_ = fVar342 * fVar454;
      auVar10._12_4_ = fVar343 * fVar469;
      auVar10._16_4_ = fVar344 * fVar182;
      auVar10._20_4_ = fVar346 * fVar212;
      auVar10._24_4_ = fVar378 * fVar249;
      auVar10._28_4_ = fVar250;
      auVar9 = vsubps_avx(auVar9,auVar10);
      auVar14._4_4_ = fVar331 * fVar427;
      auVar14._0_4_ = fVar330 * fVar412;
      auVar14._8_4_ = fVar342 * fVar437;
      auVar14._12_4_ = fVar343 * fVar455;
      auVar14._16_4_ = fVar344 * fVar115;
      auVar14._20_4_ = fVar346 * fVar184;
      auVar14._24_4_ = fVar378 * fVar213;
      auVar14._28_4_ = auVar439._28_4_;
      auVar15._4_4_ = fVar265 * fVar434;
      auVar15._0_4_ = fVar264 * fVar424;
      auVar15._8_4_ = fVar266 * fVar452;
      auVar15._12_4_ = fVar267 * fVar467;
      auVar15._16_4_ = fVar277 * fVar180;
      auVar15._20_4_ = fVar278 * fVar210;
      auVar15._24_4_ = fVar279 * fVar247;
      auVar15._28_4_ = fVar250;
      auVar10 = vsubps_avx(auVar14,auVar15);
      auVar440._0_4_ = auVar10._0_4_ + fVar380 * fVar425 + fVar280 * fVar426;
      auVar440._4_4_ = auVar10._4_4_ + fVar382 * fVar435 + fVar302 * fVar436;
      auVar440._8_4_ = auVar10._8_4_ + fVar384 * fVar453 + fVar303 * fVar454;
      auVar440._12_4_ = auVar10._12_4_ + fVar395 * fVar468 + fVar304 * fVar469;
      auVar440._16_4_ = auVar10._16_4_ + fVar396 * fVar181 + fVar305 * fVar182;
      auVar440._20_4_ = auVar10._20_4_ + fVar397 * fVar211 + fVar328 * fVar212;
      auVar440._24_4_ = auVar10._24_4_ + fVar347 * fVar248 + fVar329 * fVar249;
      auVar440._28_4_ = auVar10._28_4_ + fVar250 + fVar250;
      auVar457._0_4_ = fVar380 * fVar412 + fVar280 * fVar425;
      auVar457._4_4_ = fVar382 * fVar427 + fVar302 * fVar435;
      auVar457._8_4_ = fVar384 * fVar437 + fVar303 * fVar453;
      auVar457._12_4_ = fVar395 * fVar455 + fVar304 * fVar468;
      auVar457._16_4_ = fVar396 * fVar115 + fVar305 * fVar181;
      auVar457._20_4_ = fVar397 * fVar184 + fVar328 * fVar211;
      auVar457._24_4_ = fVar347 * fVar213 + fVar329 * fVar248;
      auVar457._28_4_ = fVar250 + auVar193._28_4_;
      auVar261._0_4_ = fVar264 * fVar426 + fVar330 * fVar424;
      auVar261._4_4_ = fVar265 * fVar436 + fVar331 * fVar434;
      auVar261._8_4_ = fVar266 * fVar454 + fVar342 * fVar452;
      auVar261._12_4_ = fVar267 * fVar469 + fVar343 * fVar467;
      auVar261._16_4_ = fVar277 * fVar182 + fVar344 * fVar180;
      auVar261._20_4_ = fVar278 * fVar212 + fVar346 * fVar210;
      auVar261._24_4_ = fVar279 * fVar249 + fVar378 * fVar247;
      auVar261._28_4_ = auVar363._28_4_ + auVar12._28_4_;
      auVar10 = vsubps_avx(auVar457,auVar261);
      auVar91._4_4_ = fStack_114;
      auVar91._0_4_ = fStack_118;
      auVar91._8_4_ = local_110;
      auVar91._12_4_ = fStack_10c;
      auVar193._16_16_ = auVar91;
      auVar193._0_16_ = auVar91;
      auVar12 = vpermilps_avx(auVar193,0xff);
      auVar14 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0);
      fVar436 = auVar13._0_4_ * auVar193._0_4_;
      fVar437 = auVar13._4_4_ * auVar193._4_4_;
      auVar16._4_4_ = fVar437;
      auVar16._0_4_ = fVar436;
      fVar452 = auVar13._8_4_ * auVar193._8_4_;
      auVar16._8_4_ = fVar452;
      fVar453 = auVar13._12_4_ * auVar193._12_4_;
      auVar16._12_4_ = fVar453;
      fVar454 = auVar13._16_4_ * auVar193._16_4_;
      auVar16._16_4_ = fVar454;
      fVar455 = auVar13._20_4_ * auVar193._20_4_;
      auVar16._20_4_ = fVar455;
      fVar467 = auVar13._24_4_ * auVar193._24_4_;
      auVar16._24_4_ = fVar467;
      auVar16._28_4_ = auVar122._28_4_;
      fVar412 = auVar11._0_4_ * auVar193._0_4_;
      fVar424 = auVar11._4_4_ * auVar193._4_4_;
      auVar13._4_4_ = fVar424;
      auVar13._0_4_ = fVar412;
      fVar425 = auVar11._8_4_ * auVar193._8_4_;
      auVar13._8_4_ = fVar425;
      fVar426 = auVar11._12_4_ * auVar193._12_4_;
      auVar13._12_4_ = fVar426;
      fVar427 = auVar11._16_4_ * auVar193._16_4_;
      auVar13._16_4_ = fVar427;
      fVar434 = auVar11._20_4_ * auVar193._20_4_;
      auVar13._20_4_ = fVar434;
      fVar435 = auVar11._24_4_ * auVar193._24_4_;
      auVar13._24_4_ = fVar435;
      auVar13._28_4_ = auVar11._28_4_;
      auVar405._0_4_ = fVar436 + fVar412;
      auVar405._4_4_ = fVar437 + fVar424;
      auVar405._8_4_ = fVar452 + fVar425;
      auVar405._12_4_ = fVar453 + fVar426;
      auVar405._16_4_ = fVar454 + fVar427;
      auVar405._20_4_ = fVar455 + fVar434;
      auVar405._24_4_ = fVar467 + fVar435;
      auVar405._28_4_ = auVar122._28_4_ + auVar11._28_4_;
      auVar193 = vsubps_avx(auVar16,auVar13);
      auVar335._0_4_ = auVar260._0_4_ * auVar12._0_4_ + auVar192._0_4_ * auVar14._0_4_;
      auVar335._4_4_ = auVar260._4_4_ * auVar12._4_4_ + auVar192._4_4_ * auVar14._4_4_;
      auVar335._8_4_ = auVar260._8_4_ * auVar12._8_4_ + auVar192._8_4_ * auVar14._8_4_;
      auVar335._12_4_ = auVar260._12_4_ * auVar12._12_4_ + auVar192._12_4_ * auVar14._12_4_;
      auVar335._16_4_ = auVar260._16_4_ * auVar12._16_4_ + auVar192._16_4_ * auVar14._16_4_;
      auVar335._20_4_ = auVar260._20_4_ * auVar12._20_4_ + auVar192._20_4_ * auVar14._20_4_;
      auVar335._24_4_ = auVar260._24_4_ * auVar12._24_4_ + auVar192._24_4_ * auVar14._24_4_;
      auVar335._28_4_ = auVar191._28_4_ + auVar363._28_4_;
      auVar365._0_4_ = auVar405._0_4_ + auVar335._0_4_;
      auVar365._4_4_ = auVar405._4_4_ + auVar335._4_4_;
      auVar365._8_4_ = auVar405._8_4_ + auVar335._8_4_;
      auVar365._12_4_ = auVar405._12_4_ + auVar335._12_4_;
      auVar365._16_4_ = auVar405._16_4_ + auVar335._16_4_;
      auVar365._20_4_ = auVar405._20_4_ + auVar335._20_4_;
      auVar365._24_4_ = auVar405._24_4_ + auVar335._24_4_;
      auVar365._28_4_ = auVar405._28_4_ + auVar335._28_4_;
      auVar363 = vsubps_avx(auVar405,auVar335);
      auVar11._4_4_ = auVar192._4_4_ * auVar12._4_4_;
      auVar11._0_4_ = auVar192._0_4_ * auVar12._0_4_;
      auVar11._8_4_ = auVar192._8_4_ * auVar12._8_4_;
      auVar11._12_4_ = auVar192._12_4_ * auVar12._12_4_;
      auVar11._16_4_ = auVar192._16_4_ * auVar12._16_4_;
      auVar11._20_4_ = auVar192._20_4_ * auVar12._20_4_;
      auVar11._24_4_ = auVar192._24_4_ * auVar12._24_4_;
      auVar11._28_4_ = auVar335._28_4_;
      auVar12._4_4_ = auVar260._4_4_ * auVar14._4_4_;
      auVar12._0_4_ = auVar260._0_4_ * auVar14._0_4_;
      auVar12._8_4_ = auVar260._8_4_ * auVar14._8_4_;
      auVar12._12_4_ = auVar260._12_4_ * auVar14._12_4_;
      auVar12._16_4_ = auVar260._16_4_ * auVar14._16_4_;
      auVar12._20_4_ = auVar260._20_4_ * auVar14._20_4_;
      auVar12._24_4_ = auVar260._24_4_ * auVar14._24_4_;
      auVar12._28_4_ = auVar191._28_4_;
      auVar260 = vsubps_avx(auVar11,auVar12);
      auVar388._0_4_ = auVar193._0_4_ + auVar260._0_4_;
      auVar388._4_4_ = auVar193._4_4_ + auVar260._4_4_;
      auVar388._8_4_ = auVar193._8_4_ + auVar260._8_4_;
      auVar388._12_4_ = auVar193._12_4_ + auVar260._12_4_;
      auVar388._16_4_ = auVar193._16_4_ + auVar260._16_4_;
      auVar388._20_4_ = auVar193._20_4_ + auVar260._20_4_;
      auVar388._24_4_ = auVar193._24_4_ + auVar260._24_4_;
      auVar388._28_4_ = auVar193._28_4_ + auVar260._28_4_;
      auVar193 = vsubps_avx(auVar193,auVar260);
      auVar260 = vsubps_avx(auVar365,auVar414);
      auVar11 = vsubps_avx(auVar388,auVar9);
      auVar12 = vsubps_avx(auVar193,auVar440);
      auVar192 = vsubps_avx(auVar363,auVar10);
      *(float *)(undefined1 *)local_150._buffer = auVar365._0_4_ + auVar414._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar365._4_4_ + auVar414._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar365._8_4_ + auVar414._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar365._12_4_ + auVar414._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar365._16_4_ + auVar414._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar365._20_4_ + auVar414._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar365._24_4_ + auVar414._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar365._28_4_ + auVar414._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar388._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar388._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar388._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar388._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar388._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar388._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar388._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar388._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar193._0_4_ + auVar440._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar193._4_4_ + auVar440._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar193._8_4_ + auVar440._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar193._12_4_ + auVar440._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar193._16_4_ + auVar440._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar193._20_4_ + auVar440._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar193._24_4_ + auVar440._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar193._28_4_ + auVar440._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar363._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar363._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar363._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar363._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar363._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar363._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar363._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar363._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar192;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar260;
      compareBufferRelative(&local_140,&local_150,0.01,1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"7x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar167._0_8_ = std::ostream::flush();
    auVar167._8_56_ = extraout_var_27;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x38) {
          auVar166._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar166._8_56_ = extraout_var_28;
          auVar167._4_60_ = auVar166._4_60_;
          auVar167._0_4_ = (float)auVar166._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar167._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar167._0_16_ = ZEXT816(0);
        }
        local_140._buffer[uVar112] = auVar167._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar441._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar441._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar458._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar458._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar441,auVar458);
      auVar9 = vunpckhpd_avx(auVar441,auVar458);
      auVar193 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar260 = vunpcklpd_avx(auVar193,auVar9);
      auVar9 = vunpckhpd_avx(auVar193,auVar9);
      auVar415._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar415._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar429._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar429._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar193 = vunpcklpd_avx(auVar415,auVar429);
      auVar10 = vunpckhpd_avx(auVar415,auVar429);
      auVar363 = vunpcklps_avx(auVar193,auVar10);
      auVar10 = vunpckhps_avx(auVar193,auVar10);
      auVar11 = vunpcklpd_avx(auVar363,auVar10);
      auVar10 = vunpckhpd_avx(auVar363,auVar10);
      auVar400._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar400._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar406._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar406._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar363 = vunpcklpd_avx(auVar400,auVar406);
      auVar193 = vunpckhpd_avx(auVar400,auVar406);
      auVar192 = vunpcklps_avx(auVar363,auVar193);
      auVar193 = vunpckhps_avx(auVar363,auVar193);
      auVar12 = vunpcklpd_avx(auVar192,auVar193);
      auVar193 = vunpckhpd_avx(auVar192,auVar193);
      auVar366._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xe0);
      auVar366._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xc0);
      auVar389._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xf0);
      auVar389._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xd0);
      auVar192 = vunpcklpd_avx(auVar366,auVar389);
      auVar363 = vunpckhpd_avx(auVar366,auVar389);
      auVar13 = vunpcklps_avx(auVar192,auVar363);
      auVar363 = vunpckhps_avx(auVar192,auVar363);
      auVar192 = vunpcklpd_avx(auVar13,auVar363);
      auVar363 = vunpckhpd_avx(auVar13,auVar363);
      auVar13 = vpermilps_avx(auVar260,0);
      auVar14 = vpermilps_avx(auVar260,0x55);
      auVar15 = vpermilps_avx(auVar260,0xaa);
      auVar260 = vpermilps_avx(auVar260,0xff);
      auVar124._0_4_ =
           local_120 * auVar13._0_4_ + local_110 * auVar14._0_4_ +
           local_100 * auVar15._0_4_ + local_f0 * auVar260._0_4_;
      auVar124._4_4_ =
           fStack_11c * auVar13._4_4_ + fStack_10c * auVar14._4_4_ +
           fStack_fc * auVar15._4_4_ + fStack_ec * auVar260._4_4_;
      auVar124._8_4_ =
           fStack_118 * auVar13._8_4_ + fStack_108 * auVar14._8_4_ +
           fStack_f8 * auVar15._8_4_ + fStack_e8 * auVar260._8_4_;
      auVar124._12_4_ =
           fStack_114 * auVar13._12_4_ + fStack_104 * auVar14._12_4_ +
           fStack_f4 * auVar15._12_4_ + fStack_e4 * auVar260._12_4_;
      auVar124._16_4_ =
           local_120 * auVar13._16_4_ + local_110 * auVar14._16_4_ +
           local_100 * auVar15._16_4_ + local_f0 * auVar260._16_4_;
      auVar124._20_4_ =
           fStack_11c * auVar13._20_4_ + fStack_10c * auVar14._20_4_ +
           fStack_fc * auVar15._20_4_ + fStack_ec * auVar260._20_4_;
      auVar124._24_4_ =
           fStack_118 * auVar13._24_4_ + fStack_108 * auVar14._24_4_ +
           fStack_f8 * auVar15._24_4_ + fStack_e8 * auVar260._24_4_;
      auVar124._28_4_ = auVar13._28_4_ + auVar14._28_4_ + auVar15._28_4_ + auVar260._28_4_;
      auVar260 = vpermilps_avx(auVar11,0);
      auVar13 = vpermilps_avx(auVar11,0x55);
      auVar14 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar194._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar13._0_4_ +
           local_100 * auVar14._0_4_ + local_f0 * auVar11._0_4_;
      auVar194._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar13._4_4_ +
           fStack_fc * auVar14._4_4_ + fStack_ec * auVar11._4_4_;
      auVar194._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar13._8_4_ +
           fStack_f8 * auVar14._8_4_ + fStack_e8 * auVar11._8_4_;
      auVar194._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar13._12_4_ +
           fStack_f4 * auVar14._12_4_ + fStack_e4 * auVar11._12_4_;
      auVar194._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar13._16_4_ +
           local_100 * auVar14._16_4_ + local_f0 * auVar11._16_4_;
      auVar194._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar13._20_4_ +
           fStack_fc * auVar14._20_4_ + fStack_ec * auVar11._20_4_;
      auVar194._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar13._24_4_ +
           fStack_f8 * auVar14._24_4_ + fStack_e8 * auVar11._24_4_;
      auVar194._28_4_ = auVar260._28_4_ + auVar13._28_4_ + auVar14._28_4_ + auVar11._28_4_;
      auVar260 = vpermilps_avx(auVar12,0);
      auVar11 = vpermilps_avx(auVar12,0x55);
      auVar13 = vpermilps_avx(auVar12,0xaa);
      auVar12 = vpermilps_avx(auVar12,0xff);
      auVar239._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar11._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar12._0_4_;
      auVar239._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar11._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar12._4_4_;
      auVar239._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar11._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar12._8_4_;
      auVar239._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar11._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar12._12_4_;
      auVar239._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar11._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar12._16_4_;
      auVar239._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar11._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar12._20_4_;
      auVar239._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar11._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar12._24_4_;
      auVar239._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar13._28_4_ + auVar12._28_4_;
      auVar260 = vpermilps_avx(auVar192,0);
      auVar11 = vpermilps_avx(auVar192,0x55);
      auVar12 = vpermilps_avx(auVar192,0xaa);
      auVar192 = vpermilps_avx(auVar192,0xff);
      auVar262._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar11._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar192._0_4_;
      auVar262._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar11._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar192._4_4_;
      auVar262._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar11._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar192._8_4_;
      auVar262._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar11._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar192._12_4_;
      auVar262._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar11._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar192._16_4_;
      auVar262._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar11._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar192._20_4_;
      auVar262._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar11._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar192._24_4_;
      auVar262._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar192._28_4_;
      auVar99._4_4_ = fStack_dc;
      auVar99._0_4_ = local_e0;
      auVar99._8_4_ = fStack_d8;
      auVar99._12_4_ = fStack_d4;
      auVar367._16_16_ = auVar99;
      auVar367._0_16_ = auVar99;
      auVar260 = vpermilps_avx(auVar9,0);
      auVar11 = vpermilps_avx(auVar9,0x55);
      auVar12 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar270._0_4_ =
           local_e0 * auVar260._0_4_ + local_d0 * auVar11._0_4_ +
           local_c0 * auVar12._0_4_ + local_b0 * auVar9._0_4_;
      auVar270._4_4_ =
           fStack_dc * auVar260._4_4_ + fStack_cc * auVar11._4_4_ +
           fStack_bc * auVar12._4_4_ + fStack_ac * auVar9._4_4_;
      auVar270._8_4_ =
           fStack_d8 * auVar260._8_4_ + fStack_c8 * auVar11._8_4_ +
           fStack_b8 * auVar12._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar270._12_4_ =
           fStack_d4 * auVar260._12_4_ + fStack_c4 * auVar11._12_4_ +
           fStack_b4 * auVar12._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar270._16_4_ =
           local_e0 * auVar260._16_4_ + local_d0 * auVar11._16_4_ +
           local_c0 * auVar12._16_4_ + local_b0 * auVar9._16_4_;
      auVar270._20_4_ =
           fStack_dc * auVar260._20_4_ + fStack_cc * auVar11._20_4_ +
           fStack_bc * auVar12._20_4_ + fStack_ac * auVar9._20_4_;
      auVar270._24_4_ =
           fStack_d8 * auVar260._24_4_ + fStack_c8 * auVar11._24_4_ +
           fStack_b8 * auVar12._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar270._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar260 = vpermilps_avx(auVar10,0x55);
      auVar11 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar297._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar260._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar10._0_4_;
      auVar297._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar260._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar10._4_4_;
      auVar297._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar260._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar297._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar260._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar297._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar260._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar10._16_4_;
      auVar297._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar260._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar10._20_4_;
      auVar297._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar260._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar297._28_4_ = auVar9._28_4_ + auVar260._28_4_ + auVar11._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar193,0);
      auVar10 = vpermilps_avx(auVar193,0x55);
      auVar260 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0xff);
      auVar325._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar10._0_4_ +
           local_c0 * auVar260._0_4_ + local_b0 * auVar193._0_4_;
      auVar325._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar10._4_4_ +
           fStack_bc * auVar260._4_4_ + fStack_ac * auVar193._4_4_;
      auVar325._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar10._8_4_ +
           fStack_b8 * auVar260._8_4_ + fStack_a8 * auVar193._8_4_;
      auVar325._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar10._12_4_ +
           fStack_b4 * auVar260._12_4_ + fStack_a4 * auVar193._12_4_;
      auVar325._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar10._16_4_ +
           local_c0 * auVar260._16_4_ + local_b0 * auVar193._16_4_;
      auVar325._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar10._20_4_ +
           fStack_bc * auVar260._20_4_ + fStack_ac * auVar193._20_4_;
      auVar325._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar10._24_4_ +
           fStack_b8 * auVar260._24_4_ + fStack_a8 * auVar193._24_4_;
      auVar325._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar260._28_4_ + auVar193._28_4_;
      auVar9 = vpermilps_avx(auVar363,0);
      auVar10 = vpermilps_avx(auVar363,0x55);
      auVar193 = vpermilps_avx(auVar363,0xaa);
      auVar363 = vpermilps_avx(auVar363,0xff);
      auVar336._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar10._0_4_ +
           local_c0 * auVar193._0_4_ + local_b0 * auVar363._0_4_;
      auVar336._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar10._4_4_ +
           fStack_bc * auVar193._4_4_ + fStack_ac * auVar363._4_4_;
      auVar336._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar10._8_4_ +
           fStack_b8 * auVar193._8_4_ + fStack_a8 * auVar363._8_4_;
      auVar336._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar10._12_4_ +
           fStack_b4 * auVar193._12_4_ + fStack_a4 * auVar363._12_4_;
      auVar336._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar10._16_4_ +
           local_c0 * auVar193._16_4_ + local_b0 * auVar363._16_4_;
      auVar336._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar10._20_4_ +
           fStack_bc * auVar193._20_4_ + fStack_ac * auVar363._20_4_;
      auVar336._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar10._24_4_ +
           fStack_b8 * auVar193._24_4_ + fStack_a8 * auVar363._24_4_;
      auVar336._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar193._28_4_ + auVar363._28_4_;
      auVar9 = vsubps_avx(auVar124,auVar270);
      auVar125._0_4_ = auVar124._0_4_ + auVar270._0_4_;
      auVar125._4_4_ = auVar124._4_4_ + auVar270._4_4_;
      auVar125._8_4_ = auVar124._8_4_ + auVar270._8_4_;
      auVar125._12_4_ = auVar124._12_4_ + auVar270._12_4_;
      auVar125._16_4_ = auVar124._16_4_ + auVar270._16_4_;
      auVar125._20_4_ = auVar124._20_4_ + auVar270._20_4_;
      auVar125._24_4_ = auVar124._24_4_ + auVar270._24_4_;
      auVar125._28_4_ = auVar124._28_4_ + auVar270._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar194,auVar297);
      auVar195._0_4_ = auVar194._0_4_ + auVar297._0_4_;
      auVar195._4_4_ = auVar194._4_4_ + auVar297._4_4_;
      auVar195._8_4_ = auVar194._8_4_ + auVar297._8_4_;
      auVar195._12_4_ = auVar194._12_4_ + auVar297._12_4_;
      auVar195._16_4_ = auVar194._16_4_ + auVar297._16_4_;
      auVar195._20_4_ = auVar194._20_4_ + auVar297._20_4_;
      auVar195._24_4_ = auVar194._24_4_ + auVar297._24_4_;
      auVar195._28_4_ = auVar194._28_4_ + auVar297._28_4_;
      auVar13 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar239,auVar325);
      auVar240._0_4_ = auVar239._0_4_ + auVar325._0_4_;
      auVar240._4_4_ = auVar239._4_4_ + auVar325._4_4_;
      auVar240._8_4_ = auVar239._8_4_ + auVar325._8_4_;
      auVar240._12_4_ = auVar239._12_4_ + auVar325._12_4_;
      auVar240._16_4_ = auVar239._16_4_ + auVar325._16_4_;
      auVar240._20_4_ = auVar239._20_4_ + auVar325._20_4_;
      auVar240._24_4_ = auVar239._24_4_ + auVar325._24_4_;
      auVar240._28_4_ = auVar239._28_4_ + auVar325._28_4_;
      auVar14 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar262,auVar336);
      auVar263._0_4_ = auVar262._0_4_ + auVar336._0_4_;
      auVar263._4_4_ = auVar262._4_4_ + auVar336._4_4_;
      auVar263._8_4_ = auVar262._8_4_ + auVar336._8_4_;
      auVar263._12_4_ = auVar262._12_4_ + auVar336._12_4_;
      auVar263._16_4_ = auVar262._16_4_ + auVar336._16_4_;
      auVar263._20_4_ = auVar262._20_4_ + auVar336._20_4_;
      auVar263._24_4_ = auVar262._24_4_ + auVar336._24_4_;
      auVar263._28_4_ = auVar262._28_4_ + auVar336._28_4_;
      auVar15 = vpermilps_avx(auVar9,0x1b);
      auVar260 = vperm2f128_avx(auVar15,auVar263,2);
      auVar193 = vperm2f128_avx(auVar14,auVar240,0x13);
      auVar363 = vperm2f128_avx(auVar14,auVar240,2);
      auVar11 = vperm2f128_avx(auVar13,auVar195,0x13);
      auVar12 = vperm2f128_avx(auVar13,auVar195,2);
      auVar9 = vperm2f128_avx(auVar10,auVar125,0x13);
      auVar192 = vperm2f128_avx(auVar10,auVar125,2);
      auVar16 = vpermilps_avx(auVar367,0xff);
      auVar122 = vpermilps_avx(auVar367,0xaa);
      auVar123 = vpermilps_avx(auVar367,0x55);
      auVar191 = vpermilps_avx(auVar367,0);
      fVar412 = auVar9._0_4_;
      fVar211 = auVar191._0_4_;
      fVar426 = auVar9._4_4_;
      fVar212 = auVar191._4_4_;
      fVar435 = auVar9._8_4_;
      fVar213 = auVar191._8_4_;
      fVar452 = auVar9._12_4_;
      fVar247 = auVar191._12_4_;
      fVar455 = auVar9._16_4_;
      fVar248 = auVar191._16_4_;
      fVar469 = auVar9._20_4_;
      fVar249 = auVar191._20_4_;
      fVar181 = auVar9._24_4_;
      fVar250 = auVar191._24_4_;
      fVar424 = auVar11._0_4_;
      fVar264 = auVar123._0_4_;
      fVar427 = auVar11._4_4_;
      fVar265 = auVar123._4_4_;
      fVar436 = auVar11._8_4_;
      fVar266 = auVar123._8_4_;
      fVar453 = auVar11._12_4_;
      fVar267 = auVar123._12_4_;
      fVar467 = auVar11._16_4_;
      fVar277 = auVar123._16_4_;
      fVar115 = auVar11._20_4_;
      fVar278 = auVar123._20_4_;
      fVar182 = auVar11._24_4_;
      fVar279 = auVar123._24_4_;
      fVar425 = auVar193._0_4_;
      fVar280 = auVar122._0_4_;
      fVar434 = auVar193._4_4_;
      fVar302 = auVar122._4_4_;
      fVar437 = auVar193._8_4_;
      fVar303 = auVar122._8_4_;
      fVar454 = auVar193._12_4_;
      fVar304 = auVar122._12_4_;
      fVar468 = auVar193._16_4_;
      fVar305 = auVar122._16_4_;
      fVar180 = auVar193._20_4_;
      fVar328 = auVar122._20_4_;
      fVar184 = auVar193._24_4_;
      fVar329 = auVar122._24_4_;
      auVar416._0_4_ = fVar280 * fVar425 + fVar264 * fVar424 + fVar211 * fVar412;
      auVar416._4_4_ = fVar302 * fVar434 + fVar265 * fVar427 + fVar212 * fVar426;
      auVar416._8_4_ = fVar303 * fVar437 + fVar266 * fVar436 + fVar213 * fVar435;
      auVar416._12_4_ = fVar304 * fVar454 + fVar267 * fVar453 + fVar247 * fVar452;
      auVar416._16_4_ = fVar305 * fVar468 + fVar277 * fVar467 + fVar248 * fVar455;
      auVar416._20_4_ = fVar328 * fVar180 + fVar278 * fVar115 + fVar249 * fVar469;
      auVar416._24_4_ = fVar329 * fVar184 + fVar279 * fVar182 + fVar250 * fVar181;
      auVar416._28_4_ = auVar14._28_4_ + auVar13._28_4_ + auVar10._28_4_;
      auVar17._4_4_ = fVar265 * fVar426;
      auVar17._0_4_ = fVar264 * fVar412;
      auVar17._8_4_ = fVar266 * fVar435;
      auVar17._12_4_ = fVar267 * fVar452;
      auVar17._16_4_ = fVar277 * fVar455;
      auVar17._20_4_ = fVar278 * fVar469;
      auVar17._24_4_ = fVar279 * fVar181;
      auVar17._28_4_ = auVar13._28_4_;
      fVar330 = auVar16._0_4_;
      fVar331 = auVar16._4_4_;
      fVar342 = auVar16._8_4_;
      fVar343 = auVar16._12_4_;
      fVar344 = auVar16._16_4_;
      fVar346 = auVar16._20_4_;
      fVar378 = auVar16._24_4_;
      fVar210 = auVar15._28_4_;
      auVar442._0_4_ = fVar211 * fVar425 + fVar330 * fVar424;
      auVar442._4_4_ = fVar212 * fVar434 + fVar331 * fVar427;
      auVar442._8_4_ = fVar213 * fVar437 + fVar342 * fVar436;
      auVar442._12_4_ = fVar247 * fVar454 + fVar343 * fVar453;
      auVar442._16_4_ = fVar248 * fVar468 + fVar344 * fVar467;
      auVar442._20_4_ = fVar249 * fVar180 + fVar346 * fVar115;
      auVar442._24_4_ = fVar250 * fVar184 + fVar378 * fVar182;
      auVar442._28_4_ = fVar210 + auVar14._28_4_;
      auVar9 = vsubps_avx(auVar17,auVar442);
      auVar18._4_4_ = fVar302 * fVar426;
      auVar18._0_4_ = fVar280 * fVar412;
      auVar18._8_4_ = fVar303 * fVar435;
      auVar18._12_4_ = fVar304 * fVar452;
      auVar18._16_4_ = fVar305 * fVar455;
      auVar18._20_4_ = fVar328 * fVar469;
      auVar18._24_4_ = fVar329 * fVar181;
      auVar18._28_4_ = auVar442._28_4_;
      auVar19._4_4_ = fVar212 * fVar427;
      auVar19._0_4_ = fVar211 * fVar424;
      auVar19._8_4_ = fVar213 * fVar436;
      auVar19._12_4_ = fVar247 * fVar453;
      auVar19._16_4_ = fVar248 * fVar467;
      auVar19._20_4_ = fVar249 * fVar115;
      auVar19._24_4_ = fVar250 * fVar182;
      auVar19._28_4_ = fVar210;
      auVar10 = vsubps_avx(auVar18,auVar19);
      auVar443._0_4_ = auVar10._0_4_ + fVar330 * fVar425;
      auVar443._4_4_ = auVar10._4_4_ + fVar331 * fVar434;
      auVar443._8_4_ = auVar10._8_4_ + fVar342 * fVar437;
      auVar443._12_4_ = auVar10._12_4_ + fVar343 * fVar454;
      auVar443._16_4_ = auVar10._16_4_ + fVar344 * fVar468;
      auVar443._20_4_ = auVar10._20_4_ + fVar346 * fVar180;
      auVar443._24_4_ = auVar10._24_4_ + fVar378 * fVar184;
      auVar443._28_4_ = auVar10._28_4_ + fVar210;
      auVar20._4_4_ = fVar302 * fVar427;
      auVar20._0_4_ = fVar280 * fVar424;
      auVar20._8_4_ = fVar303 * fVar436;
      auVar20._12_4_ = fVar304 * fVar453;
      auVar20._16_4_ = fVar305 * fVar467;
      auVar20._20_4_ = fVar328 * fVar115;
      auVar20._24_4_ = fVar329 * fVar182;
      auVar20._28_4_ = auVar11._28_4_;
      auVar459._0_4_ = fVar330 * fVar412 + fVar264 * fVar425;
      auVar459._4_4_ = fVar331 * fVar426 + fVar265 * fVar434;
      auVar459._8_4_ = fVar342 * fVar435 + fVar266 * fVar437;
      auVar459._12_4_ = fVar343 * fVar452 + fVar267 * fVar454;
      auVar459._16_4_ = fVar344 * fVar455 + fVar277 * fVar468;
      auVar459._20_4_ = fVar346 * fVar469 + fVar278 * fVar180;
      auVar459._24_4_ = fVar378 * fVar181 + fVar279 * fVar184;
      auVar459._28_4_ = fVar210 + auVar193._28_4_;
      auVar10 = vsubps_avx(auVar459,auVar20);
      auVar92._4_4_ = fStack_114;
      auVar92._0_4_ = fStack_118;
      auVar92._8_4_ = local_110;
      auVar92._12_4_ = fStack_10c;
      auVar196._16_16_ = auVar92;
      auVar196._0_16_ = auVar92;
      auVar11 = vpermilps_avx(auVar196,0xff);
      auVar13 = vpermilps_avx(auVar196,0xaa);
      auVar193 = vpermilps_avx(auVar196,0);
      fVar436 = auVar192._0_4_ * auVar193._0_4_;
      fVar437 = auVar192._4_4_ * auVar193._4_4_;
      auVar21._4_4_ = fVar437;
      auVar21._0_4_ = fVar436;
      fVar452 = auVar192._8_4_ * auVar193._8_4_;
      auVar21._8_4_ = fVar452;
      fVar453 = auVar192._12_4_ * auVar193._12_4_;
      auVar21._12_4_ = fVar453;
      fVar454 = auVar192._16_4_ * auVar193._16_4_;
      auVar21._16_4_ = fVar454;
      fVar455 = auVar192._20_4_ * auVar193._20_4_;
      auVar21._20_4_ = fVar455;
      fVar467 = auVar192._24_4_ * auVar193._24_4_;
      auVar21._24_4_ = fVar467;
      auVar21._28_4_ = auVar16._28_4_;
      fVar412 = auVar363._0_4_ * auVar193._0_4_;
      fVar424 = auVar363._4_4_ * auVar193._4_4_;
      auVar22._4_4_ = fVar424;
      auVar22._0_4_ = fVar412;
      fVar425 = auVar363._8_4_ * auVar193._8_4_;
      auVar22._8_4_ = fVar425;
      fVar426 = auVar363._12_4_ * auVar193._12_4_;
      auVar22._12_4_ = fVar426;
      fVar427 = auVar363._16_4_ * auVar193._16_4_;
      auVar22._16_4_ = fVar427;
      fVar434 = auVar363._20_4_ * auVar193._20_4_;
      auVar22._20_4_ = fVar434;
      fVar435 = auVar363._24_4_ * auVar193._24_4_;
      auVar22._24_4_ = fVar435;
      auVar22._28_4_ = auVar363._28_4_;
      auVar407._0_4_ = fVar436 + fVar412;
      auVar407._4_4_ = fVar437 + fVar424;
      auVar407._8_4_ = fVar452 + fVar425;
      auVar407._12_4_ = fVar453 + fVar426;
      auVar407._16_4_ = fVar454 + fVar427;
      auVar407._20_4_ = fVar455 + fVar434;
      auVar407._24_4_ = fVar467 + fVar435;
      auVar407._28_4_ = auVar16._28_4_ + auVar363._28_4_;
      auVar193 = vsubps_avx(auVar21,auVar22);
      auVar337._0_4_ = auVar260._0_4_ * auVar11._0_4_ + auVar12._0_4_ * auVar13._0_4_;
      auVar337._4_4_ = auVar260._4_4_ * auVar11._4_4_ + auVar12._4_4_ * auVar13._4_4_;
      auVar337._8_4_ = auVar260._8_4_ * auVar11._8_4_ + auVar12._8_4_ * auVar13._8_4_;
      auVar337._12_4_ = auVar260._12_4_ * auVar11._12_4_ + auVar12._12_4_ * auVar13._12_4_;
      auVar337._16_4_ = auVar260._16_4_ * auVar11._16_4_ + auVar12._16_4_ * auVar13._16_4_;
      auVar337._20_4_ = auVar260._20_4_ * auVar11._20_4_ + auVar12._20_4_ * auVar13._20_4_;
      auVar337._24_4_ = auVar260._24_4_ * auVar11._24_4_ + auVar12._24_4_ * auVar13._24_4_;
      auVar337._28_4_ = auVar123._28_4_ + auVar336._28_4_;
      auVar368._0_4_ = auVar407._0_4_ + auVar337._0_4_;
      auVar368._4_4_ = auVar407._4_4_ + auVar337._4_4_;
      auVar368._8_4_ = auVar407._8_4_ + auVar337._8_4_;
      auVar368._12_4_ = auVar407._12_4_ + auVar337._12_4_;
      auVar368._16_4_ = auVar407._16_4_ + auVar337._16_4_;
      auVar368._20_4_ = auVar407._20_4_ + auVar337._20_4_;
      auVar368._24_4_ = auVar407._24_4_ + auVar337._24_4_;
      auVar368._28_4_ = auVar407._28_4_ + auVar337._28_4_;
      auVar363 = vsubps_avx(auVar407,auVar337);
      auVar23._4_4_ = auVar12._4_4_ * auVar11._4_4_;
      auVar23._0_4_ = auVar12._0_4_ * auVar11._0_4_;
      auVar23._8_4_ = auVar12._8_4_ * auVar11._8_4_;
      auVar23._12_4_ = auVar12._12_4_ * auVar11._12_4_;
      auVar23._16_4_ = auVar12._16_4_ * auVar11._16_4_;
      auVar23._20_4_ = auVar12._20_4_ * auVar11._20_4_;
      auVar23._24_4_ = auVar12._24_4_ * auVar11._24_4_;
      auVar23._28_4_ = auVar337._28_4_;
      auVar24._4_4_ = auVar260._4_4_ * auVar13._4_4_;
      auVar24._0_4_ = auVar260._0_4_ * auVar13._0_4_;
      auVar24._8_4_ = auVar260._8_4_ * auVar13._8_4_;
      auVar24._12_4_ = auVar260._12_4_ * auVar13._12_4_;
      auVar24._16_4_ = auVar260._16_4_ * auVar13._16_4_;
      auVar24._20_4_ = auVar260._20_4_ * auVar13._20_4_;
      auVar24._24_4_ = auVar260._24_4_ * auVar13._24_4_;
      auVar24._28_4_ = auVar123._28_4_;
      auVar260 = vsubps_avx(auVar23,auVar24);
      auVar390._0_4_ = auVar193._0_4_ + auVar260._0_4_;
      auVar390._4_4_ = auVar193._4_4_ + auVar260._4_4_;
      auVar390._8_4_ = auVar193._8_4_ + auVar260._8_4_;
      auVar390._12_4_ = auVar193._12_4_ + auVar260._12_4_;
      auVar390._16_4_ = auVar193._16_4_ + auVar260._16_4_;
      auVar390._20_4_ = auVar193._20_4_ + auVar260._20_4_;
      auVar390._24_4_ = auVar193._24_4_ + auVar260._24_4_;
      auVar390._28_4_ = auVar193._28_4_ + auVar260._28_4_;
      auVar193 = vsubps_avx(auVar193,auVar260);
      auVar260 = vsubps_avx(auVar368,auVar416);
      auVar11 = vsubps_avx(auVar390,auVar9);
      auVar12 = vsubps_avx(auVar193,auVar443);
      auVar192 = vsubps_avx(auVar363,auVar10);
      *(float *)(undefined1 *)local_150._buffer = auVar368._0_4_ + auVar416._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar368._4_4_ + auVar416._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar368._8_4_ + auVar416._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar368._12_4_ + auVar416._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar368._16_4_ + auVar416._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar368._20_4_ + auVar416._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar368._24_4_ + auVar416._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar368._28_4_ + auVar416._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar390._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar390._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar390._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar390._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar390._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar390._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar390._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar390._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar193._0_4_ + auVar443._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar193._4_4_ + auVar443._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar193._8_4_ + auVar443._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar193._12_4_ + auVar443._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar193._16_4_ + auVar443._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar193._20_4_ + auVar443._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar193._24_4_ + auVar443._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar193._28_4_ + auVar443._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar363._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar363._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar363._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar363._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar363._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar363._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar363._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar363._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar192;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar260;
      auVar139 = ZEXT1664(auVar260._0_16_);
      auVar167 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"6x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar169._0_8_ = std::ostream::flush();
    auVar169._8_56_ = extraout_var_29;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x30) {
          auVar168._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar168._8_56_ = extraout_var_30;
          auVar169._4_60_ = auVar168._4_60_;
          auVar169._0_4_ = (float)auVar168._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar169._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar169._0_16_ = ZEXT816(0);
        }
        auVar345 = auVar139._28_36_;
        local_140._buffer[uVar112] = auVar169._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar444._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar444._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar460._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar460._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar444,auVar460);
      auVar9 = vunpckhpd_avx(auVar444,auVar460);
      auVar193 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar363 = vunpcklpd_avx(auVar193,auVar9);
      auVar9 = vunpckhpd_avx(auVar193,auVar9);
      auVar417._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar417._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar430._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar430._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar193 = vunpcklpd_avx(auVar417,auVar430);
      auVar10 = vunpckhpd_avx(auVar417,auVar430);
      auVar11 = vunpcklps_avx(auVar193,auVar10);
      auVar10 = vunpckhps_avx(auVar193,auVar10);
      auVar260 = vunpcklpd_avx(auVar11,auVar10);
      auVar10 = vunpckhpd_avx(auVar11,auVar10);
      auVar401._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar401._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar408._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar408._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar11 = vunpcklpd_avx(auVar401,auVar408);
      auVar193 = vunpckhpd_avx(auVar401,auVar408);
      auVar12 = vunpcklps_avx(auVar11,auVar193);
      auVar193 = vunpckhps_avx(auVar11,auVar193);
      auVar11 = vunpcklpd_avx(auVar12,auVar193);
      auVar193 = vunpckhpd_avx(auVar12,auVar193);
      auVar12 = vpermilps_avx(auVar363,0);
      auVar192 = vpermilps_avx(auVar363,0x55);
      auVar13 = vpermilps_avx(auVar363,0xaa);
      auVar363 = vpermilps_avx(auVar363,0xff);
      auVar126._0_4_ =
           local_120 * auVar12._0_4_ + local_110 * auVar192._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar363._0_4_;
      auVar126._4_4_ =
           fStack_11c * auVar12._4_4_ + fStack_10c * auVar192._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar363._4_4_;
      auVar126._8_4_ =
           fStack_118 * auVar12._8_4_ + fStack_108 * auVar192._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar363._8_4_;
      auVar126._12_4_ =
           fStack_114 * auVar12._12_4_ + fStack_104 * auVar192._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar363._12_4_;
      auVar126._16_4_ =
           local_120 * auVar12._16_4_ + local_110 * auVar192._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar363._16_4_;
      auVar126._20_4_ =
           fStack_11c * auVar12._20_4_ + fStack_10c * auVar192._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar363._20_4_;
      auVar126._24_4_ =
           fStack_118 * auVar12._24_4_ + fStack_108 * auVar192._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar363._24_4_;
      auVar126._28_4_ = auVar12._28_4_ + auVar192._28_4_ + auVar13._28_4_ + auVar363._28_4_;
      auVar363 = vpermilps_avx(auVar260,0);
      auVar12 = vpermilps_avx(auVar260,0x55);
      auVar192 = vpermilps_avx(auVar260,0xaa);
      auVar260 = vpermilps_avx(auVar260,0xff);
      auVar197._0_4_ =
           local_120 * auVar363._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar192._0_4_ + local_f0 * auVar260._0_4_;
      auVar197._4_4_ =
           fStack_11c * auVar363._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar192._4_4_ + fStack_ec * auVar260._4_4_;
      auVar197._8_4_ =
           fStack_118 * auVar363._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar192._8_4_ + fStack_e8 * auVar260._8_4_;
      auVar197._12_4_ =
           fStack_114 * auVar363._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar192._12_4_ + fStack_e4 * auVar260._12_4_;
      auVar197._16_4_ =
           local_120 * auVar363._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar192._16_4_ + local_f0 * auVar260._16_4_;
      auVar197._20_4_ =
           fStack_11c * auVar363._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar192._20_4_ + fStack_ec * auVar260._20_4_;
      auVar197._24_4_ =
           fStack_118 * auVar363._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar192._24_4_ + fStack_e8 * auVar260._24_4_;
      auVar197._28_4_ = auVar363._28_4_ + auVar12._28_4_ + auVar192._28_4_ + auVar260._28_4_;
      auVar363 = vpermilps_avx(auVar11,0);
      auVar260 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar241._0_4_ =
           local_120 * auVar363._0_4_ + local_110 * auVar260._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar11._0_4_;
      auVar241._4_4_ =
           fStack_11c * auVar363._4_4_ + fStack_10c * auVar260._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar11._4_4_;
      auVar241._8_4_ =
           fStack_118 * auVar363._8_4_ + fStack_108 * auVar260._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar11._8_4_;
      auVar241._12_4_ =
           fStack_114 * auVar363._12_4_ + fStack_104 * auVar260._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar11._12_4_;
      auVar241._16_4_ =
           local_120 * auVar363._16_4_ + local_110 * auVar260._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar11._16_4_;
      auVar241._20_4_ =
           fStack_11c * auVar363._20_4_ + fStack_10c * auVar260._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar11._20_4_;
      auVar241._24_4_ =
           fStack_118 * auVar363._24_4_ + fStack_108 * auVar260._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar11._24_4_;
      auVar241._28_4_ = auVar363._28_4_ + auVar260._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar100._4_4_ = fStack_dc;
      auVar100._0_4_ = local_e0;
      auVar100._8_4_ = fStack_d8;
      auVar100._12_4_ = fStack_d4;
      auVar369._16_16_ = auVar100;
      auVar369._0_16_ = auVar100;
      auVar363 = vpermilps_avx(auVar9,0);
      auVar260 = vpermilps_avx(auVar9,0x55);
      auVar11 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar271._0_4_ =
           local_e0 * auVar363._0_4_ + local_d0 * auVar260._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar9._0_4_;
      auVar271._4_4_ =
           fStack_dc * auVar363._4_4_ + fStack_cc * auVar260._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar9._4_4_;
      auVar271._8_4_ =
           fStack_d8 * auVar363._8_4_ + fStack_c8 * auVar260._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar271._12_4_ =
           fStack_d4 * auVar363._12_4_ + fStack_c4 * auVar260._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar271._16_4_ =
           local_e0 * auVar363._16_4_ + local_d0 * auVar260._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar9._16_4_;
      auVar271._20_4_ =
           fStack_dc * auVar363._20_4_ + fStack_cc * auVar260._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar9._20_4_;
      auVar271._24_4_ =
           fStack_d8 * auVar363._24_4_ + fStack_c8 * auVar260._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar271._28_4_ = auVar363._28_4_ + auVar260._28_4_ + auVar11._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar363 = vpermilps_avx(auVar10,0x55);
      auVar260 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar298._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar363._0_4_ +
           local_c0 * auVar260._0_4_ + local_b0 * auVar10._0_4_;
      auVar298._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar363._4_4_ +
           fStack_bc * auVar260._4_4_ + fStack_ac * auVar10._4_4_;
      auVar298._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar363._8_4_ +
           fStack_b8 * auVar260._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar298._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar363._12_4_ +
           fStack_b4 * auVar260._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar298._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar363._16_4_ +
           local_c0 * auVar260._16_4_ + local_b0 * auVar10._16_4_;
      auVar298._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar363._20_4_ +
           fStack_bc * auVar260._20_4_ + fStack_ac * auVar10._20_4_;
      auVar298._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar363._24_4_ +
           fStack_b8 * auVar260._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar298._28_4_ = auVar9._28_4_ + auVar363._28_4_ + auVar260._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar193,0);
      auVar10 = vpermilps_avx(auVar193,0x55);
      auVar363 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0xff);
      fVar210 = auVar193._28_4_;
      auVar326._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar10._0_4_ +
           local_c0 * auVar363._0_4_ + local_b0 * auVar193._0_4_;
      auVar326._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar10._4_4_ +
           fStack_bc * auVar363._4_4_ + fStack_ac * auVar193._4_4_;
      auVar326._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar10._8_4_ +
           fStack_b8 * auVar363._8_4_ + fStack_a8 * auVar193._8_4_;
      auVar326._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar10._12_4_ +
           fStack_b4 * auVar363._12_4_ + fStack_a4 * auVar193._12_4_;
      auVar326._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar10._16_4_ +
           local_c0 * auVar363._16_4_ + local_b0 * auVar193._16_4_;
      auVar326._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar10._20_4_ +
           fStack_bc * auVar363._20_4_ + fStack_ac * auVar193._20_4_;
      auVar326._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar10._24_4_ +
           fStack_b8 * auVar363._24_4_ + fStack_a8 * auVar193._24_4_;
      auVar326._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar363._28_4_ + fVar210;
      auVar9 = vsubps_avx(auVar126,auVar271);
      auVar127._0_4_ = auVar126._0_4_ + auVar271._0_4_;
      auVar127._4_4_ = auVar126._4_4_ + auVar271._4_4_;
      auVar127._8_4_ = auVar126._8_4_ + auVar271._8_4_;
      auVar127._12_4_ = auVar126._12_4_ + auVar271._12_4_;
      auVar127._16_4_ = auVar126._16_4_ + auVar271._16_4_;
      auVar127._20_4_ = auVar126._20_4_ + auVar271._20_4_;
      auVar127._24_4_ = auVar126._24_4_ + auVar271._24_4_;
      auVar127._28_4_ = auVar126._28_4_ + auVar271._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar197,auVar298);
      auVar198._0_4_ = auVar197._0_4_ + auVar298._0_4_;
      auVar198._4_4_ = auVar197._4_4_ + auVar298._4_4_;
      auVar198._8_4_ = auVar197._8_4_ + auVar298._8_4_;
      auVar198._12_4_ = auVar197._12_4_ + auVar298._12_4_;
      auVar198._16_4_ = auVar197._16_4_ + auVar298._16_4_;
      auVar198._20_4_ = auVar197._20_4_ + auVar298._20_4_;
      auVar198._24_4_ = auVar197._24_4_ + auVar298._24_4_;
      auVar198._28_4_ = auVar197._28_4_ + auVar298._28_4_;
      auVar192 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar241,auVar326);
      auVar242._0_4_ = auVar241._0_4_ + auVar326._0_4_;
      auVar242._4_4_ = auVar241._4_4_ + auVar326._4_4_;
      auVar242._8_4_ = auVar241._8_4_ + auVar326._8_4_;
      auVar242._12_4_ = auVar241._12_4_ + auVar326._12_4_;
      auVar242._16_4_ = auVar241._16_4_ + auVar326._16_4_;
      auVar242._20_4_ = auVar241._20_4_ + auVar326._20_4_;
      auVar242._24_4_ = auVar241._24_4_ + auVar326._24_4_;
      auVar242._28_4_ = auVar241._28_4_ + auVar326._28_4_;
      auVar13 = vpermilps_avx(auVar9,0x1b);
      auVar193 = vperm2f128_avx(auVar13,auVar242,0x13);
      auVar363 = vperm2f128_avx(auVar13,auVar242,2);
      auVar260 = vperm2f128_avx(auVar192,auVar198,0x13);
      auVar11 = vperm2f128_avx(auVar192,auVar198,2);
      auVar9 = vperm2f128_avx(auVar10,auVar127,0x13);
      auVar12 = vperm2f128_avx(auVar10,auVar127,2);
      auVar14 = vpermilps_avx(auVar369,0xff);
      auVar15 = vpermilps_avx(auVar369,0xaa);
      auVar16 = vpermilps_avx(auVar369,0x55);
      auVar122 = vpermilps_avx(auVar369,0);
      fVar412 = auVar9._0_4_;
      fVar211 = auVar122._0_4_;
      fVar426 = auVar9._4_4_;
      fVar212 = auVar122._4_4_;
      fVar435 = auVar9._8_4_;
      fVar213 = auVar122._8_4_;
      fVar452 = auVar9._12_4_;
      fVar247 = auVar122._12_4_;
      fVar455 = auVar9._16_4_;
      fVar248 = auVar122._16_4_;
      fVar469 = auVar9._20_4_;
      fVar249 = auVar122._20_4_;
      fVar181 = auVar9._24_4_;
      fVar250 = auVar122._24_4_;
      fVar424 = auVar260._0_4_;
      fVar264 = auVar16._0_4_;
      fVar427 = auVar260._4_4_;
      fVar265 = auVar16._4_4_;
      fVar436 = auVar260._8_4_;
      fVar266 = auVar16._8_4_;
      fVar453 = auVar260._12_4_;
      fVar267 = auVar16._12_4_;
      fVar467 = auVar260._16_4_;
      fVar277 = auVar16._16_4_;
      fVar115 = auVar260._20_4_;
      fVar278 = auVar16._20_4_;
      fVar182 = auVar260._24_4_;
      fVar279 = auVar16._24_4_;
      fVar425 = auVar193._0_4_;
      fVar280 = auVar15._0_4_;
      fVar434 = auVar193._4_4_;
      fVar302 = auVar15._4_4_;
      fVar437 = auVar193._8_4_;
      fVar303 = auVar15._8_4_;
      fVar454 = auVar193._12_4_;
      fVar304 = auVar15._12_4_;
      fVar468 = auVar193._16_4_;
      fVar305 = auVar15._16_4_;
      fVar180 = auVar193._20_4_;
      fVar328 = auVar15._20_4_;
      fVar184 = auVar193._24_4_;
      fVar329 = auVar15._24_4_;
      auVar418._0_4_ = fVar280 * fVar425 + fVar264 * fVar424 + fVar211 * fVar412;
      auVar418._4_4_ = fVar302 * fVar434 + fVar265 * fVar427 + fVar212 * fVar426;
      auVar418._8_4_ = fVar303 * fVar437 + fVar266 * fVar436 + fVar213 * fVar435;
      auVar418._12_4_ = fVar304 * fVar454 + fVar267 * fVar453 + fVar247 * fVar452;
      auVar418._16_4_ = fVar305 * fVar468 + fVar277 * fVar467 + fVar248 * fVar455;
      auVar418._20_4_ = fVar328 * fVar180 + fVar278 * fVar115 + fVar249 * fVar469;
      auVar418._24_4_ = fVar329 * fVar184 + fVar279 * fVar182 + fVar250 * fVar181;
      auVar418._28_4_ = auVar13._28_4_ + auVar192._28_4_ + auVar10._28_4_;
      auVar25._4_4_ = fVar265 * fVar426;
      auVar25._0_4_ = fVar264 * fVar412;
      auVar25._8_4_ = fVar266 * fVar435;
      auVar25._12_4_ = fVar267 * fVar452;
      auVar25._16_4_ = fVar277 * fVar455;
      auVar25._20_4_ = fVar278 * fVar469;
      auVar25._24_4_ = fVar279 * fVar181;
      auVar25._28_4_ = auVar192._28_4_;
      fVar330 = auVar14._0_4_;
      fVar331 = auVar14._4_4_;
      fVar342 = auVar14._8_4_;
      fVar343 = auVar14._12_4_;
      fVar344 = auVar14._16_4_;
      fVar346 = auVar14._20_4_;
      fVar378 = auVar14._24_4_;
      auVar445._0_4_ = fVar211 * fVar425 + fVar330 * fVar424;
      auVar445._4_4_ = fVar212 * fVar434 + fVar331 * fVar427;
      auVar445._8_4_ = fVar213 * fVar437 + fVar342 * fVar436;
      auVar445._12_4_ = fVar247 * fVar454 + fVar343 * fVar453;
      auVar445._16_4_ = fVar248 * fVar468 + fVar344 * fVar467;
      auVar445._20_4_ = fVar249 * fVar180 + fVar346 * fVar115;
      auVar445._24_4_ = fVar250 * fVar184 + fVar378 * fVar182;
      auVar445._28_4_ = fVar210 + auVar13._28_4_;
      auVar9 = vsubps_avx(auVar25,auVar445);
      auVar26._4_4_ = fVar302 * fVar426;
      auVar26._0_4_ = fVar280 * fVar412;
      auVar26._8_4_ = fVar303 * fVar435;
      auVar26._12_4_ = fVar304 * fVar452;
      auVar26._16_4_ = fVar305 * fVar455;
      auVar26._20_4_ = fVar328 * fVar469;
      auVar26._24_4_ = fVar329 * fVar181;
      auVar26._28_4_ = auVar445._28_4_;
      auVar27._4_4_ = fVar212 * fVar427;
      auVar27._0_4_ = fVar211 * fVar424;
      auVar27._8_4_ = fVar213 * fVar436;
      auVar27._12_4_ = fVar247 * fVar453;
      auVar27._16_4_ = fVar248 * fVar467;
      auVar27._20_4_ = fVar249 * fVar115;
      auVar27._24_4_ = fVar250 * fVar182;
      auVar27._28_4_ = fVar210;
      auVar10 = vsubps_avx(auVar26,auVar27);
      auVar446._0_4_ = auVar10._0_4_ + fVar330 * fVar425;
      auVar446._4_4_ = auVar10._4_4_ + fVar331 * fVar434;
      auVar446._8_4_ = auVar10._8_4_ + fVar342 * fVar437;
      auVar446._12_4_ = auVar10._12_4_ + fVar343 * fVar454;
      auVar446._16_4_ = auVar10._16_4_ + fVar344 * fVar468;
      auVar446._20_4_ = auVar10._20_4_ + fVar346 * fVar180;
      auVar446._24_4_ = auVar10._24_4_ + fVar378 * fVar184;
      auVar446._28_4_ = auVar10._28_4_ + fVar210;
      auVar28._4_4_ = fVar302 * fVar427;
      auVar28._0_4_ = fVar280 * fVar424;
      auVar28._8_4_ = fVar303 * fVar436;
      auVar28._12_4_ = fVar304 * fVar453;
      auVar28._16_4_ = fVar305 * fVar467;
      auVar28._20_4_ = fVar328 * fVar115;
      auVar28._24_4_ = fVar329 * fVar182;
      auVar28._28_4_ = auVar260._28_4_;
      auVar461._0_4_ = fVar330 * fVar412 + fVar264 * fVar425;
      auVar461._4_4_ = fVar331 * fVar426 + fVar265 * fVar434;
      auVar461._8_4_ = fVar342 * fVar435 + fVar266 * fVar437;
      auVar461._12_4_ = fVar343 * fVar452 + fVar267 * fVar454;
      auVar461._16_4_ = fVar344 * fVar455 + fVar277 * fVar468;
      auVar461._20_4_ = fVar346 * fVar469 + fVar278 * fVar180;
      auVar461._24_4_ = fVar378 * fVar181 + fVar279 * fVar184;
      auVar461._28_4_ = fVar210 + auVar193._28_4_;
      auVar10 = vsubps_avx(auVar461,auVar28);
      auVar93._4_4_ = fStack_114;
      auVar93._0_4_ = fStack_118;
      auVar93._8_4_ = local_110;
      auVar93._12_4_ = fStack_10c;
      auVar199._16_16_ = auVar93;
      auVar199._0_16_ = auVar93;
      auVar260 = vpermilps_avx(auVar199,0xff);
      auVar192 = vpermilps_avx(auVar199,0xaa);
      auVar193 = vpermilps_avx(auVar199,0);
      fVar436 = auVar12._0_4_ * auVar193._0_4_;
      fVar437 = auVar12._4_4_ * auVar193._4_4_;
      auVar29._4_4_ = fVar437;
      auVar29._0_4_ = fVar436;
      fVar452 = auVar12._8_4_ * auVar193._8_4_;
      auVar29._8_4_ = fVar452;
      fVar453 = auVar12._12_4_ * auVar193._12_4_;
      auVar29._12_4_ = fVar453;
      fVar454 = auVar12._16_4_ * auVar193._16_4_;
      auVar29._16_4_ = fVar454;
      fVar455 = auVar12._20_4_ * auVar193._20_4_;
      auVar29._20_4_ = fVar455;
      fVar467 = auVar12._24_4_ * auVar193._24_4_;
      auVar29._24_4_ = fVar467;
      auVar29._28_4_ = auVar14._28_4_;
      fVar412 = auVar363._0_4_ * auVar193._0_4_;
      fVar424 = auVar363._4_4_ * auVar193._4_4_;
      auVar30._4_4_ = fVar424;
      auVar30._0_4_ = fVar412;
      fVar425 = auVar363._8_4_ * auVar193._8_4_;
      auVar30._8_4_ = fVar425;
      fVar426 = auVar363._12_4_ * auVar193._12_4_;
      auVar30._12_4_ = fVar426;
      fVar427 = auVar363._16_4_ * auVar193._16_4_;
      auVar30._16_4_ = fVar427;
      fVar434 = auVar363._20_4_ * auVar193._20_4_;
      auVar30._20_4_ = fVar434;
      fVar435 = auVar363._24_4_ * auVar193._24_4_;
      auVar30._24_4_ = fVar435;
      auVar30._28_4_ = auVar363._28_4_;
      auVar409._0_4_ = fVar436 + fVar412;
      auVar409._4_4_ = fVar437 + fVar424;
      auVar409._8_4_ = fVar452 + fVar425;
      auVar409._12_4_ = fVar453 + fVar426;
      auVar409._16_4_ = fVar454 + fVar427;
      auVar409._20_4_ = fVar455 + fVar434;
      auVar409._24_4_ = fVar467 + fVar435;
      auVar409._28_4_ = auVar14._28_4_ + auVar363._28_4_;
      auVar193 = vsubps_avx(auVar29,auVar30);
      auVar338._0_4_ = auVar11._0_4_ * auVar192._0_4_;
      auVar338._4_4_ = auVar11._4_4_ * auVar192._4_4_;
      auVar338._8_4_ = auVar11._8_4_ * auVar192._8_4_;
      auVar338._12_4_ = auVar11._12_4_ * auVar192._12_4_;
      auVar338._16_4_ = auVar11._16_4_ * auVar192._16_4_;
      auVar338._20_4_ = auVar11._20_4_ * auVar192._20_4_;
      auVar338._24_4_ = auVar11._24_4_ * auVar192._24_4_;
      auVar338._28_36_ = auVar345;
      auVar370._0_4_ = auVar409._0_4_ + auVar338._0_4_;
      auVar370._4_4_ = auVar409._4_4_ + auVar338._4_4_;
      auVar370._8_4_ = auVar409._8_4_ + auVar338._8_4_;
      auVar370._12_4_ = auVar409._12_4_ + auVar338._12_4_;
      auVar370._16_4_ = auVar409._16_4_ + auVar338._16_4_;
      auVar370._20_4_ = auVar409._20_4_ + auVar338._20_4_;
      auVar370._24_4_ = auVar409._24_4_ + auVar338._24_4_;
      fVar412 = auVar345._0_4_;
      auVar370._28_4_ = auVar409._28_4_ + fVar412;
      auVar363 = vsubps_avx(auVar409,auVar338._0_32_);
      fVar424 = auVar11._0_4_ * auVar260._0_4_;
      fVar425 = auVar11._4_4_ * auVar260._4_4_;
      auVar31._4_4_ = fVar425;
      auVar31._0_4_ = fVar424;
      fVar426 = auVar11._8_4_ * auVar260._8_4_;
      auVar31._8_4_ = fVar426;
      fVar427 = auVar11._12_4_ * auVar260._12_4_;
      auVar31._12_4_ = fVar427;
      fVar434 = auVar11._16_4_ * auVar260._16_4_;
      auVar31._16_4_ = fVar434;
      fVar435 = auVar11._20_4_ * auVar260._20_4_;
      auVar31._20_4_ = fVar435;
      fVar436 = auVar11._24_4_ * auVar260._24_4_;
      auVar31._24_4_ = fVar436;
      auVar31._28_4_ = fVar412;
      auVar391._0_4_ = auVar193._0_4_ + fVar424;
      auVar391._4_4_ = auVar193._4_4_ + fVar425;
      auVar391._8_4_ = auVar193._8_4_ + fVar426;
      auVar391._12_4_ = auVar193._12_4_ + fVar427;
      auVar391._16_4_ = auVar193._16_4_ + fVar434;
      auVar391._20_4_ = auVar193._20_4_ + fVar435;
      auVar391._24_4_ = auVar193._24_4_ + fVar436;
      auVar391._28_4_ = auVar193._28_4_ + fVar412;
      auVar193 = vsubps_avx(auVar193,auVar31);
      auVar260 = vsubps_avx(auVar370,auVar418);
      auVar11 = vsubps_avx(auVar391,auVar9);
      auVar12 = vsubps_avx(auVar193,auVar446);
      auVar192 = vsubps_avx(auVar363,auVar10);
      *(float *)(undefined1 *)local_150._buffer = auVar370._0_4_ + auVar418._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar370._4_4_ + auVar418._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar370._8_4_ + auVar418._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar370._12_4_ + auVar418._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar370._16_4_ + auVar418._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar370._20_4_ + auVar418._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar370._24_4_ + auVar418._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar370._28_4_ + auVar418._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar391._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar391._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar391._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar391._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar391._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar391._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar391._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar391._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar193._0_4_ + auVar446._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar193._4_4_ + auVar446._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar193._8_4_ + auVar446._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar193._12_4_ + auVar446._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar193._16_4_ + auVar446._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar193._20_4_ + auVar446._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar193._24_4_ + auVar446._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar193._28_4_ + auVar446._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar363._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar363._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar363._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar363._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar363._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar363._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar363._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar363._28_4_ + auVar10._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar192;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar11;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar260;
      auVar139 = ZEXT1664(auVar260._0_16_);
      auVar169 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"5x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar171._0_8_ = std::ostream::flush();
    auVar171._8_56_ = extraout_var_31;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x28) {
          auVar170._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar170._8_56_ = extraout_var_32;
          auVar171._4_60_ = auVar170._4_60_;
          auVar171._0_4_ = (float)auVar170._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar171._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar171._0_16_ = ZEXT816(0);
        }
        auVar345 = auVar139._28_36_;
        local_140._buffer[uVar112] = auVar171._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar447._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar447._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar462._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar462._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar447,auVar462);
      auVar9 = vunpckhpd_avx(auVar447,auVar462);
      auVar193 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar363 = vunpcklpd_avx(auVar193,auVar9);
      auVar9 = vunpckhpd_avx(auVar193,auVar9);
      auVar419._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar419._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar431._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar431._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar193 = vunpcklpd_avx(auVar419,auVar431);
      auVar10 = vunpckhpd_avx(auVar419,auVar431);
      auVar11 = vunpcklps_avx(auVar193,auVar10);
      auVar10 = vunpckhps_avx(auVar193,auVar10);
      auVar260 = vunpcklpd_avx(auVar11,auVar10);
      auVar10 = vunpckhpd_avx(auVar11,auVar10);
      auVar402._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xa0);
      auVar402._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x80);
      auVar410._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0xb0);
      auVar410._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x90);
      auVar11 = vunpcklpd_avx(auVar402,auVar410);
      auVar193 = vunpckhpd_avx(auVar402,auVar410);
      auVar12 = vunpcklps_avx(auVar11,auVar193);
      auVar193 = vunpckhps_avx(auVar11,auVar193);
      auVar11 = vunpcklpd_avx(auVar12,auVar193);
      auVar193 = vunpckhpd_avx(auVar12,auVar193);
      auVar12 = vpermilps_avx(auVar363,0);
      auVar192 = vpermilps_avx(auVar363,0x55);
      auVar13 = vpermilps_avx(auVar363,0xaa);
      auVar363 = vpermilps_avx(auVar363,0xff);
      auVar128._0_4_ =
           local_120 * auVar12._0_4_ + local_110 * auVar192._0_4_ +
           local_100 * auVar13._0_4_ + local_f0 * auVar363._0_4_;
      auVar128._4_4_ =
           fStack_11c * auVar12._4_4_ + fStack_10c * auVar192._4_4_ +
           fStack_fc * auVar13._4_4_ + fStack_ec * auVar363._4_4_;
      auVar128._8_4_ =
           fStack_118 * auVar12._8_4_ + fStack_108 * auVar192._8_4_ +
           fStack_f8 * auVar13._8_4_ + fStack_e8 * auVar363._8_4_;
      auVar128._12_4_ =
           fStack_114 * auVar12._12_4_ + fStack_104 * auVar192._12_4_ +
           fStack_f4 * auVar13._12_4_ + fStack_e4 * auVar363._12_4_;
      auVar128._16_4_ =
           local_120 * auVar12._16_4_ + local_110 * auVar192._16_4_ +
           local_100 * auVar13._16_4_ + local_f0 * auVar363._16_4_;
      auVar128._20_4_ =
           fStack_11c * auVar12._20_4_ + fStack_10c * auVar192._20_4_ +
           fStack_fc * auVar13._20_4_ + fStack_ec * auVar363._20_4_;
      auVar128._24_4_ =
           fStack_118 * auVar12._24_4_ + fStack_108 * auVar192._24_4_ +
           fStack_f8 * auVar13._24_4_ + fStack_e8 * auVar363._24_4_;
      auVar128._28_4_ = auVar12._28_4_ + auVar192._28_4_ + auVar13._28_4_ + auVar363._28_4_;
      auVar363 = vpermilps_avx(auVar260,0);
      auVar12 = vpermilps_avx(auVar260,0x55);
      auVar192 = vpermilps_avx(auVar260,0xaa);
      auVar260 = vpermilps_avx(auVar260,0xff);
      auVar200._0_4_ =
           local_120 * auVar363._0_4_ + local_110 * auVar12._0_4_ +
           local_100 * auVar192._0_4_ + local_f0 * auVar260._0_4_;
      auVar200._4_4_ =
           fStack_11c * auVar363._4_4_ + fStack_10c * auVar12._4_4_ +
           fStack_fc * auVar192._4_4_ + fStack_ec * auVar260._4_4_;
      auVar200._8_4_ =
           fStack_118 * auVar363._8_4_ + fStack_108 * auVar12._8_4_ +
           fStack_f8 * auVar192._8_4_ + fStack_e8 * auVar260._8_4_;
      auVar200._12_4_ =
           fStack_114 * auVar363._12_4_ + fStack_104 * auVar12._12_4_ +
           fStack_f4 * auVar192._12_4_ + fStack_e4 * auVar260._12_4_;
      auVar200._16_4_ =
           local_120 * auVar363._16_4_ + local_110 * auVar12._16_4_ +
           local_100 * auVar192._16_4_ + local_f0 * auVar260._16_4_;
      auVar200._20_4_ =
           fStack_11c * auVar363._20_4_ + fStack_10c * auVar12._20_4_ +
           fStack_fc * auVar192._20_4_ + fStack_ec * auVar260._20_4_;
      auVar200._24_4_ =
           fStack_118 * auVar363._24_4_ + fStack_108 * auVar12._24_4_ +
           fStack_f8 * auVar192._24_4_ + fStack_e8 * auVar260._24_4_;
      auVar200._28_4_ = auVar363._28_4_ + auVar12._28_4_ + auVar192._28_4_ + auVar260._28_4_;
      auVar363 = vpermilps_avx(auVar11,0);
      auVar260 = vpermilps_avx(auVar11,0x55);
      auVar12 = vpermilps_avx(auVar11,0xaa);
      auVar11 = vpermilps_avx(auVar11,0xff);
      auVar243._0_4_ =
           local_120 * auVar363._0_4_ + local_110 * auVar260._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar11._0_4_;
      auVar243._4_4_ =
           fStack_11c * auVar363._4_4_ + fStack_10c * auVar260._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar11._4_4_;
      auVar243._8_4_ =
           fStack_118 * auVar363._8_4_ + fStack_108 * auVar260._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar11._8_4_;
      auVar243._12_4_ =
           fStack_114 * auVar363._12_4_ + fStack_104 * auVar260._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar11._12_4_;
      auVar243._16_4_ =
           local_120 * auVar363._16_4_ + local_110 * auVar260._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar11._16_4_;
      auVar243._20_4_ =
           fStack_11c * auVar363._20_4_ + fStack_10c * auVar260._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar11._20_4_;
      auVar243._24_4_ =
           fStack_118 * auVar363._24_4_ + fStack_108 * auVar260._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar11._24_4_;
      auVar243._28_4_ = auVar363._28_4_ + auVar260._28_4_ + auVar12._28_4_ + auVar11._28_4_;
      auVar101._4_4_ = fStack_dc;
      auVar101._0_4_ = local_e0;
      auVar101._8_4_ = fStack_d8;
      auVar101._12_4_ = fStack_d4;
      auVar371._16_16_ = auVar101;
      auVar371._0_16_ = auVar101;
      auVar363 = vpermilps_avx(auVar9,0);
      auVar260 = vpermilps_avx(auVar9,0x55);
      auVar11 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar272._0_4_ =
           local_e0 * auVar363._0_4_ + local_d0 * auVar260._0_4_ +
           local_c0 * auVar11._0_4_ + local_b0 * auVar9._0_4_;
      auVar272._4_4_ =
           fStack_dc * auVar363._4_4_ + fStack_cc * auVar260._4_4_ +
           fStack_bc * auVar11._4_4_ + fStack_ac * auVar9._4_4_;
      auVar272._8_4_ =
           fStack_d8 * auVar363._8_4_ + fStack_c8 * auVar260._8_4_ +
           fStack_b8 * auVar11._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar272._12_4_ =
           fStack_d4 * auVar363._12_4_ + fStack_c4 * auVar260._12_4_ +
           fStack_b4 * auVar11._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar272._16_4_ =
           local_e0 * auVar363._16_4_ + local_d0 * auVar260._16_4_ +
           local_c0 * auVar11._16_4_ + local_b0 * auVar9._16_4_;
      auVar272._20_4_ =
           fStack_dc * auVar363._20_4_ + fStack_cc * auVar260._20_4_ +
           fStack_bc * auVar11._20_4_ + fStack_ac * auVar9._20_4_;
      auVar272._24_4_ =
           fStack_d8 * auVar363._24_4_ + fStack_c8 * auVar260._24_4_ +
           fStack_b8 * auVar11._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar272._28_4_ = auVar363._28_4_ + auVar260._28_4_ + auVar11._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar363 = vpermilps_avx(auVar10,0x55);
      auVar260 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar299._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar363._0_4_ +
           local_c0 * auVar260._0_4_ + local_b0 * auVar10._0_4_;
      auVar299._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar363._4_4_ +
           fStack_bc * auVar260._4_4_ + fStack_ac * auVar10._4_4_;
      auVar299._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar363._8_4_ +
           fStack_b8 * auVar260._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar299._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar363._12_4_ +
           fStack_b4 * auVar260._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar299._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar363._16_4_ +
           local_c0 * auVar260._16_4_ + local_b0 * auVar10._16_4_;
      auVar299._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar363._20_4_ +
           fStack_bc * auVar260._20_4_ + fStack_ac * auVar10._20_4_;
      auVar299._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar363._24_4_ +
           fStack_b8 * auVar260._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar299._28_4_ = auVar9._28_4_ + auVar363._28_4_ + auVar260._28_4_ + auVar10._28_4_;
      auVar9 = vpermilps_avx(auVar193,0);
      auVar10 = vpermilps_avx(auVar193,0x55);
      auVar363 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0xff);
      fVar468 = auVar193._28_4_;
      auVar327._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar10._0_4_ +
           local_c0 * auVar363._0_4_ + local_b0 * auVar193._0_4_;
      auVar327._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar10._4_4_ +
           fStack_bc * auVar363._4_4_ + fStack_ac * auVar193._4_4_;
      auVar327._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar10._8_4_ +
           fStack_b8 * auVar363._8_4_ + fStack_a8 * auVar193._8_4_;
      auVar327._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar10._12_4_ +
           fStack_b4 * auVar363._12_4_ + fStack_a4 * auVar193._12_4_;
      auVar327._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar10._16_4_ +
           local_c0 * auVar363._16_4_ + local_b0 * auVar193._16_4_;
      auVar327._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar10._20_4_ +
           fStack_bc * auVar363._20_4_ + fStack_ac * auVar193._20_4_;
      auVar327._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar10._24_4_ +
           fStack_b8 * auVar363._24_4_ + fStack_a8 * auVar193._24_4_;
      auVar327._28_4_ = auVar9._28_4_ + auVar10._28_4_ + auVar363._28_4_ + fVar468;
      auVar9 = vsubps_avx(auVar128,auVar272);
      auVar129._0_4_ = auVar128._0_4_ + auVar272._0_4_;
      auVar129._4_4_ = auVar128._4_4_ + auVar272._4_4_;
      auVar129._8_4_ = auVar128._8_4_ + auVar272._8_4_;
      auVar129._12_4_ = auVar128._12_4_ + auVar272._12_4_;
      auVar129._16_4_ = auVar128._16_4_ + auVar272._16_4_;
      auVar129._20_4_ = auVar128._20_4_ + auVar272._20_4_;
      auVar129._24_4_ = auVar128._24_4_ + auVar272._24_4_;
      auVar129._28_4_ = auVar128._28_4_ + auVar272._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar200,auVar299);
      auVar201._0_4_ = auVar200._0_4_ + auVar299._0_4_;
      auVar201._4_4_ = auVar200._4_4_ + auVar299._4_4_;
      auVar201._8_4_ = auVar200._8_4_ + auVar299._8_4_;
      auVar201._12_4_ = auVar200._12_4_ + auVar299._12_4_;
      auVar201._16_4_ = auVar200._16_4_ + auVar299._16_4_;
      auVar201._20_4_ = auVar200._20_4_ + auVar299._20_4_;
      auVar201._24_4_ = auVar200._24_4_ + auVar299._24_4_;
      auVar201._28_4_ = auVar200._28_4_ + auVar299._28_4_;
      auVar12 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar243,auVar327);
      auVar244._0_4_ = auVar243._0_4_ + auVar327._0_4_;
      auVar244._4_4_ = auVar243._4_4_ + auVar327._4_4_;
      auVar244._8_4_ = auVar243._8_4_ + auVar327._8_4_;
      auVar244._12_4_ = auVar243._12_4_ + auVar327._12_4_;
      auVar244._16_4_ = auVar243._16_4_ + auVar327._16_4_;
      auVar244._20_4_ = auVar243._20_4_ + auVar327._20_4_;
      auVar244._24_4_ = auVar243._24_4_ + auVar327._24_4_;
      auVar244._28_4_ = auVar243._28_4_ + auVar327._28_4_;
      auVar192 = vpermilps_avx(auVar9,0x1b);
      auVar363 = vperm2f128_avx(auVar192,auVar244,2);
      auVar193 = vperm2f128_avx(auVar12,auVar201,0x13);
      auVar11 = vperm2f128_avx(auVar12,auVar201,2);
      auVar9 = vperm2f128_avx(auVar10,auVar129,0x13);
      auVar260 = vperm2f128_avx(auVar10,auVar129,2);
      auVar13 = vpermilps_avx(auVar371,0xff);
      auVar14 = vpermilps_avx(auVar371,0xaa);
      auVar15 = vpermilps_avx(auVar371,0x55);
      auVar16 = vpermilps_avx(auVar371,0);
      fVar412 = auVar9._0_4_;
      fVar425 = auVar9._4_4_;
      fVar427 = auVar9._8_4_;
      fVar435 = auVar9._12_4_;
      fVar437 = auVar9._16_4_;
      fVar453 = auVar9._20_4_;
      fVar455 = auVar9._24_4_;
      fVar424 = auVar193._0_4_;
      fVar426 = auVar193._4_4_;
      fVar434 = auVar193._8_4_;
      fVar436 = auVar193._12_4_;
      fVar452 = auVar193._16_4_;
      fVar454 = auVar193._20_4_;
      fVar467 = auVar193._24_4_;
      auVar420._0_4_ = auVar15._0_4_ * fVar424 + auVar16._0_4_ * fVar412;
      auVar420._4_4_ = auVar15._4_4_ * fVar426 + auVar16._4_4_ * fVar425;
      auVar420._8_4_ = auVar15._8_4_ * fVar434 + auVar16._8_4_ * fVar427;
      auVar420._12_4_ = auVar15._12_4_ * fVar436 + auVar16._12_4_ * fVar435;
      auVar420._16_4_ = auVar15._16_4_ * fVar452 + auVar16._16_4_ * fVar437;
      auVar420._20_4_ = auVar15._20_4_ * fVar454 + auVar16._20_4_ * fVar453;
      auVar420._24_4_ = auVar15._24_4_ * fVar467 + auVar16._24_4_ * fVar455;
      auVar420._28_4_ = auVar12._28_4_ + auVar10._28_4_;
      auVar32._4_4_ = auVar15._4_4_ * fVar425;
      auVar32._0_4_ = auVar15._0_4_ * fVar412;
      auVar32._8_4_ = auVar15._8_4_ * fVar427;
      auVar32._12_4_ = auVar15._12_4_ * fVar435;
      auVar32._16_4_ = auVar15._16_4_ * fVar437;
      auVar32._20_4_ = auVar15._20_4_ * fVar453;
      auVar32._24_4_ = auVar15._24_4_ * fVar455;
      auVar32._28_4_ = auVar12._28_4_;
      auVar33._4_4_ = auVar13._4_4_ * fVar426;
      auVar33._0_4_ = auVar13._0_4_ * fVar424;
      auVar33._8_4_ = auVar13._8_4_ * fVar434;
      auVar33._12_4_ = auVar13._12_4_ * fVar436;
      auVar33._16_4_ = auVar13._16_4_ * fVar452;
      auVar33._20_4_ = auVar13._20_4_ * fVar454;
      auVar33._24_4_ = auVar13._24_4_ * fVar467;
      auVar33._28_4_ = auVar192._28_4_;
      auVar9 = vsubps_avx(auVar32,auVar33);
      auVar34._4_4_ = auVar14._4_4_ * fVar425;
      auVar34._0_4_ = auVar14._0_4_ * fVar412;
      auVar34._8_4_ = auVar14._8_4_ * fVar427;
      auVar34._12_4_ = auVar14._12_4_ * fVar435;
      auVar34._16_4_ = auVar14._16_4_ * fVar437;
      auVar34._20_4_ = auVar14._20_4_ * fVar453;
      auVar34._24_4_ = auVar14._24_4_ * fVar455;
      auVar34._28_4_ = auVar192._28_4_;
      auVar35._4_4_ = auVar16._4_4_ * fVar426;
      auVar35._0_4_ = auVar16._0_4_ * fVar424;
      auVar35._8_4_ = auVar16._8_4_ * fVar434;
      auVar35._12_4_ = auVar16._12_4_ * fVar436;
      auVar35._16_4_ = auVar16._16_4_ * fVar452;
      auVar35._20_4_ = auVar16._20_4_ * fVar454;
      auVar35._24_4_ = auVar16._24_4_ * fVar467;
      auVar35._28_4_ = fVar468;
      auVar10 = vsubps_avx(auVar34,auVar35);
      auVar36._4_4_ = auVar13._4_4_ * fVar425;
      auVar36._0_4_ = auVar13._0_4_ * fVar412;
      auVar36._8_4_ = auVar13._8_4_ * fVar427;
      auVar36._12_4_ = auVar13._12_4_ * fVar435;
      auVar36._16_4_ = auVar13._16_4_ * fVar437;
      auVar36._20_4_ = auVar13._20_4_ * fVar453;
      auVar36._24_4_ = auVar13._24_4_ * fVar455;
      auVar36._28_4_ = fVar468;
      auVar37._4_4_ = auVar14._4_4_ * fVar426;
      auVar37._0_4_ = auVar14._0_4_ * fVar424;
      auVar37._8_4_ = auVar14._8_4_ * fVar434;
      auVar37._12_4_ = auVar14._12_4_ * fVar436;
      auVar37._16_4_ = auVar14._16_4_ * fVar452;
      auVar37._20_4_ = auVar14._20_4_ * fVar454;
      auVar37._24_4_ = auVar14._24_4_ * fVar467;
      auVar37._28_4_ = auVar193._28_4_;
      auVar193 = vsubps_avx(auVar36,auVar37);
      auVar94._4_4_ = fStack_114;
      auVar94._0_4_ = fStack_118;
      auVar94._8_4_ = local_110;
      auVar94._12_4_ = fStack_10c;
      auVar202._16_16_ = auVar94;
      auVar202._0_16_ = auVar94;
      auVar12 = vpermilps_avx(auVar202,0xff);
      auVar192 = vpermilps_avx(auVar202,0xaa);
      auVar14 = vpermilps_avx(auVar202,0);
      fVar436 = auVar260._0_4_ * auVar14._0_4_;
      fVar437 = auVar260._4_4_ * auVar14._4_4_;
      auVar38._4_4_ = fVar437;
      auVar38._0_4_ = fVar436;
      fVar452 = auVar260._8_4_ * auVar14._8_4_;
      auVar38._8_4_ = fVar452;
      fVar453 = auVar260._12_4_ * auVar14._12_4_;
      auVar38._12_4_ = fVar453;
      fVar454 = auVar260._16_4_ * auVar14._16_4_;
      auVar38._16_4_ = fVar454;
      fVar455 = auVar260._20_4_ * auVar14._20_4_;
      auVar38._20_4_ = fVar455;
      fVar467 = auVar260._24_4_ * auVar14._24_4_;
      auVar38._24_4_ = fVar467;
      auVar38._28_4_ = auVar13._28_4_;
      fVar412 = auVar363._0_4_ * auVar14._0_4_;
      fVar424 = auVar363._4_4_ * auVar14._4_4_;
      auVar39._4_4_ = fVar424;
      auVar39._0_4_ = fVar412;
      fVar425 = auVar363._8_4_ * auVar14._8_4_;
      auVar39._8_4_ = fVar425;
      fVar426 = auVar363._12_4_ * auVar14._12_4_;
      auVar39._12_4_ = fVar426;
      fVar427 = auVar363._16_4_ * auVar14._16_4_;
      auVar39._16_4_ = fVar427;
      fVar434 = auVar363._20_4_ * auVar14._20_4_;
      auVar39._20_4_ = fVar434;
      fVar435 = auVar363._24_4_ * auVar14._24_4_;
      auVar39._24_4_ = fVar435;
      auVar39._28_4_ = auVar363._28_4_;
      auVar411._0_4_ = fVar436 + fVar412;
      auVar411._4_4_ = fVar437 + fVar424;
      auVar411._8_4_ = fVar452 + fVar425;
      auVar411._12_4_ = fVar453 + fVar426;
      auVar411._16_4_ = fVar454 + fVar427;
      auVar411._20_4_ = fVar455 + fVar434;
      auVar411._24_4_ = fVar467 + fVar435;
      auVar411._28_4_ = auVar13._28_4_ + auVar363._28_4_;
      auVar363 = vsubps_avx(auVar38,auVar39);
      auVar339._0_4_ = auVar11._0_4_ * auVar192._0_4_;
      auVar339._4_4_ = auVar11._4_4_ * auVar192._4_4_;
      auVar339._8_4_ = auVar11._8_4_ * auVar192._8_4_;
      auVar339._12_4_ = auVar11._12_4_ * auVar192._12_4_;
      auVar339._16_4_ = auVar11._16_4_ * auVar192._16_4_;
      auVar339._20_4_ = auVar11._20_4_ * auVar192._20_4_;
      auVar339._24_4_ = auVar11._24_4_ * auVar192._24_4_;
      auVar339._28_36_ = auVar345;
      auVar372._0_4_ = auVar411._0_4_ + auVar339._0_4_;
      auVar372._4_4_ = auVar411._4_4_ + auVar339._4_4_;
      auVar372._8_4_ = auVar411._8_4_ + auVar339._8_4_;
      auVar372._12_4_ = auVar411._12_4_ + auVar339._12_4_;
      auVar372._16_4_ = auVar411._16_4_ + auVar339._16_4_;
      auVar372._20_4_ = auVar411._20_4_ + auVar339._20_4_;
      auVar372._24_4_ = auVar411._24_4_ + auVar339._24_4_;
      fVar412 = auVar345._0_4_;
      auVar372._28_4_ = auVar411._28_4_ + fVar412;
      auVar260 = vsubps_avx(auVar411,auVar339._0_32_);
      fVar424 = auVar11._0_4_ * auVar12._0_4_;
      fVar425 = auVar11._4_4_ * auVar12._4_4_;
      auVar40._4_4_ = fVar425;
      auVar40._0_4_ = fVar424;
      fVar426 = auVar11._8_4_ * auVar12._8_4_;
      auVar40._8_4_ = fVar426;
      fVar427 = auVar11._12_4_ * auVar12._12_4_;
      auVar40._12_4_ = fVar427;
      fVar434 = auVar11._16_4_ * auVar12._16_4_;
      auVar40._16_4_ = fVar434;
      fVar435 = auVar11._20_4_ * auVar12._20_4_;
      auVar40._20_4_ = fVar435;
      fVar436 = auVar11._24_4_ * auVar12._24_4_;
      auVar40._24_4_ = fVar436;
      auVar40._28_4_ = fVar412;
      auVar392._0_4_ = auVar363._0_4_ + fVar424;
      auVar392._4_4_ = auVar363._4_4_ + fVar425;
      auVar392._8_4_ = auVar363._8_4_ + fVar426;
      auVar392._12_4_ = auVar363._12_4_ + fVar427;
      auVar392._16_4_ = auVar363._16_4_ + fVar434;
      auVar392._20_4_ = auVar363._20_4_ + fVar435;
      auVar392._24_4_ = auVar363._24_4_ + fVar436;
      auVar392._28_4_ = auVar363._28_4_ + fVar412;
      auVar363 = vsubps_avx(auVar363,auVar40);
      auVar11 = vsubps_avx(auVar372,auVar420);
      auVar12 = vsubps_avx(auVar392,auVar9);
      auVar192 = vsubps_avx(auVar363,auVar10);
      auVar13 = vsubps_avx(auVar260,auVar193);
      *(float *)(undefined1 *)local_150._buffer = auVar372._0_4_ + auVar420._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar372._4_4_ + auVar420._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar372._8_4_ + auVar420._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar372._12_4_ + auVar420._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar372._16_4_ + auVar420._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar372._20_4_ + auVar420._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar372._24_4_ + auVar420._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar372._28_4_ + auVar420._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar392._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar392._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar392._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar392._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar392._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar392._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar392._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar392._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar363._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar363._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar363._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar363._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar363._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar363._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar363._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar363._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar260._0_4_ + auVar193._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar260._4_4_ + auVar193._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar260._8_4_ + auVar193._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar260._12_4_ + auVar193._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar260._16_4_ + auVar193._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar260._20_4_ + auVar193._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar260._24_4_ + auVar193._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar260._28_4_ + auVar193._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar192;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar11;
      auVar139 = ZEXT1664(auVar11._0_16_);
      auVar171 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar173._0_8_ = std::ostream::flush();
    auVar173._8_56_ = extraout_var_33;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x20) {
          auVar172._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar172._8_56_ = extraout_var_34;
          auVar173._4_60_ = auVar172._4_60_;
          auVar173._0_4_ = (float)auVar172._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar173._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar173._0_16_ = ZEXT816(0);
        }
        auVar345 = auVar139._28_36_;
        local_140._buffer[uVar112] = auVar173._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar448._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar448._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar463._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar463._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar448,auVar463);
      auVar9 = vunpckhpd_avx(auVar448,auVar463);
      auVar363 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar193 = vunpcklpd_avx(auVar363,auVar9);
      auVar9 = vunpckhpd_avx(auVar363,auVar9);
      auVar421._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar421._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar432._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar432._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar363 = vunpcklpd_avx(auVar421,auVar432);
      auVar10 = vunpckhpd_avx(auVar421,auVar432);
      auVar260 = vunpcklps_avx(auVar363,auVar10);
      auVar10 = vunpckhps_avx(auVar363,auVar10);
      auVar363 = vunpcklpd_avx(auVar260,auVar10);
      auVar10 = vunpckhpd_avx(auVar260,auVar10);
      auVar260 = vpermilps_avx(auVar193,0);
      auVar11 = vpermilps_avx(auVar193,0x55);
      auVar12 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0xff);
      auVar130._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar11._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar193._0_4_;
      auVar130._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar11._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar193._4_4_;
      auVar130._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar11._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar193._8_4_;
      auVar130._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar11._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar193._12_4_;
      auVar130._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar11._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar193._16_4_;
      auVar130._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar11._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar193._20_4_;
      auVar130._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar11._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar193._24_4_;
      auVar130._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar193._28_4_;
      auVar193 = vpermilps_avx(auVar363,0);
      auVar260 = vpermilps_avx(auVar363,0x55);
      auVar11 = vpermilps_avx(auVar363,0xaa);
      auVar363 = vpermilps_avx(auVar363,0xff);
      auVar203._0_4_ =
           local_120 * auVar193._0_4_ + local_110 * auVar260._0_4_ +
           local_100 * auVar11._0_4_ + local_f0 * auVar363._0_4_;
      auVar203._4_4_ =
           fStack_11c * auVar193._4_4_ + fStack_10c * auVar260._4_4_ +
           fStack_fc * auVar11._4_4_ + fStack_ec * auVar363._4_4_;
      auVar203._8_4_ =
           fStack_118 * auVar193._8_4_ + fStack_108 * auVar260._8_4_ +
           fStack_f8 * auVar11._8_4_ + fStack_e8 * auVar363._8_4_;
      auVar203._12_4_ =
           fStack_114 * auVar193._12_4_ + fStack_104 * auVar260._12_4_ +
           fStack_f4 * auVar11._12_4_ + fStack_e4 * auVar363._12_4_;
      auVar203._16_4_ =
           local_120 * auVar193._16_4_ + local_110 * auVar260._16_4_ +
           local_100 * auVar11._16_4_ + local_f0 * auVar363._16_4_;
      auVar203._20_4_ =
           fStack_11c * auVar193._20_4_ + fStack_10c * auVar260._20_4_ +
           fStack_fc * auVar11._20_4_ + fStack_ec * auVar363._20_4_;
      auVar203._24_4_ =
           fStack_118 * auVar193._24_4_ + fStack_108 * auVar260._24_4_ +
           fStack_f8 * auVar11._24_4_ + fStack_e8 * auVar363._24_4_;
      auVar203._28_4_ = auVar193._28_4_ + auVar260._28_4_ + auVar11._28_4_ + auVar363._28_4_;
      auVar102._4_4_ = fStack_dc;
      auVar102._0_4_ = local_e0;
      auVar102._8_4_ = fStack_d8;
      auVar102._12_4_ = fStack_d4;
      auVar373._16_16_ = auVar102;
      auVar373._0_16_ = auVar102;
      auVar193 = vpermilps_avx(auVar9,0);
      auVar363 = vpermilps_avx(auVar9,0x55);
      auVar260 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar273._0_4_ =
           local_e0 * auVar193._0_4_ + local_d0 * auVar363._0_4_ +
           local_c0 * auVar260._0_4_ + local_b0 * auVar9._0_4_;
      auVar273._4_4_ =
           fStack_dc * auVar193._4_4_ + fStack_cc * auVar363._4_4_ +
           fStack_bc * auVar260._4_4_ + fStack_ac * auVar9._4_4_;
      auVar273._8_4_ =
           fStack_d8 * auVar193._8_4_ + fStack_c8 * auVar363._8_4_ +
           fStack_b8 * auVar260._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar273._12_4_ =
           fStack_d4 * auVar193._12_4_ + fStack_c4 * auVar363._12_4_ +
           fStack_b4 * auVar260._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar273._16_4_ =
           local_e0 * auVar193._16_4_ + local_d0 * auVar363._16_4_ +
           local_c0 * auVar260._16_4_ + local_b0 * auVar9._16_4_;
      auVar273._20_4_ =
           fStack_dc * auVar193._20_4_ + fStack_cc * auVar363._20_4_ +
           fStack_bc * auVar260._20_4_ + fStack_ac * auVar9._20_4_;
      auVar273._24_4_ =
           fStack_d8 * auVar193._24_4_ + fStack_c8 * auVar363._24_4_ +
           fStack_b8 * auVar260._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar273._28_4_ = auVar193._28_4_ + auVar363._28_4_ + auVar260._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar193 = vpermilps_avx(auVar10,0x55);
      auVar363 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar468 = auVar10._28_4_;
      fVar469 = auVar363._28_4_ + fVar468;
      auVar300._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar193._0_4_ +
           local_c0 * auVar363._0_4_ + local_b0 * auVar10._0_4_;
      auVar300._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar193._4_4_ +
           fStack_bc * auVar363._4_4_ + fStack_ac * auVar10._4_4_;
      auVar300._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar193._8_4_ +
           fStack_b8 * auVar363._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar300._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar193._12_4_ +
           fStack_b4 * auVar363._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar300._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar193._16_4_ +
           local_c0 * auVar363._16_4_ + local_b0 * auVar10._16_4_;
      auVar300._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar193._20_4_ +
           fStack_bc * auVar363._20_4_ + fStack_ac * auVar10._20_4_;
      auVar300._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar193._24_4_ +
           fStack_b8 * auVar363._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar300._28_4_ = auVar9._28_4_ + auVar193._28_4_ + fVar469;
      auVar9 = vsubps_avx(auVar130,auVar273);
      auVar131._0_4_ = auVar130._0_4_ + auVar273._0_4_;
      auVar131._4_4_ = auVar130._4_4_ + auVar273._4_4_;
      auVar131._8_4_ = auVar130._8_4_ + auVar273._8_4_;
      auVar131._12_4_ = auVar130._12_4_ + auVar273._12_4_;
      auVar131._16_4_ = auVar130._16_4_ + auVar273._16_4_;
      auVar131._20_4_ = auVar130._20_4_ + auVar273._20_4_;
      auVar131._24_4_ = auVar130._24_4_ + auVar273._24_4_;
      auVar131._28_4_ = auVar130._28_4_ + auVar273._28_4_;
      auVar10 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar203,auVar300);
      auVar204._0_4_ = auVar203._0_4_ + auVar300._0_4_;
      auVar204._4_4_ = auVar203._4_4_ + auVar300._4_4_;
      auVar204._8_4_ = auVar203._8_4_ + auVar300._8_4_;
      auVar204._12_4_ = auVar203._12_4_ + auVar300._12_4_;
      auVar204._16_4_ = auVar203._16_4_ + auVar300._16_4_;
      auVar204._20_4_ = auVar203._20_4_ + auVar300._20_4_;
      auVar204._24_4_ = auVar203._24_4_ + auVar300._24_4_;
      auVar204._28_4_ = auVar203._28_4_ + auVar300._28_4_;
      auVar11 = vpermilps_avx(auVar9,0x1b);
      auVar193 = vperm2f128_avx(auVar11,auVar204,0x13);
      auVar260 = vperm2f128_avx(auVar11,auVar204,2);
      auVar9 = vperm2f128_avx(auVar10,auVar131,0x13);
      auVar363 = vperm2f128_avx(auVar10,auVar131,2);
      auVar12 = vpermilps_avx(auVar373,0xff);
      auVar192 = vpermilps_avx(auVar373,0xaa);
      auVar13 = vpermilps_avx(auVar373,0x55);
      auVar14 = vpermilps_avx(auVar373,0);
      fVar412 = auVar9._0_4_;
      fVar425 = auVar9._4_4_;
      fVar427 = auVar9._8_4_;
      fVar435 = auVar9._12_4_;
      fVar437 = auVar9._16_4_;
      fVar453 = auVar9._20_4_;
      fVar455 = auVar9._24_4_;
      fVar424 = auVar193._0_4_;
      fVar426 = auVar193._4_4_;
      fVar434 = auVar193._8_4_;
      fVar436 = auVar193._12_4_;
      fVar452 = auVar193._16_4_;
      fVar454 = auVar193._20_4_;
      fVar467 = auVar193._24_4_;
      auVar422._0_4_ = auVar13._0_4_ * fVar424 + auVar14._0_4_ * fVar412;
      auVar422._4_4_ = auVar13._4_4_ * fVar426 + auVar14._4_4_ * fVar425;
      auVar422._8_4_ = auVar13._8_4_ * fVar434 + auVar14._8_4_ * fVar427;
      auVar422._12_4_ = auVar13._12_4_ * fVar436 + auVar14._12_4_ * fVar435;
      auVar422._16_4_ = auVar13._16_4_ * fVar452 + auVar14._16_4_ * fVar437;
      auVar422._20_4_ = auVar13._20_4_ * fVar454 + auVar14._20_4_ * fVar453;
      auVar422._24_4_ = auVar13._24_4_ * fVar467 + auVar14._24_4_ * fVar455;
      auVar422._28_4_ = auVar11._28_4_ + auVar10._28_4_;
      auVar41._4_4_ = auVar13._4_4_ * fVar425;
      auVar41._0_4_ = auVar13._0_4_ * fVar412;
      auVar41._8_4_ = auVar13._8_4_ * fVar427;
      auVar41._12_4_ = auVar13._12_4_ * fVar435;
      auVar41._16_4_ = auVar13._16_4_ * fVar437;
      auVar41._20_4_ = auVar13._20_4_ * fVar453;
      auVar41._24_4_ = auVar13._24_4_ * fVar455;
      auVar41._28_4_ = auVar11._28_4_;
      auVar42._4_4_ = auVar12._4_4_ * fVar426;
      auVar42._0_4_ = auVar12._0_4_ * fVar424;
      auVar42._8_4_ = auVar12._8_4_ * fVar434;
      auVar42._12_4_ = auVar12._12_4_ * fVar436;
      auVar42._16_4_ = auVar12._16_4_ * fVar452;
      auVar42._20_4_ = auVar12._20_4_ * fVar454;
      auVar42._24_4_ = auVar12._24_4_ * fVar467;
      auVar42._28_4_ = fVar469;
      auVar9 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = auVar192._4_4_ * fVar425;
      auVar43._0_4_ = auVar192._0_4_ * fVar412;
      auVar43._8_4_ = auVar192._8_4_ * fVar427;
      auVar43._12_4_ = auVar192._12_4_ * fVar435;
      auVar43._16_4_ = auVar192._16_4_ * fVar437;
      auVar43._20_4_ = auVar192._20_4_ * fVar453;
      auVar43._24_4_ = auVar192._24_4_ * fVar455;
      auVar43._28_4_ = fVar469;
      auVar44._4_4_ = auVar14._4_4_ * fVar426;
      auVar44._0_4_ = auVar14._0_4_ * fVar424;
      auVar44._8_4_ = auVar14._8_4_ * fVar434;
      auVar44._12_4_ = auVar14._12_4_ * fVar436;
      auVar44._16_4_ = auVar14._16_4_ * fVar452;
      auVar44._20_4_ = auVar14._20_4_ * fVar454;
      auVar44._24_4_ = auVar14._24_4_ * fVar467;
      auVar44._28_4_ = fVar468;
      auVar10 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar12._4_4_ * fVar425;
      auVar45._0_4_ = auVar12._0_4_ * fVar412;
      auVar45._8_4_ = auVar12._8_4_ * fVar427;
      auVar45._12_4_ = auVar12._12_4_ * fVar435;
      auVar45._16_4_ = auVar12._16_4_ * fVar437;
      auVar45._20_4_ = auVar12._20_4_ * fVar453;
      auVar45._24_4_ = auVar12._24_4_ * fVar455;
      auVar45._28_4_ = fVar468;
      auVar46._4_4_ = auVar192._4_4_ * fVar426;
      auVar46._0_4_ = auVar192._0_4_ * fVar424;
      auVar46._8_4_ = auVar192._8_4_ * fVar434;
      auVar46._12_4_ = auVar192._12_4_ * fVar436;
      auVar46._16_4_ = auVar192._16_4_ * fVar452;
      auVar46._20_4_ = auVar192._20_4_ * fVar454;
      auVar46._24_4_ = auVar192._24_4_ * fVar467;
      auVar46._28_4_ = auVar193._28_4_;
      auVar193 = vsubps_avx(auVar45,auVar46);
      auVar95._4_4_ = fStack_114;
      auVar95._0_4_ = fStack_118;
      auVar95._8_4_ = local_110;
      auVar95._12_4_ = fStack_10c;
      auVar205._16_16_ = auVar95;
      auVar205._0_16_ = auVar95;
      auVar11 = vpermilps_avx(auVar205,0xff);
      auVar192 = vpermilps_avx(auVar205,0xaa);
      auVar13 = vpermilps_avx(auVar205,0);
      fVar452 = auVar363._0_4_ * auVar13._0_4_;
      fVar453 = auVar363._4_4_ * auVar13._4_4_;
      auVar47._4_4_ = fVar453;
      auVar47._0_4_ = fVar452;
      fVar454 = auVar363._8_4_ * auVar13._8_4_;
      auVar47._8_4_ = fVar454;
      fVar455 = auVar363._12_4_ * auVar13._12_4_;
      auVar47._12_4_ = fVar455;
      fVar467 = auVar363._16_4_ * auVar13._16_4_;
      auVar47._16_4_ = fVar467;
      fVar468 = auVar363._20_4_ * auVar13._20_4_;
      auVar47._20_4_ = fVar468;
      fVar424 = auVar12._28_4_;
      fVar469 = auVar363._24_4_ * auVar13._24_4_;
      auVar47._24_4_ = fVar469;
      auVar47._28_4_ = fVar424;
      auVar340._0_4_ = auVar260._0_4_ * auVar192._0_4_;
      auVar340._4_4_ = auVar260._4_4_ * auVar192._4_4_;
      auVar340._8_4_ = auVar260._8_4_ * auVar192._8_4_;
      auVar340._12_4_ = auVar260._12_4_ * auVar192._12_4_;
      auVar340._16_4_ = auVar260._16_4_ * auVar192._16_4_;
      auVar340._20_4_ = auVar260._20_4_ * auVar192._20_4_;
      auVar340._24_4_ = auVar260._24_4_ * auVar192._24_4_;
      auVar340._28_36_ = auVar345;
      auVar374._0_4_ = fVar452 + auVar340._0_4_;
      auVar374._4_4_ = fVar453 + auVar340._4_4_;
      auVar374._8_4_ = fVar454 + auVar340._8_4_;
      auVar374._12_4_ = fVar455 + auVar340._12_4_;
      auVar374._16_4_ = fVar467 + auVar340._16_4_;
      auVar374._20_4_ = fVar468 + auVar340._20_4_;
      auVar374._24_4_ = fVar469 + auVar340._24_4_;
      fVar412 = auVar345._0_4_;
      auVar374._28_4_ = fVar424 + fVar412;
      auVar363 = vsubps_avx(auVar47,auVar340._0_32_);
      fVar425 = auVar260._0_4_ * auVar11._0_4_;
      fVar426 = auVar260._4_4_ * auVar11._4_4_;
      auVar48._4_4_ = fVar426;
      auVar48._0_4_ = fVar425;
      fVar427 = auVar260._8_4_ * auVar11._8_4_;
      auVar48._8_4_ = fVar427;
      fVar434 = auVar260._12_4_ * auVar11._12_4_;
      auVar48._12_4_ = fVar434;
      fVar435 = auVar260._16_4_ * auVar11._16_4_;
      auVar48._16_4_ = fVar435;
      fVar436 = auVar260._20_4_ * auVar11._20_4_;
      auVar48._20_4_ = fVar436;
      fVar437 = auVar260._24_4_ * auVar11._24_4_;
      auVar48._24_4_ = fVar437;
      auVar48._28_4_ = fVar412;
      auVar393._0_4_ = fVar452 + fVar425;
      auVar393._4_4_ = fVar453 + fVar426;
      auVar393._8_4_ = fVar454 + fVar427;
      auVar393._12_4_ = fVar455 + fVar434;
      auVar393._16_4_ = fVar467 + fVar435;
      auVar393._20_4_ = fVar468 + fVar436;
      auVar393._24_4_ = fVar469 + fVar437;
      auVar393._28_4_ = fVar424 + fVar412;
      auVar260 = vsubps_avx(auVar47,auVar48);
      auVar11 = vsubps_avx(auVar374,auVar422);
      auVar12 = vsubps_avx(auVar393,auVar9);
      auVar192 = vsubps_avx(auVar260,auVar10);
      auVar13 = vsubps_avx(auVar363,auVar193);
      *(float *)(undefined1 *)local_150._buffer = auVar374._0_4_ + auVar422._0_4_;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar374._4_4_ + auVar422._4_4_;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar374._8_4_ + auVar422._8_4_;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar374._12_4_ + auVar422._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) =
           auVar374._16_4_ + auVar422._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar374._20_4_ + auVar422._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar374._24_4_ + auVar422._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar374._28_4_ + auVar422._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) =
           auVar393._0_4_ + auVar9._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar393._4_4_ + auVar9._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar393._8_4_ + auVar9._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar393._12_4_ + auVar9._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) =
           auVar393._16_4_ + auVar9._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar393._20_4_ + auVar9._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar393._24_4_ + auVar9._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar393._28_4_ + auVar9._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) =
           auVar260._0_4_ + auVar10._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) =
           auVar260._4_4_ + auVar10._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) =
           auVar260._8_4_ + auVar10._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) =
           auVar260._12_4_ + auVar10._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) =
           auVar260._16_4_ + auVar10._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) =
           auVar260._20_4_ + auVar10._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) =
           auVar260._24_4_ + auVar10._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) =
           auVar260._28_4_ + auVar10._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) =
           auVar363._0_4_ + auVar193._0_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar363._4_4_ + auVar193._4_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar363._8_4_ + auVar193._8_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar363._12_4_ + auVar193._12_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) =
           auVar363._16_4_ + auVar193._16_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar363._20_4_ + auVar193._20_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar363._24_4_ + auVar193._24_4_;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar363._28_4_ + auVar193._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar13;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar192;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar12;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar11;
      auVar139 = ZEXT1664(auVar11._0_16_);
      auVar173 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar175._0_8_ = std::ostream::flush();
    auVar175._8_56_ = extraout_var_35;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x18) {
          auVar174._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar174._8_56_ = extraout_var_36;
          auVar175._4_60_ = auVar174._4_60_;
          auVar175._0_4_ = (float)auVar174._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar175._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar175._0_16_ = ZEXT816(0);
        }
        auVar345 = auVar139._28_36_;
        local_140._buffer[uVar112] = auVar175._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar449._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar449._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar464._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar464._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar449,auVar464);
      auVar9 = vunpckhpd_avx(auVar449,auVar464);
      auVar363 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar193 = vunpcklpd_avx(auVar363,auVar9);
      auVar9 = vunpckhpd_avx(auVar363,auVar9);
      auVar423._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x60);
      auVar423._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x40);
      auVar433._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x70);
      auVar433._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x50);
      auVar363 = vunpcklpd_avx(auVar423,auVar433);
      auVar10 = vunpckhpd_avx(auVar423,auVar433);
      auVar260 = vunpcklps_avx(auVar363,auVar10);
      auVar10 = vunpckhps_avx(auVar363,auVar10);
      auVar363 = vunpcklpd_avx(auVar260,auVar10);
      auVar10 = vunpckhpd_avx(auVar260,auVar10);
      auVar260 = vpermilps_avx(auVar193,0);
      auVar11 = vpermilps_avx(auVar193,0x55);
      auVar12 = vpermilps_avx(auVar193,0xaa);
      auVar193 = vpermilps_avx(auVar193,0xff);
      auVar132._0_4_ =
           local_120 * auVar260._0_4_ + local_110 * auVar11._0_4_ +
           local_100 * auVar12._0_4_ + local_f0 * auVar193._0_4_;
      auVar132._4_4_ =
           fStack_11c * auVar260._4_4_ + fStack_10c * auVar11._4_4_ +
           fStack_fc * auVar12._4_4_ + fStack_ec * auVar193._4_4_;
      auVar132._8_4_ =
           fStack_118 * auVar260._8_4_ + fStack_108 * auVar11._8_4_ +
           fStack_f8 * auVar12._8_4_ + fStack_e8 * auVar193._8_4_;
      auVar132._12_4_ =
           fStack_114 * auVar260._12_4_ + fStack_104 * auVar11._12_4_ +
           fStack_f4 * auVar12._12_4_ + fStack_e4 * auVar193._12_4_;
      auVar132._16_4_ =
           local_120 * auVar260._16_4_ + local_110 * auVar11._16_4_ +
           local_100 * auVar12._16_4_ + local_f0 * auVar193._16_4_;
      auVar132._20_4_ =
           fStack_11c * auVar260._20_4_ + fStack_10c * auVar11._20_4_ +
           fStack_fc * auVar12._20_4_ + fStack_ec * auVar193._20_4_;
      auVar132._24_4_ =
           fStack_118 * auVar260._24_4_ + fStack_108 * auVar11._24_4_ +
           fStack_f8 * auVar12._24_4_ + fStack_e8 * auVar193._24_4_;
      auVar132._28_4_ = auVar260._28_4_ + auVar11._28_4_ + auVar12._28_4_ + auVar193._28_4_;
      auVar193 = vpermilps_avx(auVar363,0);
      auVar260 = vpermilps_avx(auVar363,0x55);
      auVar11 = vpermilps_avx(auVar363,0xaa);
      auVar363 = vpermilps_avx(auVar363,0xff);
      auVar206._0_4_ =
           local_120 * auVar193._0_4_ + local_110 * auVar260._0_4_ +
           local_100 * auVar11._0_4_ + local_f0 * auVar363._0_4_;
      auVar206._4_4_ =
           fStack_11c * auVar193._4_4_ + fStack_10c * auVar260._4_4_ +
           fStack_fc * auVar11._4_4_ + fStack_ec * auVar363._4_4_;
      auVar206._8_4_ =
           fStack_118 * auVar193._8_4_ + fStack_108 * auVar260._8_4_ +
           fStack_f8 * auVar11._8_4_ + fStack_e8 * auVar363._8_4_;
      auVar206._12_4_ =
           fStack_114 * auVar193._12_4_ + fStack_104 * auVar260._12_4_ +
           fStack_f4 * auVar11._12_4_ + fStack_e4 * auVar363._12_4_;
      auVar206._16_4_ =
           local_120 * auVar193._16_4_ + local_110 * auVar260._16_4_ +
           local_100 * auVar11._16_4_ + local_f0 * auVar363._16_4_;
      auVar206._20_4_ =
           fStack_11c * auVar193._20_4_ + fStack_10c * auVar260._20_4_ +
           fStack_fc * auVar11._20_4_ + fStack_ec * auVar363._20_4_;
      auVar206._24_4_ =
           fStack_118 * auVar193._24_4_ + fStack_108 * auVar260._24_4_ +
           fStack_f8 * auVar11._24_4_ + fStack_e8 * auVar363._24_4_;
      auVar206._28_4_ = auVar193._28_4_ + auVar260._28_4_ + auVar11._28_4_ + auVar363._28_4_;
      auVar103._4_4_ = fStack_dc;
      auVar103._0_4_ = local_e0;
      auVar103._8_4_ = fStack_d8;
      auVar103._12_4_ = fStack_d4;
      auVar375._16_16_ = auVar103;
      auVar375._0_16_ = auVar103;
      auVar193 = vpermilps_avx(auVar9,0);
      auVar363 = vpermilps_avx(auVar9,0x55);
      auVar260 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar274._0_4_ =
           local_e0 * auVar193._0_4_ + local_d0 * auVar363._0_4_ +
           local_c0 * auVar260._0_4_ + local_b0 * auVar9._0_4_;
      auVar274._4_4_ =
           fStack_dc * auVar193._4_4_ + fStack_cc * auVar363._4_4_ +
           fStack_bc * auVar260._4_4_ + fStack_ac * auVar9._4_4_;
      auVar274._8_4_ =
           fStack_d8 * auVar193._8_4_ + fStack_c8 * auVar363._8_4_ +
           fStack_b8 * auVar260._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar274._12_4_ =
           fStack_d4 * auVar193._12_4_ + fStack_c4 * auVar363._12_4_ +
           fStack_b4 * auVar260._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar274._16_4_ =
           local_e0 * auVar193._16_4_ + local_d0 * auVar363._16_4_ +
           local_c0 * auVar260._16_4_ + local_b0 * auVar9._16_4_;
      auVar274._20_4_ =
           fStack_dc * auVar193._20_4_ + fStack_cc * auVar363._20_4_ +
           fStack_bc * auVar260._20_4_ + fStack_ac * auVar9._20_4_;
      auVar274._24_4_ =
           fStack_d8 * auVar193._24_4_ + fStack_c8 * auVar363._24_4_ +
           fStack_b8 * auVar260._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar274._28_4_ = auVar193._28_4_ + auVar363._28_4_ + auVar260._28_4_ + auVar9._28_4_;
      auVar9 = vpermilps_avx(auVar10,0);
      auVar193 = vpermilps_avx(auVar10,0x55);
      auVar363 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      fVar437 = auVar10._28_4_;
      fVar342 = auVar363._28_4_ + fVar437;
      auVar301._0_4_ =
           local_e0 * auVar9._0_4_ + local_d0 * auVar193._0_4_ +
           local_c0 * auVar363._0_4_ + local_b0 * auVar10._0_4_;
      auVar301._4_4_ =
           fStack_dc * auVar9._4_4_ + fStack_cc * auVar193._4_4_ +
           fStack_bc * auVar363._4_4_ + fStack_ac * auVar10._4_4_;
      auVar301._8_4_ =
           fStack_d8 * auVar9._8_4_ + fStack_c8 * auVar193._8_4_ +
           fStack_b8 * auVar363._8_4_ + fStack_a8 * auVar10._8_4_;
      auVar301._12_4_ =
           fStack_d4 * auVar9._12_4_ + fStack_c4 * auVar193._12_4_ +
           fStack_b4 * auVar363._12_4_ + fStack_a4 * auVar10._12_4_;
      auVar301._16_4_ =
           local_e0 * auVar9._16_4_ + local_d0 * auVar193._16_4_ +
           local_c0 * auVar363._16_4_ + local_b0 * auVar10._16_4_;
      auVar301._20_4_ =
           fStack_dc * auVar9._20_4_ + fStack_cc * auVar193._20_4_ +
           fStack_bc * auVar363._20_4_ + fStack_ac * auVar10._20_4_;
      auVar301._24_4_ =
           fStack_d8 * auVar9._24_4_ + fStack_c8 * auVar193._24_4_ +
           fStack_b8 * auVar363._24_4_ + fStack_a8 * auVar10._24_4_;
      auVar301._28_4_ = auVar9._28_4_ + auVar193._28_4_ + fVar342;
      auVar9 = vsubps_avx(auVar132,auVar274);
      auVar133._0_4_ = auVar132._0_4_ + auVar274._0_4_;
      auVar133._4_4_ = auVar132._4_4_ + auVar274._4_4_;
      auVar133._8_4_ = auVar132._8_4_ + auVar274._8_4_;
      auVar133._12_4_ = auVar132._12_4_ + auVar274._12_4_;
      auVar133._16_4_ = auVar132._16_4_ + auVar274._16_4_;
      auVar133._20_4_ = auVar132._20_4_ + auVar274._20_4_;
      auVar133._24_4_ = auVar132._24_4_ + auVar274._24_4_;
      auVar133._28_4_ = auVar132._28_4_ + auVar274._28_4_;
      auVar11 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vsubps_avx(auVar206,auVar301);
      auVar207._0_4_ = auVar206._0_4_ + auVar301._0_4_;
      auVar207._4_4_ = auVar206._4_4_ + auVar301._4_4_;
      auVar207._8_4_ = auVar206._8_4_ + auVar301._8_4_;
      auVar207._12_4_ = auVar206._12_4_ + auVar301._12_4_;
      auVar207._16_4_ = auVar206._16_4_ + auVar301._16_4_;
      auVar207._20_4_ = auVar206._20_4_ + auVar301._20_4_;
      auVar207._24_4_ = auVar206._24_4_ + auVar301._24_4_;
      auVar207._28_4_ = auVar206._28_4_ + auVar301._28_4_;
      auVar12 = vpermilps_avx(auVar9,0x1b);
      auVar10 = vperm2f128_avx(auVar12,auVar207,2);
      auVar9 = vperm2f128_avx(auVar11,auVar133,0x13);
      auVar193 = vperm2f128_avx(auVar11,auVar133,2);
      auVar363 = vpermilps_avx(auVar375,0xff);
      auVar260 = vpermilps_avx(auVar375,0xaa);
      auVar192 = vpermilps_avx(auVar375,0x55);
      auVar13 = vpermilps_avx(auVar375,0);
      fVar424 = auVar9._0_4_;
      fVar213 = auVar13._0_4_ * fVar424;
      fVar425 = auVar9._4_4_;
      fVar247 = auVar13._4_4_ * fVar425;
      auVar49._4_4_ = fVar247;
      auVar49._0_4_ = fVar213;
      fVar426 = auVar9._8_4_;
      fVar248 = auVar13._8_4_ * fVar426;
      auVar49._8_4_ = fVar248;
      fVar427 = auVar9._12_4_;
      fVar249 = auVar13._12_4_ * fVar427;
      auVar49._12_4_ = fVar249;
      fVar434 = auVar9._16_4_;
      fVar250 = auVar13._16_4_ * fVar434;
      auVar49._16_4_ = fVar250;
      fVar435 = auVar9._20_4_;
      fVar264 = auVar13._20_4_ * fVar435;
      auVar49._20_4_ = fVar264;
      fVar436 = auVar9._24_4_;
      fVar265 = auVar13._24_4_ * fVar436;
      auVar49._24_4_ = fVar265;
      auVar49._28_4_ = auVar11._28_4_;
      fVar266 = auVar192._0_4_ * fVar424;
      fVar267 = auVar192._4_4_ * fVar425;
      auVar50._4_4_ = fVar267;
      auVar50._0_4_ = fVar266;
      fVar277 = auVar192._8_4_ * fVar426;
      auVar50._8_4_ = fVar277;
      fVar278 = auVar192._12_4_ * fVar427;
      auVar50._12_4_ = fVar278;
      fVar279 = auVar192._16_4_ * fVar434;
      auVar50._16_4_ = fVar279;
      fVar280 = auVar192._20_4_ * fVar435;
      auVar50._20_4_ = fVar280;
      fVar302 = auVar192._24_4_ * fVar436;
      auVar50._24_4_ = fVar302;
      auVar50._28_4_ = auVar12._28_4_;
      fVar303 = auVar260._0_4_ * fVar424;
      fVar304 = auVar260._4_4_ * fVar425;
      auVar51._4_4_ = fVar304;
      auVar51._0_4_ = fVar303;
      fVar305 = auVar260._8_4_ * fVar426;
      auVar51._8_4_ = fVar305;
      fVar328 = auVar260._12_4_ * fVar427;
      auVar51._12_4_ = fVar328;
      fVar329 = auVar260._16_4_ * fVar434;
      auVar51._16_4_ = fVar329;
      fVar330 = auVar260._20_4_ * fVar435;
      auVar51._20_4_ = fVar330;
      fVar331 = auVar260._24_4_ * fVar436;
      auVar51._24_4_ = fVar331;
      auVar51._28_4_ = fVar342;
      fVar424 = auVar363._0_4_ * fVar424;
      fVar425 = auVar363._4_4_ * fVar425;
      auVar52._4_4_ = fVar425;
      auVar52._0_4_ = fVar424;
      fVar426 = auVar363._8_4_ * fVar426;
      auVar52._8_4_ = fVar426;
      fVar427 = auVar363._12_4_ * fVar427;
      auVar52._12_4_ = fVar427;
      fVar434 = auVar363._16_4_ * fVar434;
      auVar52._16_4_ = fVar434;
      fVar435 = auVar363._20_4_ * fVar435;
      auVar52._20_4_ = fVar435;
      fVar436 = auVar363._24_4_ * fVar436;
      auVar52._24_4_ = fVar436;
      auVar52._28_4_ = fVar437;
      auVar96._4_4_ = fStack_114;
      auVar96._0_4_ = fStack_118;
      auVar96._8_4_ = local_110;
      auVar96._12_4_ = fStack_10c;
      auVar208._16_16_ = auVar96;
      auVar208._0_16_ = auVar96;
      auVar260 = vpermilps_avx(auVar208,0xff);
      auVar9 = vpermilps_avx(auVar208,0xaa);
      auVar192 = vpermilps_avx(auVar208,0);
      fVar180 = auVar193._0_4_ * auVar192._0_4_;
      fVar181 = auVar193._4_4_ * auVar192._4_4_;
      auVar53._4_4_ = fVar181;
      auVar53._0_4_ = fVar180;
      fVar182 = auVar193._8_4_ * auVar192._8_4_;
      auVar53._8_4_ = fVar182;
      fVar184 = auVar193._12_4_ * auVar192._12_4_;
      auVar53._12_4_ = fVar184;
      fVar210 = auVar193._16_4_ * auVar192._16_4_;
      auVar53._16_4_ = fVar210;
      fVar211 = auVar193._20_4_ * auVar192._20_4_;
      auVar53._20_4_ = fVar211;
      fVar452 = auVar363._28_4_;
      fVar212 = auVar193._24_4_ * auVar192._24_4_;
      auVar53._24_4_ = fVar212;
      auVar53._28_4_ = fVar452;
      auVar341._0_4_ = auVar10._0_4_ * auVar9._0_4_;
      auVar341._4_4_ = auVar10._4_4_ * auVar9._4_4_;
      auVar341._8_4_ = auVar10._8_4_ * auVar9._8_4_;
      auVar341._12_4_ = auVar10._12_4_ * auVar9._12_4_;
      auVar341._16_4_ = auVar10._16_4_ * auVar9._16_4_;
      auVar341._20_4_ = auVar10._20_4_ * auVar9._20_4_;
      auVar341._24_4_ = auVar10._24_4_ * auVar9._24_4_;
      auVar341._28_36_ = auVar345;
      auVar376._0_4_ = fVar180 + auVar341._0_4_;
      auVar376._4_4_ = fVar181 + auVar341._4_4_;
      auVar376._8_4_ = fVar182 + auVar341._8_4_;
      auVar376._12_4_ = fVar184 + auVar341._12_4_;
      auVar376._16_4_ = fVar210 + auVar341._16_4_;
      auVar376._20_4_ = fVar211 + auVar341._20_4_;
      auVar376._24_4_ = fVar212 + auVar341._24_4_;
      fVar412 = auVar345._0_4_;
      auVar376._28_4_ = fVar452 + fVar412;
      auVar9 = vsubps_avx(auVar53,auVar341._0_32_);
      fVar453 = auVar10._0_4_ * auVar260._0_4_;
      fVar454 = auVar10._4_4_ * auVar260._4_4_;
      auVar54._4_4_ = fVar454;
      auVar54._0_4_ = fVar453;
      fVar455 = auVar10._8_4_ * auVar260._8_4_;
      auVar54._8_4_ = fVar455;
      fVar467 = auVar10._12_4_ * auVar260._12_4_;
      auVar54._12_4_ = fVar467;
      fVar468 = auVar10._16_4_ * auVar260._16_4_;
      auVar54._16_4_ = fVar468;
      fVar469 = auVar10._20_4_ * auVar260._20_4_;
      auVar54._20_4_ = fVar469;
      fVar115 = auVar10._24_4_ * auVar260._24_4_;
      auVar54._24_4_ = fVar115;
      auVar54._28_4_ = fVar412;
      auVar394._0_4_ = fVar180 + fVar453;
      auVar394._4_4_ = fVar181 + fVar454;
      auVar394._8_4_ = fVar182 + fVar455;
      auVar394._12_4_ = fVar184 + fVar467;
      auVar394._16_4_ = fVar210 + fVar468;
      auVar394._20_4_ = fVar211 + fVar469;
      auVar394._24_4_ = fVar212 + fVar115;
      auVar394._28_4_ = fVar452 + fVar412;
      auVar10 = vsubps_avx(auVar53,auVar54);
      auVar245._0_4_ = auVar10._0_4_ + fVar303;
      auVar245._4_4_ = auVar10._4_4_ + fVar304;
      auVar245._8_4_ = auVar10._8_4_ + fVar305;
      auVar245._12_4_ = auVar10._12_4_ + fVar328;
      auVar245._16_4_ = auVar10._16_4_ + fVar329;
      auVar245._20_4_ = auVar10._20_4_ + fVar330;
      auVar245._24_4_ = auVar10._24_4_ + fVar331;
      auVar245._28_4_ = auVar10._28_4_ + fVar342;
      auVar193 = vsubps_avx(auVar376,auVar49);
      auVar363 = vsubps_avx(auVar394,auVar50);
      auVar10 = vsubps_avx(auVar10,auVar51);
      auVar260 = vsubps_avx(auVar9,auVar52);
      *(float *)(undefined1 *)local_150._buffer = auVar376._0_4_ + fVar213;
      *(float *)((undefined1 *)local_150._buffer + 4) = auVar376._4_4_ + fVar247;
      *(float *)((undefined1 *)local_150._buffer + 8) = auVar376._8_4_ + fVar248;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = auVar376._12_4_ + fVar249;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = auVar376._16_4_ + fVar250;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) =
           auVar376._20_4_ + fVar264;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) =
           auVar376._24_4_ + fVar265;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           auVar376._28_4_ + auVar11._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = auVar394._0_4_ + fVar266;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) =
           auVar394._4_4_ + fVar267;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) =
           auVar394._8_4_ + fVar277;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) =
           auVar394._12_4_ + fVar278;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = auVar394._16_4_ + fVar279;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) =
           auVar394._20_4_ + fVar280;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) =
           auVar394._24_4_ + fVar302;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) =
           auVar394._28_4_ + auVar12._28_4_;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x40) = auVar245;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = auVar9._0_4_ + fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) =
           auVar9._4_4_ + fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) =
           auVar9._8_4_ + fVar426;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) =
           auVar9._12_4_ + fVar427;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = auVar9._16_4_ + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) =
           auVar9._20_4_ + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) =
           auVar9._24_4_ + fVar436;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) =
           auVar9._28_4_ + fVar437;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar260;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar10;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar363;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar193;
      auVar139 = ZEXT1664(auVar193._0_16_);
      auVar175 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"2x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar177._0_8_ = std::ostream::flush();
    auVar177._8_56_ = extraout_var_37;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 0x10) {
          auVar176._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar176._8_56_ = extraout_var_38;
          auVar177._4_60_ = auVar176._4_60_;
          auVar177._0_4_ = (float)auVar176._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar177._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar177._0_16_ = ZEXT816(0);
        }
        local_140._buffer[uVar112] = auVar177._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar450._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar450._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar465._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar465._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar450,auVar465);
      auVar9 = vunpckhpd_avx(auVar450,auVar465);
      auVar193 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar10 = vunpcklpd_avx(auVar193,auVar9);
      auVar9 = vunpckhpd_avx(auVar193,auVar9);
      auVar193 = vpermilps_avx(auVar10,0);
      auVar363 = vpermilps_avx(auVar10,0x55);
      auVar260 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar134._0_4_ =
           local_120 * auVar193._0_4_ + local_110 * auVar363._0_4_ +
           local_100 * auVar260._0_4_ + local_f0 * auVar10._0_4_;
      auVar134._4_4_ =
           fStack_11c * auVar193._4_4_ + fStack_10c * auVar363._4_4_ +
           fStack_fc * auVar260._4_4_ + fStack_ec * auVar10._4_4_;
      auVar134._8_4_ =
           fStack_118 * auVar193._8_4_ + fStack_108 * auVar363._8_4_ +
           fStack_f8 * auVar260._8_4_ + fStack_e8 * auVar10._8_4_;
      auVar134._12_4_ =
           fStack_114 * auVar193._12_4_ + fStack_104 * auVar363._12_4_ +
           fStack_f4 * auVar260._12_4_ + fStack_e4 * auVar10._12_4_;
      auVar134._16_4_ =
           local_120 * auVar193._16_4_ + local_110 * auVar363._16_4_ +
           local_100 * auVar260._16_4_ + local_f0 * auVar10._16_4_;
      auVar134._20_4_ =
           fStack_11c * auVar193._20_4_ + fStack_10c * auVar363._20_4_ +
           fStack_fc * auVar260._20_4_ + fStack_ec * auVar10._20_4_;
      auVar134._24_4_ =
           fStack_118 * auVar193._24_4_ + fStack_108 * auVar363._24_4_ +
           fStack_f8 * auVar260._24_4_ + fStack_e8 * auVar10._24_4_;
      auVar134._28_4_ = auVar193._28_4_ + auVar363._28_4_ + auVar260._28_4_ + auVar10._28_4_;
      auVar104._4_4_ = fStack_dc;
      auVar104._0_4_ = local_e0;
      auVar104._8_4_ = fStack_d8;
      auVar104._12_4_ = fStack_d4;
      auVar377._16_16_ = auVar104;
      auVar377._0_16_ = auVar104;
      auVar10 = vpermilps_avx(auVar9,0);
      auVar193 = vpermilps_avx(auVar9,0x55);
      auVar363 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      fVar436 = auVar193._28_4_;
      fVar437 = auVar9._28_4_;
      fVar303 = auVar363._28_4_ + fVar437;
      auVar275._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar193._0_4_ +
           local_c0 * auVar363._0_4_ + local_b0 * auVar9._0_4_;
      auVar275._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar193._4_4_ +
           fStack_bc * auVar363._4_4_ + fStack_ac * auVar9._4_4_;
      auVar275._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar193._8_4_ +
           fStack_b8 * auVar363._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar275._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar193._12_4_ +
           fStack_b4 * auVar363._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar275._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar193._16_4_ +
           local_c0 * auVar363._16_4_ + local_b0 * auVar9._16_4_;
      auVar275._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar193._20_4_ +
           fStack_bc * auVar363._20_4_ + fStack_ac * auVar9._20_4_;
      auVar275._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar193._24_4_ +
           fStack_b8 * auVar363._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar275._28_4_ = auVar10._28_4_ + fVar436 + fVar303;
      auVar9 = vsubps_avx(auVar134,auVar275);
      auVar135._0_4_ = auVar134._0_4_ + auVar275._0_4_;
      auVar135._4_4_ = auVar134._4_4_ + auVar275._4_4_;
      auVar135._8_4_ = auVar134._8_4_ + auVar275._8_4_;
      auVar135._12_4_ = auVar134._12_4_ + auVar275._12_4_;
      auVar135._16_4_ = auVar134._16_4_ + auVar275._16_4_;
      auVar135._20_4_ = auVar134._20_4_ + auVar275._20_4_;
      auVar135._24_4_ = auVar134._24_4_ + auVar275._24_4_;
      auVar135._28_4_ = auVar134._28_4_ + auVar275._28_4_;
      auVar260 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vperm2f128_avx(auVar260,auVar135,0x13);
      auVar10 = vperm2f128_avx(auVar260,auVar135,2);
      auVar193 = vpermilps_avx(auVar377,0xff);
      auVar363 = vpermilps_avx(auVar377,0xaa);
      auVar11 = vpermilps_avx(auVar377,0x55);
      auVar12 = vpermilps_avx(auVar377,0);
      fVar412 = auVar9._0_4_;
      fVar180 = auVar12._0_4_ * fVar412;
      fVar424 = auVar9._4_4_;
      fVar181 = auVar12._4_4_ * fVar424;
      auVar55._4_4_ = fVar181;
      auVar55._0_4_ = fVar180;
      fVar425 = auVar9._8_4_;
      fVar182 = auVar12._8_4_ * fVar425;
      auVar55._8_4_ = fVar182;
      fVar426 = auVar9._12_4_;
      fVar184 = auVar12._12_4_ * fVar426;
      auVar55._12_4_ = fVar184;
      fVar427 = auVar9._16_4_;
      fVar210 = auVar12._16_4_ * fVar427;
      auVar55._16_4_ = fVar210;
      fVar434 = auVar9._20_4_;
      fVar211 = auVar12._20_4_ * fVar434;
      auVar55._20_4_ = fVar211;
      fVar435 = auVar9._24_4_;
      fVar212 = auVar12._24_4_ * fVar435;
      auVar55._24_4_ = fVar212;
      auVar55._28_4_ = auVar260._28_4_;
      fVar213 = auVar11._0_4_ * fVar412;
      fVar247 = auVar11._4_4_ * fVar424;
      auVar56._4_4_ = fVar247;
      auVar56._0_4_ = fVar213;
      fVar248 = auVar11._8_4_ * fVar425;
      auVar56._8_4_ = fVar248;
      fVar249 = auVar11._12_4_ * fVar426;
      auVar56._12_4_ = fVar249;
      fVar250 = auVar11._16_4_ * fVar427;
      auVar56._16_4_ = fVar250;
      fVar264 = auVar11._20_4_ * fVar434;
      auVar56._20_4_ = fVar264;
      fVar265 = auVar11._24_4_ * fVar435;
      auVar56._24_4_ = fVar265;
      auVar56._28_4_ = fVar436;
      fVar266 = auVar363._0_4_ * fVar412;
      fVar267 = auVar363._4_4_ * fVar424;
      auVar57._4_4_ = fVar267;
      auVar57._0_4_ = fVar266;
      fVar277 = auVar363._8_4_ * fVar425;
      auVar57._8_4_ = fVar277;
      fVar278 = auVar363._12_4_ * fVar426;
      auVar57._12_4_ = fVar278;
      fVar279 = auVar363._16_4_ * fVar427;
      auVar57._16_4_ = fVar279;
      fVar280 = auVar363._20_4_ * fVar434;
      auVar57._20_4_ = fVar280;
      fVar302 = auVar363._24_4_ * fVar435;
      auVar57._24_4_ = fVar302;
      auVar57._28_4_ = fVar303;
      fVar412 = auVar193._0_4_ * fVar412;
      fVar424 = auVar193._4_4_ * fVar424;
      auVar58._4_4_ = fVar424;
      auVar58._0_4_ = fVar412;
      fVar425 = auVar193._8_4_ * fVar425;
      auVar58._8_4_ = fVar425;
      fVar426 = auVar193._12_4_ * fVar426;
      auVar58._12_4_ = fVar426;
      fVar427 = auVar193._16_4_ * fVar427;
      auVar58._16_4_ = fVar427;
      fVar434 = auVar193._20_4_ * fVar434;
      auVar58._20_4_ = fVar434;
      fVar435 = auVar193._24_4_ * fVar435;
      auVar58._24_4_ = fVar435;
      auVar58._28_4_ = fVar437;
      auVar97._4_4_ = fStack_114;
      auVar97._0_4_ = fStack_118;
      auVar97._8_4_ = local_110;
      auVar97._12_4_ = fStack_10c;
      auVar209._16_16_ = auVar97;
      auVar209._0_16_ = auVar97;
      vpermilps_avx(auVar209,0xff);
      vpermilps_avx(auVar209,0xaa);
      auVar9 = vpermilps_avx(auVar209,0);
      fVar453 = auVar10._0_4_ * auVar9._0_4_;
      fVar454 = auVar10._4_4_ * auVar9._4_4_;
      auVar59._4_4_ = fVar454;
      auVar59._0_4_ = fVar453;
      fVar455 = auVar10._8_4_ * auVar9._8_4_;
      auVar59._8_4_ = fVar455;
      fVar467 = auVar10._12_4_ * auVar9._12_4_;
      auVar59._12_4_ = fVar467;
      fVar468 = auVar10._16_4_ * auVar9._16_4_;
      auVar59._16_4_ = fVar468;
      fVar469 = auVar10._20_4_ * auVar9._20_4_;
      auVar59._20_4_ = fVar469;
      fVar452 = auVar193._28_4_;
      fVar115 = auVar10._24_4_ * auVar9._24_4_;
      auVar59._24_4_ = fVar115;
      auVar59._28_4_ = fVar452;
      auVar246._0_4_ = fVar453 + fVar266;
      auVar246._4_4_ = fVar454 + fVar267;
      auVar246._8_4_ = fVar455 + fVar277;
      auVar246._12_4_ = fVar467 + fVar278;
      auVar246._16_4_ = fVar468 + fVar279;
      auVar246._20_4_ = fVar469 + fVar280;
      auVar246._24_4_ = fVar115 + fVar302;
      auVar246._28_4_ = fVar452 + fVar303;
      auVar9 = vsubps_avx(auVar59,auVar55);
      auVar10 = vsubps_avx(auVar59,auVar56);
      auVar193 = vsubps_avx(auVar59,auVar57);
      auVar363 = vsubps_avx(auVar59,auVar58);
      *(float *)(undefined1 *)local_150._buffer = fVar453 + fVar180;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar454 + fVar181;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar455 + fVar182;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar467 + fVar184;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar468 + fVar210;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar469 + fVar211;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar115 + fVar212;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) =
           fVar452 + auVar260._28_4_;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar453 + fVar213;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar454 + fVar247;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar455 + fVar248;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar467 + fVar249;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar468 + fVar250;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar469 + fVar264;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar115 + fVar265;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = fVar452 + fVar436;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x40) = auVar246;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar453 + fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar454 + fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar455 + fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar467 + fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar468 + fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar469 + fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar115 + fVar435;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = fVar452 + fVar437;
      *(undefined1 (*) [32])((long)local_150._buffer + 0x80) = auVar363;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xa0) = auVar193;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xc0) = auVar10;
      *(undefined1 (*) [32])((long)local_150._buffer + 0xe0) = auVar9;
      auVar177 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"         ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1x8",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    auVar179._0_8_ = std::ostream::flush();
    auVar179._8_56_ = extraout_var_39;
    iVar110 = 0;
    do {
      uVar112 = 0;
      do {
        if (uVar112 < 8) {
          auVar178._0_8_ = (double)Imath_3_2::erand48(local_126);
          auVar178._8_56_ = extraout_var_40;
          auVar179._4_60_ = auVar178._4_60_;
          auVar179._0_4_ = (float)auVar178._0_8_;
          *(float *)((undefined1 *)local_150._buffer + uVar112 * 4) = auVar179._0_4_;
        }
        else {
          *(undefined4 *)((undefined1 *)local_150._buffer + uVar112 * 4) = 0;
          auVar179._0_16_ = ZEXT816(0);
        }
        local_140._buffer[uVar112] = auVar179._0_4_;
        uVar112 = uVar112 + 1;
      } while (uVar112 != 0x40);
      Imf_3_2::anon_unknown_3::dctInverse8x8_scalar<0>(local_140._buffer);
      puVar108 = &DAT_001c2ee0;
      pfVar109 = &local_120;
      for (lVar111 = 0x10; lVar111 != 0; lVar111 = lVar111 + -1) {
        *(undefined8 *)pfVar109 = *puVar108;
        puVar108 = puVar108 + (ulong)bVar114 * -2 + 1;
        pfVar109 = pfVar109 + ((ulong)bVar114 * -2 + 1) * 2;
      }
      auVar451._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x20);
      auVar451._0_16_ = *(undefined1 (*) [16])local_150._buffer;
      auVar466._16_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x30);
      auVar466._0_16_ = *(undefined1 (*) [16])((long)local_150._buffer + 0x10);
      auVar10 = vunpcklpd_avx(auVar451,auVar466);
      auVar9 = vunpckhpd_avx(auVar451,auVar466);
      auVar193 = vunpcklps_avx(auVar10,auVar9);
      auVar9 = vunpckhps_avx(auVar10,auVar9);
      auVar10 = vunpcklpd_avx(auVar193,auVar9);
      auVar9 = vunpckhpd_avx(auVar193,auVar9);
      auVar193 = vpermilps_avx(auVar10,0);
      auVar363 = vpermilps_avx(auVar10,0x55);
      auVar260 = vpermilps_avx(auVar10,0xaa);
      auVar10 = vpermilps_avx(auVar10,0xff);
      auVar136._0_4_ =
           local_120 * auVar193._0_4_ + local_110 * auVar363._0_4_ +
           local_100 * auVar260._0_4_ + local_f0 * auVar10._0_4_;
      auVar136._4_4_ =
           fStack_11c * auVar193._4_4_ + fStack_10c * auVar363._4_4_ +
           fStack_fc * auVar260._4_4_ + fStack_ec * auVar10._4_4_;
      auVar136._8_4_ =
           fStack_118 * auVar193._8_4_ + fStack_108 * auVar363._8_4_ +
           fStack_f8 * auVar260._8_4_ + fStack_e8 * auVar10._8_4_;
      auVar136._12_4_ =
           fStack_114 * auVar193._12_4_ + fStack_104 * auVar363._12_4_ +
           fStack_f4 * auVar260._12_4_ + fStack_e4 * auVar10._12_4_;
      auVar136._16_4_ =
           local_120 * auVar193._16_4_ + local_110 * auVar363._16_4_ +
           local_100 * auVar260._16_4_ + local_f0 * auVar10._16_4_;
      auVar136._20_4_ =
           fStack_11c * auVar193._20_4_ + fStack_10c * auVar363._20_4_ +
           fStack_fc * auVar260._20_4_ + fStack_ec * auVar10._20_4_;
      auVar136._24_4_ =
           fStack_118 * auVar193._24_4_ + fStack_108 * auVar363._24_4_ +
           fStack_f8 * auVar260._24_4_ + fStack_e8 * auVar10._24_4_;
      auVar136._28_4_ = auVar193._28_4_ + auVar363._28_4_ + auVar260._28_4_ + auVar10._28_4_;
      auVar10 = vpermilps_avx(auVar9,0);
      auVar193 = vpermilps_avx(auVar9,0x55);
      auVar363 = vpermilps_avx(auVar9,0xaa);
      auVar9 = vpermilps_avx(auVar9,0xff);
      auVar276._0_4_ =
           local_e0 * auVar10._0_4_ + local_d0 * auVar193._0_4_ +
           local_c0 * auVar363._0_4_ + local_b0 * auVar9._0_4_;
      auVar276._4_4_ =
           fStack_dc * auVar10._4_4_ + fStack_cc * auVar193._4_4_ +
           fStack_bc * auVar363._4_4_ + fStack_ac * auVar9._4_4_;
      auVar276._8_4_ =
           fStack_d8 * auVar10._8_4_ + fStack_c8 * auVar193._8_4_ +
           fStack_b8 * auVar363._8_4_ + fStack_a8 * auVar9._8_4_;
      auVar276._12_4_ =
           fStack_d4 * auVar10._12_4_ + fStack_c4 * auVar193._12_4_ +
           fStack_b4 * auVar363._12_4_ + fStack_a4 * auVar9._12_4_;
      auVar276._16_4_ =
           local_e0 * auVar10._16_4_ + local_d0 * auVar193._16_4_ +
           local_c0 * auVar363._16_4_ + local_b0 * auVar9._16_4_;
      auVar276._20_4_ =
           fStack_dc * auVar10._20_4_ + fStack_cc * auVar193._20_4_ +
           fStack_bc * auVar363._20_4_ + fStack_ac * auVar9._20_4_;
      auVar276._24_4_ =
           fStack_d8 * auVar10._24_4_ + fStack_c8 * auVar193._24_4_ +
           fStack_b8 * auVar363._24_4_ + fStack_a8 * auVar9._24_4_;
      auVar276._28_4_ = auVar10._28_4_ + auVar193._28_4_ + auVar363._28_4_ + auVar9._28_4_;
      auVar9 = vsubps_avx(auVar136,auVar276);
      auVar137._0_4_ = auVar136._0_4_ + auVar276._0_4_;
      auVar137._4_4_ = auVar136._4_4_ + auVar276._4_4_;
      auVar137._8_4_ = auVar136._8_4_ + auVar276._8_4_;
      auVar137._12_4_ = auVar136._12_4_ + auVar276._12_4_;
      auVar137._16_4_ = auVar136._16_4_ + auVar276._16_4_;
      auVar137._20_4_ = auVar136._20_4_ + auVar276._20_4_;
      auVar137._24_4_ = auVar136._24_4_ + auVar276._24_4_;
      auVar137._28_4_ = auVar136._28_4_ + auVar276._28_4_;
      auVar9 = vpermilps_avx(auVar9,0x1b);
      auVar9 = vperm2f128_avx(auVar9,auVar137,2);
      fVar412 = auVar9._0_4_ * local_120;
      fVar424 = auVar9._4_4_ * fStack_11c;
      fVar425 = auVar9._8_4_ * fStack_118;
      fVar426 = auVar9._12_4_ * fStack_114;
      fVar427 = auVar9._16_4_ * local_120;
      fVar434 = auVar9._20_4_ * fStack_11c;
      uVar60 = auVar9._28_4_;
      fVar435 = auVar9._24_4_ * fStack_118;
      *(float *)(undefined1 *)local_150._buffer = fVar412;
      *(float *)((undefined1 *)local_150._buffer + 4) = fVar424;
      *(float *)((undefined1 *)local_150._buffer + 8) = fVar425;
      *(float *)((undefined1 *)local_150._buffer + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x10) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x10) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x20) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x20) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x30) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x30) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x40) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x40) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x50) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x50) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x60) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x60) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x70) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x70) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x80) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x80) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0x90) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0x90) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xa0) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xb0) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xc0) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xd0) + 0xc) = uVar60;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) = fVar412;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 4) = fVar424;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 8) = fVar425;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xe0) + 0xc) = fVar426;
      *(float *)*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) = fVar427;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 4) = fVar434;
      *(float *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 8) = fVar435;
      *(undefined4 *)(*(undefined1 (*) [16])((long)local_150._buffer + 0xf0) + 0xc) = uVar60;
      auVar179 = ZEXT1264(ZEXT812(0x3c23d70a));
      compareBufferRelative(&local_140,&local_150,SUB124(ZEXT812(0x3c23d70a),0),1e-06);
      iVar110 = iVar110 + 1;
    } while (iVar110 != 1000000);
  }
  if (local_150._handle != (char *)0x0) {
    free(local_150._handle);
  }
  if (local_140._handle != (char *)0x0) {
    free(local_140._handle);
  }
  return;
}

Assistant:

void
testDct ()
{
    const int            numIter = 1000000;
    Rand48               rand48 (0);
    SimdAlignedBuffer64f orig;
    SimdAlignedBuffer64f test;

    cout << "   DCT Round Trip " << endl;
    for (int iter = 0; iter < numIter; ++iter)
    {
        for (int i = 0; i < 64; ++i)
        {
            orig._buffer[i] = test._buffer[i] = rand48.nextf ();
        }

        dctForward8x8 (test._buffer);
        dctInverse8x8_scalar<0> (test._buffer);

        compareBufferRelative (orig, test, .02, 1e-3);
    }

    cout << "      Inverse, DC Only" << endl;
    for (int iter = 0; iter < numIter; ++iter)
    {
        orig._buffer[0] = test._buffer[0] = rand48.nextf ();
        for (int i = 1; i < 64; ++i)
        {
            orig._buffer[i] = test._buffer[i] = 0;
        }

        dctInverse8x8_scalar<0> (orig._buffer);
        dctInverse8x8DcOnly (test._buffer);

        compareBufferRelative (orig, test, .01, 1e-6);
    }

#define INVERSE_DCT_SCALAR_TEST_N(_func, _n, _desc)                            \
    cout << "         " << _desc << endl;                                      \
    for (int iter = 0; iter < numIter; ++iter)                                 \
    {                                                                          \
        for (int i = 0; i < 64; ++i)                                           \
        {                                                                      \
            if (i < 8 * (8 - _n))                                              \
            {                                                                  \
                orig._buffer[i] = test._buffer[i] = rand48.nextf ();           \
            }                                                                  \
            else                                                               \
            {                                                                  \
                orig._buffer[i] = test._buffer[i] = 0;                         \
            }                                                                  \
        }                                                                      \
        dctInverse8x8_scalar<0> (orig._buffer);                                \
        _func<_n> (test._buffer);                                              \
        compareBufferRelative (orig, test, .01, 1e-6);                         \
    }

    cout << "      Inverse, Scalar: " << endl;
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 0, "8x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 1, "7x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 2, "6x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 3, "5x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 4, "4x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 5, "3x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 6, "2x8")
    INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_scalar, 7, "1x8")

    CpuId cpuid;
    if (cpuid.sse2)
    {
        cout << "      Inverse, SSE2: " << endl;
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_sse2, 7, "1x8")
    }

    if (cpuid.avx)
    {
        cout << "      Inverse, AVX: " << endl;
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 0, "8x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 1, "7x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 2, "6x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 3, "5x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 4, "4x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 5, "3x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 6, "2x8")
        INVERSE_DCT_SCALAR_TEST_N (dctInverse8x8_avx, 7, "1x8")
    }
}